

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined4 uVar11;
  Primitive PVar12;
  uint uVar13;
  uint uVar14;
  undefined4 uVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  uint uVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [24];
  uint uVar124;
  uint uVar125;
  ulong uVar126;
  uint uVar127;
  ulong uVar128;
  long lVar129;
  long lVar130;
  Geometry *pGVar131;
  float fVar132;
  float fVar151;
  vint4 bi_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar156;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  float fVar157;
  float fVar173;
  float fVar174;
  vint4 bi;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar178;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar179;
  float fVar193;
  float fVar194;
  vint4 bi_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar195;
  float fVar196;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar197;
  float fVar211;
  float fVar214;
  vint4 ai_1;
  undefined1 auVar203 [16];
  undefined1 auVar200 [16];
  float fVar218;
  undefined1 auVar201 [16];
  float fVar198;
  float fVar199;
  undefined1 auVar202 [16];
  float fVar212;
  float fVar215;
  float fVar219;
  float fVar223;
  float fVar225;
  float fVar227;
  undefined1 auVar204 [32];
  float fVar213;
  float fVar216;
  float fVar217;
  float fVar220;
  float fVar221;
  float fVar224;
  float fVar226;
  float fVar228;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar222;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  float fVar229;
  float fVar241;
  float fVar245;
  vint4 ai_2;
  undefined1 auVar233 [16];
  float fVar249;
  undefined1 auVar234 [16];
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar236 [16];
  undefined1 auVar235 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar253;
  undefined1 auVar240 [32];
  float fVar254;
  float fVar258;
  float fVar259;
  undefined1 auVar255 [16];
  float fVar260;
  float fVar261;
  undefined1 auVar256 [32];
  float fVar262;
  undefined1 auVar257 [32];
  float fVar263;
  float fVar271;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar272;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float fVar273;
  undefined1 auVar270 [32];
  float fVar274;
  float fVar275;
  float fVar285;
  float fVar286;
  float fVar287;
  vint4 ai;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar282 [16];
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar292;
  float fVar302;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar297 [16];
  float fVar305;
  undefined1 auVar298 [32];
  float fVar303;
  undefined1 auVar299 [32];
  float fVar304;
  float fVar306;
  undefined1 auVar300 [32];
  undefined1 auVar301 [64];
  float fVar307;
  float fVar308;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar309 [16];
  float fVar319;
  undefined1 auVar310 [32];
  float fVar320;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar321;
  float fVar327;
  undefined1 auVar322 [16];
  float fVar329;
  float fVar330;
  undefined1 auVar323 [32];
  float fVar328;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [64];
  float fVar331;
  float fVar332;
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar333 [16];
  float fVar338;
  undefined1 auVar334 [32];
  undefined1 auVar339 [16];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  float fVar344;
  float fVar345;
  float fVar349;
  float fVar351;
  undefined1 auVar346 [16];
  float fVar350;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  float fVar356;
  float fVar357;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  undefined1 auVar359 [32];
  float fVar364;
  float fVar369;
  float fVar370;
  float fVar371;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 auStack_8d0 [8];
  float fStack_8c8;
  float fStack_8c4;
  undefined8 uStack_8b8;
  undefined8 uStack_8a8;
  undefined1 local_8a0 [16];
  Primitive *local_890;
  Precalculations *local_888;
  uint local_880;
  undefined4 uStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_810 [8];
  undefined8 uStack_808;
  undefined1 local_800 [8];
  undefined8 uStack_7f8;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 (*local_788) [16];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined1 auStack_710 [8];
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  LinearSpace3fa *local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  RTCHitN local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar281 [16];
  undefined1 auVar296 [16];
  undefined1 auVar358 [16];
  
  PVar12 = prim[1];
  uVar126 = (ulong)(byte)PVar12;
  lVar21 = uVar126 * 0x25;
  fVar332 = *(float *)(prim + lVar21 + 0x12);
  auVar236 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar236 = vinsertps_avx(auVar236,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar186 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar186 = vinsertps_avx(auVar186,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar236 = vsubps_avx(auVar236,*(undefined1 (*) [16])(prim + lVar21 + 6));
  auVar158._0_4_ = fVar332 * auVar236._0_4_;
  auVar158._4_4_ = fVar332 * auVar236._4_4_;
  auVar158._8_4_ = fVar332 * auVar236._8_4_;
  auVar158._12_4_ = fVar332 * auVar236._12_4_;
  auVar276._0_4_ = fVar332 * auVar186._0_4_;
  auVar276._4_4_ = fVar332 * auVar186._4_4_;
  auVar276._8_4_ = fVar332 * auVar186._8_4_;
  auVar276._12_4_ = fVar332 * auVar186._12_4_;
  auVar236 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 4 + 6)));
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 5 + 6)));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 6 + 6)));
  auVar203 = vcvtdq2ps_avx(auVar203);
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0xf + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar126 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1a + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1b + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1c + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vshufps_avx(auVar276,auVar276,0);
  auVar28 = vshufps_avx(auVar276,auVar276,0x55);
  auVar29 = vshufps_avx(auVar276,auVar276,0xaa);
  fVar332 = auVar29._0_4_;
  fVar196 = auVar29._4_4_;
  fVar336 = auVar29._8_4_;
  fVar222 = auVar29._12_4_;
  fVar229 = auVar28._0_4_;
  fVar241 = auVar28._4_4_;
  fVar245 = auVar28._8_4_;
  fVar249 = auVar28._12_4_;
  fVar197 = auVar27._0_4_;
  fVar211 = auVar27._4_4_;
  fVar214 = auVar27._8_4_;
  fVar218 = auVar27._12_4_;
  auVar339._0_4_ = fVar197 * auVar236._0_4_ + fVar229 * auVar186._0_4_ + fVar332 * auVar203._0_4_;
  auVar339._4_4_ = fVar211 * auVar236._4_4_ + fVar241 * auVar186._4_4_ + fVar196 * auVar203._4_4_;
  auVar339._8_4_ = fVar214 * auVar236._8_4_ + fVar245 * auVar186._8_4_ + fVar336 * auVar203._8_4_;
  auVar339._12_4_ =
       fVar218 * auVar236._12_4_ + fVar249 * auVar186._12_4_ + fVar222 * auVar203._12_4_;
  auVar346._0_4_ = fVar197 * auVar188._0_4_ + fVar229 * auVar22._0_4_ + auVar23._0_4_ * fVar332;
  auVar346._4_4_ = fVar211 * auVar188._4_4_ + fVar241 * auVar22._4_4_ + auVar23._4_4_ * fVar196;
  auVar346._8_4_ = fVar214 * auVar188._8_4_ + fVar245 * auVar22._8_4_ + auVar23._8_4_ * fVar336;
  auVar346._12_4_ = fVar218 * auVar188._12_4_ + fVar249 * auVar22._12_4_ + auVar23._12_4_ * fVar222;
  auVar277._0_4_ = fVar197 * auVar24._0_4_ + fVar229 * auVar25._0_4_ + auVar26._0_4_ * fVar332;
  auVar277._4_4_ = fVar211 * auVar24._4_4_ + fVar241 * auVar25._4_4_ + auVar26._4_4_ * fVar196;
  auVar277._8_4_ = fVar214 * auVar24._8_4_ + fVar245 * auVar25._8_4_ + auVar26._8_4_ * fVar336;
  auVar277._12_4_ = fVar218 * auVar24._12_4_ + fVar249 * auVar25._12_4_ + auVar26._12_4_ * fVar222;
  auVar27 = vshufps_avx(auVar158,auVar158,0);
  auVar28 = vshufps_avx(auVar158,auVar158,0x55);
  auVar29 = vshufps_avx(auVar158,auVar158,0xaa);
  fVar332 = auVar29._0_4_;
  fVar196 = auVar29._4_4_;
  fVar336 = auVar29._8_4_;
  fVar222 = auVar29._12_4_;
  fVar229 = auVar28._0_4_;
  fVar241 = auVar28._4_4_;
  fVar245 = auVar28._8_4_;
  fVar249 = auVar28._12_4_;
  fVar197 = auVar27._0_4_;
  fVar211 = auVar27._4_4_;
  fVar214 = auVar27._8_4_;
  fVar218 = auVar27._12_4_;
  auVar159._0_4_ = fVar197 * auVar236._0_4_ + fVar229 * auVar186._0_4_ + fVar332 * auVar203._0_4_;
  auVar159._4_4_ = fVar211 * auVar236._4_4_ + fVar241 * auVar186._4_4_ + fVar196 * auVar203._4_4_;
  auVar159._8_4_ = fVar214 * auVar236._8_4_ + fVar245 * auVar186._8_4_ + fVar336 * auVar203._8_4_;
  auVar159._12_4_ =
       fVar218 * auVar236._12_4_ + fVar249 * auVar186._12_4_ + fVar222 * auVar203._12_4_;
  auVar133._0_4_ = fVar197 * auVar188._0_4_ + auVar23._0_4_ * fVar332 + fVar229 * auVar22._0_4_;
  auVar133._4_4_ = fVar211 * auVar188._4_4_ + auVar23._4_4_ * fVar196 + fVar241 * auVar22._4_4_;
  auVar133._8_4_ = fVar214 * auVar188._8_4_ + auVar23._8_4_ * fVar336 + fVar245 * auVar22._8_4_;
  auVar133._12_4_ = fVar218 * auVar188._12_4_ + auVar23._12_4_ * fVar222 + fVar249 * auVar22._12_4_;
  auVar293._8_4_ = 0x7fffffff;
  auVar293._0_8_ = 0x7fffffff7fffffff;
  auVar293._12_4_ = 0x7fffffff;
  auVar236 = vandps_avx(auVar339,auVar293);
  auVar233._8_4_ = 0x219392ef;
  auVar233._0_8_ = 0x219392ef219392ef;
  auVar233._12_4_ = 0x219392ef;
  auVar236 = vcmpps_avx(auVar236,auVar233,1);
  auVar186 = vblendvps_avx(auVar339,auVar233,auVar236);
  auVar236 = vandps_avx(auVar346,auVar293);
  auVar236 = vcmpps_avx(auVar236,auVar233,1);
  auVar203 = vblendvps_avx(auVar346,auVar233,auVar236);
  auVar236 = vandps_avx(auVar293,auVar277);
  auVar236 = vcmpps_avx(auVar236,auVar233,1);
  auVar236 = vblendvps_avx(auVar277,auVar233,auVar236);
  auVar180._0_4_ = fVar197 * auVar24._0_4_ + fVar229 * auVar25._0_4_ + auVar26._0_4_ * fVar332;
  auVar180._4_4_ = fVar211 * auVar24._4_4_ + fVar241 * auVar25._4_4_ + auVar26._4_4_ * fVar196;
  auVar180._8_4_ = fVar214 * auVar24._8_4_ + fVar245 * auVar25._8_4_ + auVar26._8_4_ * fVar336;
  auVar180._12_4_ = fVar218 * auVar24._12_4_ + fVar249 * auVar25._12_4_ + auVar26._12_4_ * fVar222;
  auVar188 = vrcpps_avx(auVar186);
  fVar197 = auVar188._0_4_;
  auVar200._0_4_ = fVar197 * auVar186._0_4_;
  fVar211 = auVar188._4_4_;
  auVar200._4_4_ = fVar211 * auVar186._4_4_;
  fVar214 = auVar188._8_4_;
  auVar200._8_4_ = fVar214 * auVar186._8_4_;
  fVar218 = auVar188._12_4_;
  auVar200._12_4_ = fVar218 * auVar186._12_4_;
  auVar264._8_4_ = 0x3f800000;
  auVar264._0_8_ = 0x3f8000003f800000;
  auVar264._12_4_ = 0x3f800000;
  auVar186 = vsubps_avx(auVar264,auVar200);
  fVar197 = fVar197 + fVar197 * auVar186._0_4_;
  fVar211 = fVar211 + fVar211 * auVar186._4_4_;
  fVar214 = fVar214 + fVar214 * auVar186._8_4_;
  fVar218 = fVar218 + fVar218 * auVar186._12_4_;
  auVar186 = vrcpps_avx(auVar203);
  fVar229 = auVar186._0_4_;
  auVar255._0_4_ = fVar229 * auVar203._0_4_;
  fVar241 = auVar186._4_4_;
  auVar255._4_4_ = fVar241 * auVar203._4_4_;
  fVar245 = auVar186._8_4_;
  auVar255._8_4_ = fVar245 * auVar203._8_4_;
  fVar249 = auVar186._12_4_;
  auVar255._12_4_ = fVar249 * auVar203._12_4_;
  auVar186 = vsubps_avx(auVar264,auVar255);
  fVar229 = fVar229 + fVar229 * auVar186._0_4_;
  fVar241 = fVar241 + fVar241 * auVar186._4_4_;
  fVar245 = fVar245 + fVar245 * auVar186._8_4_;
  fVar249 = fVar249 + fVar249 * auVar186._12_4_;
  auVar186 = vrcpps_avx(auVar236);
  fVar254 = auVar186._0_4_;
  auVar278._0_4_ = fVar254 * auVar236._0_4_;
  fVar258 = auVar186._4_4_;
  auVar278._4_4_ = fVar258 * auVar236._4_4_;
  fVar259 = auVar186._8_4_;
  auVar278._8_4_ = fVar259 * auVar236._8_4_;
  fVar260 = auVar186._12_4_;
  auVar278._12_4_ = fVar260 * auVar236._12_4_;
  auVar236 = vsubps_avx(auVar264,auVar278);
  fVar254 = fVar254 + fVar254 * auVar236._0_4_;
  fVar258 = fVar258 + fVar258 * auVar236._4_4_;
  fVar259 = fVar259 + fVar259 * auVar236._8_4_;
  fVar260 = fVar260 + fVar260 * auVar236._12_4_;
  auVar236 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar21 + 0x16)) *
                           *(float *)(prim + lVar21 + 0x1a)));
  auVar203 = vshufps_avx(auVar236,auVar236,0);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + uVar126 * 7 + 6);
  auVar236 = vpmovsxwd_avx(auVar236);
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar126 * 0xb + 6);
  auVar186 = vpmovsxwd_avx(auVar186);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar188 = vsubps_avx(auVar186,auVar236);
  fVar332 = auVar203._0_4_;
  fVar196 = auVar203._4_4_;
  fVar336 = auVar203._8_4_;
  fVar222 = auVar203._12_4_;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + uVar126 * 9 + 6);
  auVar186 = vpmovsxwd_avx(auVar203);
  auVar279._0_4_ = auVar188._0_4_ * fVar332 + auVar236._0_4_;
  auVar279._4_4_ = auVar188._4_4_ * fVar196 + auVar236._4_4_;
  auVar279._8_4_ = auVar188._8_4_ * fVar336 + auVar236._8_4_;
  auVar279._12_4_ = auVar188._12_4_ * fVar222 + auVar236._12_4_;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar126 * 0xd + 6);
  auVar203 = vpmovsxwd_avx(auVar188);
  auVar236 = vcvtdq2ps_avx(auVar186);
  auVar186 = vcvtdq2ps_avx(auVar203);
  auVar186 = vsubps_avx(auVar186,auVar236);
  auVar294._0_4_ = auVar186._0_4_ * fVar332 + auVar236._0_4_;
  auVar294._4_4_ = auVar186._4_4_ * fVar196 + auVar236._4_4_;
  auVar294._8_4_ = auVar186._8_4_ * fVar336 + auVar236._8_4_;
  auVar294._12_4_ = auVar186._12_4_ * fVar222 + auVar236._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar126 * 0x12 + 6);
  auVar236 = vpmovsxwd_avx(auVar22);
  uVar128 = (ulong)(uint)((int)(uVar126 * 5) << 2);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar126 * 2 + uVar128 + 6);
  auVar186 = vpmovsxwd_avx(auVar23);
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar236);
  auVar309._0_4_ = auVar186._0_4_ * fVar332 + auVar236._0_4_;
  auVar309._4_4_ = auVar186._4_4_ * fVar196 + auVar236._4_4_;
  auVar309._8_4_ = auVar186._8_4_ * fVar336 + auVar236._8_4_;
  auVar309._12_4_ = auVar186._12_4_ * fVar222 + auVar236._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar128 + 6);
  auVar236 = vpmovsxwd_avx(auVar24);
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar126 * 0x18 + 6);
  auVar186 = vpmovsxwd_avx(auVar25);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar203 = vsubps_avx(auVar186,auVar236);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar126 * 0x1d + 6);
  auVar186 = vpmovsxwd_avx(auVar26);
  auVar322._0_4_ = auVar203._0_4_ * fVar332 + auVar236._0_4_;
  auVar322._4_4_ = auVar203._4_4_ * fVar196 + auVar236._4_4_;
  auVar322._8_4_ = auVar203._8_4_ * fVar336 + auVar236._8_4_;
  auVar322._12_4_ = auVar203._12_4_ * fVar222 + auVar236._12_4_;
  auVar236 = vcvtdq2ps_avx(auVar186);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar126 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar186 = vpmovsxwd_avx(auVar27);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar236);
  auVar333._0_4_ = auVar186._0_4_ * fVar332 + auVar236._0_4_;
  auVar333._4_4_ = auVar186._4_4_ * fVar196 + auVar236._4_4_;
  auVar333._8_4_ = auVar186._8_4_ * fVar336 + auVar236._8_4_;
  auVar333._12_4_ = auVar186._12_4_ * fVar222 + auVar236._12_4_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar126) + 6);
  auVar236 = vpmovsxwd_avx(auVar28);
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar126 * 0x23 + 6);
  auVar186 = vpmovsxwd_avx(auVar29);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar236);
  auVar265._0_4_ = auVar236._0_4_ + auVar186._0_4_ * fVar332;
  auVar265._4_4_ = auVar236._4_4_ + auVar186._4_4_ * fVar196;
  auVar265._8_4_ = auVar236._8_4_ + auVar186._8_4_ * fVar336;
  auVar265._12_4_ = auVar236._12_4_ + auVar186._12_4_ * fVar222;
  auVar236 = vsubps_avx(auVar279,auVar159);
  auVar280._0_4_ = fVar197 * auVar236._0_4_;
  auVar280._4_4_ = fVar211 * auVar236._4_4_;
  auVar280._8_4_ = fVar214 * auVar236._8_4_;
  auVar280._12_4_ = fVar218 * auVar236._12_4_;
  auVar236 = vsubps_avx(auVar294,auVar159);
  auVar160._0_4_ = fVar197 * auVar236._0_4_;
  auVar160._4_4_ = fVar211 * auVar236._4_4_;
  auVar160._8_4_ = fVar214 * auVar236._8_4_;
  auVar160._12_4_ = fVar218 * auVar236._12_4_;
  auVar236 = vsubps_avx(auVar309,auVar133);
  auVar201._0_4_ = fVar229 * auVar236._0_4_;
  auVar201._4_4_ = fVar241 * auVar236._4_4_;
  auVar201._8_4_ = fVar245 * auVar236._8_4_;
  auVar201._12_4_ = fVar249 * auVar236._12_4_;
  auVar236 = vsubps_avx(auVar322,auVar133);
  auVar134._0_4_ = fVar229 * auVar236._0_4_;
  auVar134._4_4_ = fVar241 * auVar236._4_4_;
  auVar134._8_4_ = fVar245 * auVar236._8_4_;
  auVar134._12_4_ = fVar249 * auVar236._12_4_;
  auVar236 = vsubps_avx(auVar333,auVar180);
  auVar234._0_4_ = fVar254 * auVar236._0_4_;
  auVar234._4_4_ = fVar258 * auVar236._4_4_;
  auVar234._8_4_ = fVar259 * auVar236._8_4_;
  auVar234._12_4_ = fVar260 * auVar236._12_4_;
  auVar236 = vsubps_avx(auVar265,auVar180);
  auVar181._0_4_ = fVar254 * auVar236._0_4_;
  auVar181._4_4_ = fVar258 * auVar236._4_4_;
  auVar181._8_4_ = fVar259 * auVar236._8_4_;
  auVar181._12_4_ = fVar260 * auVar236._12_4_;
  auVar236 = vpminsd_avx(auVar280,auVar160);
  auVar186 = vpminsd_avx(auVar201,auVar134);
  auVar236 = vmaxps_avx(auVar236,auVar186);
  auVar186 = vpminsd_avx(auVar234,auVar181);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar295._4_4_ = uVar11;
  auVar295._0_4_ = uVar11;
  auVar295._8_4_ = uVar11;
  auVar295._12_4_ = uVar11;
  auVar186 = vmaxps_avx(auVar186,auVar295);
  auVar236 = vmaxps_avx(auVar236,auVar186);
  local_2d0._0_4_ = auVar236._0_4_ * 0.99999964;
  local_2d0._4_4_ = auVar236._4_4_ * 0.99999964;
  local_2d0._8_4_ = auVar236._8_4_ * 0.99999964;
  local_2d0._12_4_ = auVar236._12_4_ * 0.99999964;
  auVar236 = vpmaxsd_avx(auVar280,auVar160);
  auVar186 = vpmaxsd_avx(auVar201,auVar134);
  auVar236 = vminps_avx(auVar236,auVar186);
  auVar186 = vpmaxsd_avx(auVar234,auVar181);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar182._4_4_ = uVar11;
  auVar182._0_4_ = uVar11;
  auVar182._8_4_ = uVar11;
  auVar182._12_4_ = uVar11;
  auVar186 = vminps_avx(auVar186,auVar182);
  auVar236 = vminps_avx(auVar236,auVar186);
  auVar135._0_4_ = auVar236._0_4_ * 1.0000004;
  auVar135._4_4_ = auVar236._4_4_ * 1.0000004;
  auVar135._8_4_ = auVar236._8_4_ * 1.0000004;
  auVar135._12_4_ = auVar236._12_4_ * 1.0000004;
  auVar236 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar186 = vpcmpgtd_avx(auVar236,_DAT_01f7fcf0);
  auVar236 = vcmpps_avx(local_2d0,auVar135,2);
  auVar236 = vandps_avx(auVar236,auVar186);
  uVar124 = vmovmskps_avx(auVar236);
  if (uVar124 != 0) {
    uVar124 = uVar124 & 0xff;
    local_608 = pre->ray_space + k;
    local_600 = mm_lookupmask_ps._16_8_;
    uStack_5f8 = mm_lookupmask_ps._24_8_;
    uStack_5f0 = mm_lookupmask_ps._16_8_;
    uStack_5e8 = mm_lookupmask_ps._24_8_;
    local_788 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_890 = prim;
    local_888 = pre;
    do {
      lVar21 = 0;
      if (uVar124 != 0) {
        for (; (uVar124 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
        }
      }
      uVar127 = *(uint *)(prim + 2);
      uVar13 = *(uint *)(prim + lVar21 * 4 + 6);
      pGVar131 = (context->scene->geometries).items[uVar127].ptr;
      uVar126 = (ulong)*(uint *)(*(long *)&pGVar131->field_0x58 +
                                (ulong)uVar13 *
                                pGVar131[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar332 = (pGVar131->time_range).lower;
      fVar332 = pGVar131->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar332) /
                ((pGVar131->time_range).upper - fVar332));
      auVar236 = vroundss_avx(ZEXT416((uint)fVar332),ZEXT416((uint)fVar332),9);
      auVar236 = vminss_avx(auVar236,ZEXT416((uint)(pGVar131->fnumTimeSegments + -1.0)));
      auVar236 = vmaxss_avx(ZEXT816(0) << 0x20,auVar236);
      fVar332 = fVar332 - auVar236._0_4_;
      _Var16 = pGVar131[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar129 = (long)(int)auVar236._0_4_ * 0x38;
      lVar130 = *(long *)(_Var16 + 0x10 + lVar129);
      lVar17 = *(long *)(_Var16 + 0x38 + lVar129);
      lVar18 = *(long *)(_Var16 + 0x48 + lVar129);
      auVar236 = vshufps_avx(ZEXT416((uint)fVar332),ZEXT416((uint)fVar332),0);
      pfVar1 = (float *)(lVar17 + lVar18 * uVar126);
      fVar196 = auVar236._0_4_;
      fVar336 = auVar236._4_4_;
      fVar222 = auVar236._8_4_;
      fVar197 = auVar236._12_4_;
      lVar21 = uVar126 + 1;
      pfVar2 = (float *)(lVar17 + lVar18 * lVar21);
      p_Var19 = pGVar131[4].occlusionFilterN;
      auVar236 = vshufps_avx(ZEXT416((uint)(1.0 - fVar332)),ZEXT416((uint)(1.0 - fVar332)),0);
      pfVar3 = (float *)(*(long *)(_Var16 + lVar129) + lVar130 * uVar126);
      fVar332 = auVar236._0_4_;
      fVar211 = auVar236._4_4_;
      fVar214 = auVar236._8_4_;
      fVar218 = auVar236._12_4_;
      pfVar4 = (float *)(*(long *)(_Var16 + lVar129) + lVar130 * lVar21);
      pfVar5 = (float *)(*(long *)(p_Var19 + lVar129 + 0x38) +
                        uVar126 * *(long *)(p_Var19 + lVar129 + 0x48));
      pfVar6 = (float *)(*(long *)(p_Var19 + lVar129 + 0x38) +
                        *(long *)(p_Var19 + lVar129 + 0x48) * lVar21);
      pfVar7 = (float *)(*(long *)(p_Var19 + lVar129) +
                        *(long *)(p_Var19 + lVar129 + 0x10) * uVar126);
      pfVar8 = (float *)(*(long *)(p_Var19 + lVar129) + *(long *)(p_Var19 + lVar129 + 0x10) * lVar21
                        );
      uVar14 = (uint)pGVar131[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar21 = (long)(int)uVar14 * 0x44;
      fVar292 = fVar332 * *pfVar3 + fVar196 * *pfVar1;
      fVar302 = fVar211 * pfVar3[1] + fVar336 * pfVar1[1];
      auVar296._0_8_ = CONCAT44(fVar302,fVar292);
      auVar296._8_4_ = fVar214 * pfVar3[2] + fVar222 * pfVar1[2];
      auVar296._12_4_ = fVar218 * pfVar3[3] + fVar197 * pfVar1[3];
      fVar356 = fVar332 * *pfVar4 + fVar196 * *pfVar2;
      fVar360 = fVar211 * pfVar4[1] + fVar336 * pfVar2[1];
      auVar358._0_8_ = CONCAT44(fVar360,fVar356);
      auVar358._8_4_ = fVar214 * pfVar4[2] + fVar222 * pfVar2[2];
      auVar358._12_4_ = fVar218 * pfVar4[3] + fVar197 * pfVar2[3];
      auVar236 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar188 = vinsertps_avx(auVar236,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      fVar274 = fVar292 + (fVar332 * *pfVar7 + fVar196 * *pfVar5) * 0.33333334;
      fVar285 = fVar302 + (fVar211 * pfVar7[1] + fVar336 * pfVar5[1]) * 0.33333334;
      auVar281._0_8_ = CONCAT44(fVar285,fVar274);
      auVar281._8_4_ = auVar296._8_4_ + (fVar214 * pfVar7[2] + fVar222 * pfVar5[2]) * 0.33333334;
      auVar281._12_4_ = auVar296._12_4_ + (fVar218 * pfVar7[3] + fVar197 * pfVar5[3]) * 0.33333334;
      auVar161._0_4_ = (fVar332 * *pfVar8 + fVar196 * *pfVar6) * 0.33333334;
      auVar161._4_4_ = (fVar211 * pfVar8[1] + fVar336 * pfVar6[1]) * 0.33333334;
      auVar161._8_4_ = (fVar214 * pfVar8[2] + fVar222 * pfVar6[2]) * 0.33333334;
      auVar161._12_4_ = (fVar218 * pfVar8[3] + fVar197 * pfVar6[3]) * 0.33333334;
      _local_810 = vsubps_avx(auVar358,auVar161);
      auVar203 = vsubps_avx(auVar296,auVar188);
      auVar236 = vshufps_avx(auVar203,auVar203,0);
      auVar186 = vshufps_avx(auVar203,auVar203,0x55);
      auVar203 = vshufps_avx(auVar203,auVar203,0xaa);
      fVar332 = (local_608->vx).field_0.m128[0];
      fVar196 = (local_608->vx).field_0.m128[1];
      fVar336 = (local_608->vx).field_0.m128[2];
      fVar222 = (local_608->vx).field_0.m128[3];
      fVar197 = (local_608->vy).field_0.m128[0];
      fVar211 = (local_608->vy).field_0.m128[1];
      fVar214 = (local_608->vy).field_0.m128[2];
      fVar218 = (local_608->vy).field_0.m128[3];
      fVar229 = (local_608->vz).field_0.m128[0];
      fVar241 = (local_608->vz).field_0.m128[1];
      fVar245 = (local_608->vz).field_0.m128[2];
      fVar249 = (local_608->vz).field_0.m128[3];
      auVar202._0_8_ =
           CONCAT44(auVar236._4_4_ * fVar196 + auVar186._4_4_ * fVar211 + fVar241 * auVar203._4_4_,
                    auVar236._0_4_ * fVar332 + auVar186._0_4_ * fVar197 + fVar229 * auVar203._0_4_);
      auVar202._8_4_ =
           auVar236._8_4_ * fVar336 + auVar186._8_4_ * fVar214 + fVar245 * auVar203._8_4_;
      auVar202._12_4_ =
           auVar236._12_4_ * fVar222 + auVar186._12_4_ * fVar218 + fVar249 * auVar203._12_4_;
      auVar236 = vblendps_avx(auVar202,auVar296,8);
      auVar22 = vsubps_avx(auVar281,auVar188);
      auVar186 = vshufps_avx(auVar22,auVar22,0);
      auVar203 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar282._0_4_ = auVar186._0_4_ * fVar332 + auVar203._0_4_ * fVar197 + fVar229 * auVar22._0_4_
      ;
      auVar282._4_4_ = auVar186._4_4_ * fVar196 + auVar203._4_4_ * fVar211 + fVar241 * auVar22._4_4_
      ;
      auVar282._8_4_ = auVar186._8_4_ * fVar336 + auVar203._8_4_ * fVar214 + fVar245 * auVar22._8_4_
      ;
      auVar282._12_4_ =
           auVar186._12_4_ * fVar222 + auVar203._12_4_ * fVar218 + fVar249 * auVar22._12_4_;
      auVar186 = vblendps_avx(auVar282,auVar281,8);
      auVar23 = vsubps_avx(_local_810,auVar188);
      auVar203 = vshufps_avx(auVar23,auVar23,0);
      auVar22 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar297._0_4_ = auVar203._0_4_ * fVar332 + auVar22._0_4_ * fVar197 + auVar23._0_4_ * fVar229;
      auVar297._4_4_ = auVar203._4_4_ * fVar196 + auVar22._4_4_ * fVar211 + auVar23._4_4_ * fVar241;
      auVar297._8_4_ = auVar203._8_4_ * fVar336 + auVar22._8_4_ * fVar214 + auVar23._8_4_ * fVar245;
      auVar297._12_4_ =
           auVar203._12_4_ * fVar222 + auVar22._12_4_ * fVar218 + auVar23._12_4_ * fVar249;
      auVar203 = vblendps_avx(auVar297,_local_810,8);
      auVar23 = vsubps_avx(auVar358,auVar188);
      auVar188 = vshufps_avx(auVar23,auVar23,0);
      auVar22 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar162._0_4_ = auVar188._0_4_ * fVar332 + auVar22._0_4_ * fVar197 + fVar229 * auVar23._0_4_;
      auVar162._4_4_ = auVar188._4_4_ * fVar196 + auVar22._4_4_ * fVar211 + fVar241 * auVar23._4_4_;
      auVar162._8_4_ = auVar188._8_4_ * fVar336 + auVar22._8_4_ * fVar214 + fVar245 * auVar23._8_4_;
      auVar162._12_4_ =
           auVar188._12_4_ * fVar222 + auVar22._12_4_ * fVar218 + fVar249 * auVar23._12_4_;
      auVar188 = vblendps_avx(auVar162,auVar358,8);
      auVar235._8_4_ = 0x7fffffff;
      auVar235._0_8_ = 0x7fffffff7fffffff;
      auVar235._12_4_ = 0x7fffffff;
      auVar236 = vandps_avx(auVar236,auVar235);
      auVar186 = vandps_avx(auVar186,auVar235);
      auVar22 = vmaxps_avx(auVar236,auVar186);
      auVar236 = vandps_avx(auVar203,auVar235);
      auVar186 = vandps_avx(auVar188,auVar235);
      auVar236 = vmaxps_avx(auVar236,auVar186);
      auVar236 = vmaxps_avx(auVar22,auVar236);
      auVar186 = vmovshdup_avx(auVar236);
      auVar186 = vmaxss_avx(auVar186,auVar236);
      auVar236 = vshufpd_avx(auVar236,auVar236,1);
      auVar236 = vmaxss_avx(auVar236,auVar186);
      fVar332 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0x908);
      fVar196 = *(float *)(bezier_basis0 + lVar21 + 0x90c);
      fVar336 = *(float *)(bezier_basis0 + lVar21 + 0x910);
      fVar222 = *(float *)(bezier_basis0 + lVar21 + 0x914);
      fVar197 = *(float *)(bezier_basis0 + lVar21 + 0x918);
      fVar211 = *(float *)(bezier_basis0 + lVar21 + 0x91c);
      fVar214 = *(float *)(bezier_basis0 + lVar21 + 0x920);
      auVar119 = *(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0x908);
      auVar186 = vshufps_avx(auVar297,auVar297,0);
      register0x00001310 = auVar186;
      _local_6c0 = auVar186;
      auVar203 = vshufps_avx(auVar297,auVar297,0x55);
      register0x00001290 = auVar203;
      _local_7c0 = auVar203;
      fVar259 = *(float *)(bezier_basis0 + lVar21 + 0xd8c);
      fVar260 = *(float *)(bezier_basis0 + lVar21 + 0xd90);
      fVar355 = *(float *)(bezier_basis0 + lVar21 + 0xd94);
      fVar176 = *(float *)(bezier_basis0 + lVar21 + 0xd98);
      fVar217 = *(float *)(bezier_basis0 + lVar21 + 0xd9c);
      fVar328 = *(float *)(bezier_basis0 + lVar21 + 0xda0);
      fVar303 = *(float *)(bezier_basis0 + lVar21 + 0xda4);
      auVar188 = vshufps_avx(auVar162,auVar162,0);
      register0x00001550 = auVar188;
      _local_4e0 = auVar188;
      fVar344 = auVar188._0_4_;
      fVar349 = auVar188._4_4_;
      fVar351 = auVar188._8_4_;
      fVar353 = auVar188._12_4_;
      fVar230 = auVar186._0_4_;
      fVar242 = auVar186._4_4_;
      fVar246 = auVar186._8_4_;
      fVar250 = auVar186._12_4_;
      auVar186 = vshufps_avx(auVar162,auVar162,0x55);
      register0x00001250 = auVar186;
      _local_6a0 = auVar186;
      fVar157 = auVar186._0_4_;
      fVar173 = auVar186._4_4_;
      fVar174 = auVar186._8_4_;
      fVar175 = auVar186._12_4_;
      fVar179 = auVar203._0_4_;
      fVar193 = auVar203._4_4_;
      fVar194 = auVar203._8_4_;
      fVar195 = auVar203._12_4_;
      auVar186 = vshufps_avx(_local_810,_local_810,0xff);
      register0x00001390 = auVar186;
      _local_320 = auVar186;
      auVar203 = vshufps_avx(auVar358,auVar358,0xff);
      register0x00001590 = auVar203;
      _local_140 = auVar203;
      fVar261 = auVar203._0_4_;
      fVar272 = auVar203._4_4_;
      fVar320 = auVar203._8_4_;
      fVar345 = auVar203._12_4_;
      fVar263 = auVar186._0_4_;
      fVar271 = auVar186._4_4_;
      fVar232 = auVar186._8_4_;
      auVar203 = vshufps_avx(auVar282,auVar282,0);
      register0x00001510 = auVar203;
      _local_700 = auVar203;
      fVar218 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0x484);
      fVar229 = *(float *)(bezier_basis0 + lVar21 + 0x488);
      fVar241 = *(float *)(bezier_basis0 + lVar21 + 0x48c);
      fVar245 = *(float *)(bezier_basis0 + lVar21 + 0x490);
      fVar249 = *(float *)(bezier_basis0 + lVar21 + 0x494);
      fVar254 = *(float *)(bezier_basis0 + lVar21 + 0x498);
      fVar258 = *(float *)(bezier_basis0 + lVar21 + 0x49c);
      auVar120 = *(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0x484);
      fVar304 = *(float *)(bezier_basis0 + lVar21 + 0x4a0);
      fVar291 = auVar203._0_4_;
      fVar308 = auVar203._4_4_;
      fVar316 = auVar203._8_4_;
      fVar318 = auVar203._12_4_;
      auVar203 = vshufps_avx(auVar282,auVar282,0x55);
      local_5e0._16_16_ = auVar203;
      local_5e0._0_16_ = auVar203;
      fVar307 = auVar203._0_4_;
      fVar315 = auVar203._4_4_;
      fVar317 = auVar203._8_4_;
      fVar319 = auVar203._12_4_;
      auVar203 = vpermilps_avx(auVar281,0xff);
      register0x00001310 = auVar203;
      _local_80 = auVar203;
      fVar231 = auVar203._0_4_;
      fVar243 = auVar203._4_4_;
      fVar247 = auVar203._8_4_;
      fVar251 = auVar203._12_4_;
      auVar110._8_4_ = auVar202._8_4_;
      auVar110._0_8_ = auVar202._0_8_;
      auVar110._12_4_ = auVar202._12_4_;
      auVar203 = vshufps_avx(auVar110,auVar110,0);
      register0x000014d0 = auVar203;
      _local_360 = auVar203;
      fVar221 = *(float *)(bezier_basis0 + lVar21);
      fVar329 = *(float *)(bezier_basis0 + lVar21 + 4);
      fVar305 = *(float *)(bezier_basis0 + lVar21 + 8);
      fVar306 = *(float *)(bezier_basis0 + lVar21 + 0xc);
      fVar224 = *(float *)(bezier_basis0 + lVar21 + 0x10);
      fVar330 = *(float *)(bezier_basis0 + lVar21 + 0x14);
      fVar321 = *(float *)(bezier_basis0 + lVar21 + 0x18);
      fVar331 = auVar203._0_4_;
      fVar335 = auVar203._4_4_;
      fVar337 = auVar203._8_4_;
      fVar338 = auVar203._12_4_;
      auVar365._0_4_ = fVar331 * fVar221 + fVar291 * fVar218 + fVar230 * fVar332 + fVar344 * fVar259
      ;
      auVar365._4_4_ = fVar335 * fVar329 + fVar308 * fVar229 + fVar242 * fVar196 + fVar349 * fVar260
      ;
      auVar365._8_4_ = fVar337 * fVar305 + fVar316 * fVar241 + fVar246 * fVar336 + fVar351 * fVar355
      ;
      auVar365._12_4_ =
           fVar338 * fVar306 + fVar318 * fVar245 + fVar250 * fVar222 + fVar353 * fVar176;
      auVar365._16_4_ =
           fVar331 * fVar224 + fVar291 * fVar249 + fVar230 * fVar197 + fVar344 * fVar217;
      auVar365._20_4_ =
           fVar335 * fVar330 + fVar308 * fVar254 + fVar242 * fVar211 + fVar349 * fVar328;
      auVar365._24_4_ =
           fVar337 * fVar321 + fVar316 * fVar258 + fVar246 * fVar214 + fVar351 * fVar303;
      auVar365._28_4_ = fVar304 + 0.0;
      auVar203 = vshufps_avx(auVar110,auVar110,0x55);
      register0x000012d0 = auVar203;
      _local_4c0 = auVar203;
      fVar198 = auVar203._0_4_;
      fVar212 = auVar203._4_4_;
      fVar215 = auVar203._8_4_;
      fVar219 = auVar203._12_4_;
      auVar298._0_4_ = fVar198 * fVar221 + fVar307 * fVar218 + fVar179 * fVar332 + fVar157 * fVar259
      ;
      auVar298._4_4_ = fVar212 * fVar329 + fVar315 * fVar229 + fVar193 * fVar196 + fVar173 * fVar260
      ;
      auVar298._8_4_ = fVar215 * fVar305 + fVar317 * fVar241 + fVar194 * fVar336 + fVar174 * fVar355
      ;
      auVar298._12_4_ =
           fVar219 * fVar306 + fVar319 * fVar245 + fVar195 * fVar222 + fVar175 * fVar176;
      auVar298._16_4_ =
           fVar198 * fVar224 + fVar307 * fVar249 + fVar179 * fVar197 + fVar157 * fVar217;
      auVar298._20_4_ =
           fVar212 * fVar330 + fVar315 * fVar254 + fVar193 * fVar211 + fVar173 * fVar328;
      auVar298._24_4_ =
           fVar215 * fVar321 + fVar317 * fVar258 + fVar194 * fVar214 + fVar174 * fVar303;
      auVar298._28_4_ = fVar219 + fVar195 + fVar175 + 0.0;
      auVar203 = vpermilps_avx(auVar296,0xff);
      register0x00001490 = auVar203;
      _local_160 = auVar203;
      fVar244 = auVar203._0_4_;
      fVar248 = auVar203._4_4_;
      fVar252 = auVar203._8_4_;
      local_8e0._0_4_ =
           fVar244 * fVar221 + fVar231 * fVar218 + fVar263 * fVar332 + fVar261 * fVar259;
      local_8e0._4_4_ =
           fVar248 * fVar329 + fVar243 * fVar229 + fVar271 * fVar196 + fVar272 * fVar260;
      fStack_8d8 = fVar252 * fVar305 + fVar247 * fVar241 + fVar232 * fVar336 + fVar320 * fVar355;
      fStack_8d4 = auVar203._12_4_ * fVar306 +
                   fVar251 * fVar245 + auVar186._12_4_ * fVar222 + fVar345 * fVar176;
      auStack_8d0._0_4_ =
           fVar244 * fVar224 + fVar231 * fVar249 + fVar263 * fVar197 + fVar261 * fVar217;
      auStack_8d0._4_4_ =
           fVar248 * fVar330 + fVar243 * fVar254 + fVar271 * fVar211 + fVar272 * fVar328;
      fStack_8c8 = fVar252 * fVar321 + fVar247 * fVar258 + fVar232 * fVar214 + fVar320 * fVar303;
      fStack_8c4 = *(float *)(bezier_basis0 + lVar21 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar327 = *(float *)(bezier_basis1 + lVar21 + 0x908);
      fVar226 = *(float *)(bezier_basis1 + lVar21 + 0x90c);
      fVar156 = *(float *)(bezier_basis1 + lVar21 + 0x910);
      fVar178 = *(float *)(bezier_basis1 + lVar21 + 0x914);
      fVar273 = *(float *)(bezier_basis1 + lVar21 + 0x918);
      fVar228 = *(float *)(bezier_basis1 + lVar21 + 0x91c);
      fVar177 = *(float *)(bezier_basis1 + lVar21 + 0x920);
      fVar132 = *(float *)(bezier_basis1 + lVar21 + 0xd8c);
      fVar151 = *(float *)(bezier_basis1 + lVar21 + 0xd90);
      fVar253 = *(float *)(bezier_basis1 + lVar21 + 0xd94);
      fVar152 = *(float *)(bezier_basis1 + lVar21 + 0xd98);
      fVar153 = *(float *)(bezier_basis1 + lVar21 + 0xd9c);
      fVar154 = *(float *)(bezier_basis1 + lVar21 + 0xda0);
      fVar155 = *(float *)(bezier_basis1 + lVar21 + 0xda4);
      fVar199 = *(float *)(bezier_basis1 + lVar21 + 0x484);
      fVar213 = *(float *)(bezier_basis1 + lVar21 + 0x488);
      fVar216 = *(float *)(bezier_basis1 + lVar21 + 0x48c);
      fVar220 = *(float *)(bezier_basis1 + lVar21 + 0x490);
      fVar223 = *(float *)(bezier_basis1 + lVar21 + 0x494);
      fVar225 = *(float *)(bezier_basis1 + lVar21 + 0x498);
      fVar227 = *(float *)(bezier_basis1 + lVar21 + 0x49c);
      fVar196 = fVar353 + fVar219 + fStack_8c4;
      fVar262 = *(float *)(bezier_basis1 + lVar21);
      fVar275 = *(float *)(bezier_basis1 + lVar21 + 4);
      fVar286 = *(float *)(bezier_basis1 + lVar21 + 8);
      fVar287 = *(float *)(bezier_basis1 + lVar21 + 0xc);
      fVar288 = *(float *)(bezier_basis1 + lVar21 + 0x10);
      fVar289 = *(float *)(bezier_basis1 + lVar21 + 0x14);
      fVar290 = *(float *)(bezier_basis1 + lVar21 + 0x18);
      auVar310._0_4_ = fVar331 * fVar262 + fVar291 * fVar199 + fVar230 * fVar327 + fVar344 * fVar132
      ;
      auVar310._4_4_ = fVar335 * fVar275 + fVar308 * fVar213 + fVar242 * fVar226 + fVar349 * fVar151
      ;
      auVar310._8_4_ = fVar337 * fVar286 + fVar316 * fVar216 + fVar246 * fVar156 + fVar351 * fVar253
      ;
      auVar310._12_4_ =
           fVar338 * fVar287 + fVar318 * fVar220 + fVar250 * fVar178 + fVar353 * fVar152;
      auVar310._16_4_ =
           fVar331 * fVar288 + fVar291 * fVar223 + fVar230 * fVar273 + fVar344 * fVar153;
      auVar310._20_4_ =
           fVar335 * fVar289 + fVar308 * fVar225 + fVar242 * fVar228 + fVar349 * fVar154;
      auVar310._24_4_ =
           fVar337 * fVar290 + fVar316 * fVar227 + fVar246 * fVar177 + fVar351 * fVar155;
      auVar310._28_4_ = fVar345 + fVar196;
      local_680._0_4_ =
           fVar198 * fVar262 + fVar307 * fVar199 + fVar327 * fVar179 + fVar132 * fVar157;
      local_680._4_4_ =
           fVar212 * fVar275 + fVar315 * fVar213 + fVar226 * fVar193 + fVar151 * fVar173;
      fStack_678 = fVar215 * fVar286 + fVar317 * fVar216 + fVar156 * fVar194 + fVar253 * fVar174;
      fStack_674 = fVar219 * fVar287 + fVar319 * fVar220 + fVar178 * fVar195 + fVar152 * fVar175;
      fStack_670 = fVar198 * fVar288 + fVar307 * fVar223 + fVar273 * fVar179 + fVar153 * fVar157;
      fStack_66c = fVar212 * fVar289 + fVar315 * fVar225 + fVar228 * fVar193 + fVar154 * fVar173;
      fStack_668 = fVar215 * fVar290 + fVar317 * fVar227 + fVar177 * fVar194 + fVar155 * fVar174;
      fStack_664 = fVar196 + fVar353 + fVar304 + fVar219;
      auVar323._0_4_ = fVar231 * fVar199 + fVar327 * fVar263 + fVar261 * fVar132 + fVar244 * fVar262
      ;
      auVar323._4_4_ = fVar243 * fVar213 + fVar226 * fVar271 + fVar272 * fVar151 + fVar248 * fVar275
      ;
      auVar323._8_4_ = fVar247 * fVar216 + fVar156 * fVar232 + fVar320 * fVar253 + fVar252 * fVar286
      ;
      auVar323._12_4_ =
           fVar251 * fVar220 + fVar178 * auVar186._12_4_ + fVar345 * fVar152 +
           auVar203._12_4_ * fVar287;
      auVar323._16_4_ =
           fVar231 * fVar223 + fVar273 * fVar263 + fVar261 * fVar153 + fVar244 * fVar288;
      auVar323._20_4_ =
           fVar243 * fVar225 + fVar228 * fVar271 + fVar272 * fVar154 + fVar248 * fVar289;
      auVar323._24_4_ =
           fVar247 * fVar227 + fVar177 * fVar232 + fVar320 * fVar155 + fVar252 * fVar290;
      auVar323._28_4_ = fVar353 + fVar250 + fVar304 + fVar196;
      auVar30 = vsubps_avx(auVar310,auVar365);
      auVar142 = vsubps_avx(_local_680,auVar298);
      fVar332 = auVar30._0_4_;
      fVar336 = auVar30._4_4_;
      auVar149._4_4_ = auVar298._4_4_ * fVar336;
      auVar149._0_4_ = auVar298._0_4_ * fVar332;
      fVar197 = auVar30._8_4_;
      auVar149._8_4_ = auVar298._8_4_ * fVar197;
      fVar214 = auVar30._12_4_;
      auVar149._12_4_ = auVar298._12_4_ * fVar214;
      fVar229 = auVar30._16_4_;
      auVar149._16_4_ = auVar298._16_4_ * fVar229;
      fVar245 = auVar30._20_4_;
      auVar149._20_4_ = auVar298._20_4_ * fVar245;
      fVar254 = auVar30._24_4_;
      auVar149._24_4_ = auVar298._24_4_ * fVar254;
      auVar149._28_4_ = fVar196;
      fVar196 = auVar142._0_4_;
      fVar222 = auVar142._4_4_;
      auVar209._4_4_ = auVar365._4_4_ * fVar222;
      auVar209._0_4_ = auVar365._0_4_ * fVar196;
      fVar211 = auVar142._8_4_;
      auVar209._8_4_ = auVar365._8_4_ * fVar211;
      fVar218 = auVar142._12_4_;
      auVar209._12_4_ = auVar365._12_4_ * fVar218;
      fVar241 = auVar142._16_4_;
      auVar209._16_4_ = auVar365._16_4_ * fVar241;
      fVar249 = auVar142._20_4_;
      auVar209._20_4_ = auVar365._20_4_ * fVar249;
      fVar258 = auVar142._24_4_;
      auVar209._24_4_ = auVar365._24_4_ * fVar258;
      auVar209._28_4_ = fStack_664;
      auVar209 = vsubps_avx(auVar149,auVar209);
      auVar149 = vmaxps_avx(_local_8e0,auVar323);
      auVar38._4_4_ = auVar149._4_4_ * auVar149._4_4_ * (fVar336 * fVar336 + fVar222 * fVar222);
      auVar38._0_4_ = auVar149._0_4_ * auVar149._0_4_ * (fVar332 * fVar332 + fVar196 * fVar196);
      auVar38._8_4_ = auVar149._8_4_ * auVar149._8_4_ * (fVar197 * fVar197 + fVar211 * fVar211);
      auVar38._12_4_ = auVar149._12_4_ * auVar149._12_4_ * (fVar214 * fVar214 + fVar218 * fVar218);
      auVar38._16_4_ = auVar149._16_4_ * auVar149._16_4_ * (fVar229 * fVar229 + fVar241 * fVar241);
      auVar38._20_4_ = auVar149._20_4_ * auVar149._20_4_ * (fVar245 * fVar245 + fVar249 * fVar249);
      auVar38._24_4_ = auVar149._24_4_ * auVar149._24_4_ * (fVar254 * fVar254 + fVar258 * fVar258);
      auVar38._28_4_ = fVar251 + fStack_664;
      auVar312._4_4_ = auVar209._4_4_ * auVar209._4_4_;
      auVar312._0_4_ = auVar209._0_4_ * auVar209._0_4_;
      auVar312._8_4_ = auVar209._8_4_ * auVar209._8_4_;
      auVar312._12_4_ = auVar209._12_4_ * auVar209._12_4_;
      auVar312._16_4_ = auVar209._16_4_ * auVar209._16_4_;
      auVar312._20_4_ = auVar209._20_4_ * auVar209._20_4_;
      auVar312._24_4_ = auVar209._24_4_ * auVar209._24_4_;
      auVar312._28_4_ = auVar209._28_4_;
      auVar149 = vcmpps_avx(auVar312,auVar38,2);
      auVar186 = ZEXT416((uint)(float)(int)uVar14);
      local_500._0_16_ = auVar186;
      auVar186 = vshufps_avx(auVar186,auVar186,0);
      auVar204._16_16_ = auVar186;
      auVar204._0_16_ = auVar186;
      auVar209 = vcmpps_avx(_DAT_01faff40,auVar204,1);
      auVar210 = ZEXT3264(auVar209);
      auVar111._8_4_ = auVar202._8_4_;
      auVar111._0_8_ = auVar202._0_8_;
      auVar111._12_4_ = auVar202._12_4_;
      auVar186 = vpermilps_avx(auVar111,0xaa);
      register0x000015d0 = auVar186;
      _local_180 = auVar186;
      auVar203 = vpermilps_avx(auVar282,0xaa);
      register0x00001550 = auVar203;
      _local_340 = auVar203;
      auVar188 = vpermilps_avx(auVar297,0xaa);
      register0x00001590 = auVar188;
      _local_a0 = auVar188;
      auVar22 = vpermilps_avx(auVar162,0xaa);
      register0x00001310 = auVar22;
      _local_840 = auVar22;
      auVar38 = auVar209 & auVar149;
      local_880 = *(uint *)(ray + k * 4 + 0x30);
      auVar326 = ZEXT464(local_880);
      uStack_87c = 0;
      fStack_878 = 0.0;
      fStack_874 = 0.0;
      auVar236 = ZEXT416((uint)(auVar236._0_4_ * 4.7683716e-07));
      local_760._0_16_ = auVar236;
      uStack_8a8 = auVar296._8_8_;
      uStack_8b8 = auVar281._8_8_;
      auVar312 = local_5c0;
      fVar332 = fVar291;
      fVar196 = fVar308;
      fVar336 = fVar316;
      fVar222 = fVar179;
      fVar197 = fVar193;
      fVar211 = fVar194;
      fVar214 = fVar195;
      _local_800 = auVar358;
      if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar38 >> 0x7f,0) != '\0') ||
            (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar38 >> 0xbf,0) != '\0') ||
          (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar38[0x1f] < '\0') {
        auVar149 = vandps_avx(auVar149,auVar209);
        fVar364 = auVar186._0_4_;
        fVar369 = auVar186._4_4_;
        fVar370 = auVar186._8_4_;
        fVar371 = auVar186._12_4_;
        fVar345 = auVar203._0_4_;
        fVar350 = auVar203._4_4_;
        fVar352 = auVar203._8_4_;
        fVar354 = auVar203._12_4_;
        fVar357 = auVar188._0_4_;
        fVar361 = auVar188._4_4_;
        fVar362 = auVar188._8_4_;
        fVar363 = auVar188._12_4_;
        fVar232 = auVar22._0_4_;
        fVar244 = auVar22._4_4_;
        fVar248 = auVar22._8_4_;
        fVar252 = auVar22._12_4_;
        fVar218 = auVar209._28_4_ +
                  *(float *)(bezier_basis1 + lVar21 + 0x924) +
                  *(float *)(bezier_basis1 + lVar21 + 0x4a0);
        local_380 = auVar30;
        local_580 = fVar364 * fVar262 + fVar345 * fVar199 + fVar357 * fVar327 + fVar232 * fVar132;
        fStack_57c = fVar369 * fVar275 + fVar350 * fVar213 + fVar361 * fVar226 + fVar244 * fVar151;
        fStack_578 = fVar370 * fVar286 + fVar352 * fVar216 + fVar362 * fVar156 + fVar248 * fVar253;
        fStack_574 = fVar371 * fVar287 + fVar354 * fVar220 + fVar363 * fVar178 + fVar252 * fVar152;
        fStack_570 = fVar364 * fVar288 + fVar345 * fVar223 + fVar357 * fVar273 + fVar232 * fVar153;
        fStack_56c = fVar369 * fVar289 + fVar350 * fVar225 + fVar361 * fVar228 + fVar244 * fVar154;
        fStack_568 = fVar370 * fVar290 + fVar352 * fVar227 + fVar362 * fVar177 + fVar248 * fVar155;
        fStack_564 = auVar149._28_4_ + fVar218;
        local_780._0_4_ = auVar120._0_4_;
        local_780._4_4_ = auVar120._4_4_;
        fStack_778 = auVar120._8_4_;
        fStack_774 = auVar120._12_4_;
        fStack_770 = auVar120._16_4_;
        fStack_76c = auVar120._20_4_;
        fStack_768 = auVar120._24_4_;
        local_540._0_4_ = auVar119._0_4_;
        local_540._4_4_ = auVar119._4_4_;
        fStack_538 = auVar119._8_4_;
        fStack_534 = auVar119._12_4_;
        fStack_530 = auVar119._16_4_;
        fStack_52c = auVar119._20_4_;
        fStack_528 = auVar119._24_4_;
        local_560 = fVar364 * fVar221 +
                    fVar345 * (float)local_780._0_4_ +
                    fVar357 * (float)local_540._0_4_ + fVar232 * fVar259;
        fStack_55c = fVar369 * fVar329 +
                     fVar350 * (float)local_780._4_4_ +
                     fVar361 * (float)local_540._4_4_ + fVar244 * fVar260;
        fStack_558 = fVar370 * fVar305 +
                     fVar352 * fStack_778 + fVar362 * fStack_538 + fVar248 * fVar355;
        fStack_554 = fVar371 * fVar306 +
                     fVar354 * fStack_774 + fVar363 * fStack_534 + fVar252 * fVar176;
        fStack_550 = fVar364 * fVar224 +
                     fVar345 * fStack_770 + fVar357 * fStack_530 + fVar232 * fVar217;
        fStack_54c = fVar369 * fVar330 +
                     fVar350 * fStack_76c + fVar361 * fStack_52c + fVar244 * fVar328;
        fStack_548 = fVar370 * fVar321 +
                     fVar352 * fStack_768 + fVar362 * fStack_528 + fVar248 * fVar303;
        fStack_544 = fStack_564 + fVar218 + auVar149._28_4_ + auVar209._28_4_;
        fVar218 = *(float *)(bezier_basis0 + lVar21 + 0x1210);
        fVar229 = *(float *)(bezier_basis0 + lVar21 + 0x1214);
        fVar241 = *(float *)(bezier_basis0 + lVar21 + 0x1218);
        fVar245 = *(float *)(bezier_basis0 + lVar21 + 0x121c);
        fVar249 = *(float *)(bezier_basis0 + lVar21 + 0x1220);
        fVar254 = *(float *)(bezier_basis0 + lVar21 + 0x1224);
        fVar258 = *(float *)(bezier_basis0 + lVar21 + 0x1228);
        fVar259 = *(float *)(bezier_basis0 + lVar21 + 0x1694);
        fVar260 = *(float *)(bezier_basis0 + lVar21 + 0x1698);
        fVar355 = *(float *)(bezier_basis0 + lVar21 + 0x169c);
        fVar176 = *(float *)(bezier_basis0 + lVar21 + 0x16a0);
        fVar217 = *(float *)(bezier_basis0 + lVar21 + 0x16a4);
        fVar328 = *(float *)(bezier_basis0 + lVar21 + 0x16a8);
        fVar303 = *(float *)(bezier_basis0 + lVar21 + 0x16ac);
        fVar304 = *(float *)(bezier_basis0 + lVar21 + 0x1b18);
        fVar221 = *(float *)(bezier_basis0 + lVar21 + 0x1b1c);
        fVar329 = *(float *)(bezier_basis0 + lVar21 + 0x1b20);
        fVar305 = *(float *)(bezier_basis0 + lVar21 + 0x1b24);
        fVar306 = *(float *)(bezier_basis0 + lVar21 + 0x1b28);
        fVar224 = *(float *)(bezier_basis0 + lVar21 + 0x1b2c);
        fVar330 = *(float *)(bezier_basis0 + lVar21 + 0x1b30);
        fVar321 = *(float *)(bezier_basis0 + lVar21 + 0x1f9c);
        fVar327 = *(float *)(bezier_basis0 + lVar21 + 0x1fa0);
        fVar226 = *(float *)(bezier_basis0 + lVar21 + 0x1fa4);
        fVar156 = *(float *)(bezier_basis0 + lVar21 + 0x1fa8);
        fVar178 = *(float *)(bezier_basis0 + lVar21 + 0x1fac);
        fVar273 = *(float *)(bezier_basis0 + lVar21 + 0x1fb0);
        fVar228 = *(float *)(bezier_basis0 + lVar21 + 0x1fb4);
        fVar261 = auVar310._28_4_ + *(float *)(bezier_basis1 + lVar21 + 0x4a0);
        fVar177 = *(float *)(bezier_basis0 + lVar21 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar21 + 0x1fb8);
        fVar320 = fVar261 + auVar310._28_4_ + *(float *)(bezier_basis1 + lVar21 + 0x1c);
        fVar272 = *(float *)(bezier_basis0 + lVar21 + 0x16b0) + fVar177;
        auVar165._0_4_ =
             fVar307 * fVar259 + fVar179 * fVar304 + fVar157 * fVar321 + fVar198 * fVar218;
        auVar165._4_4_ =
             fVar315 * fVar260 + fVar193 * fVar221 + fVar173 * fVar327 + fVar212 * fVar229;
        auVar165._8_4_ =
             fVar317 * fVar355 + fVar194 * fVar329 + fVar174 * fVar226 + fVar215 * fVar241;
        auVar165._12_4_ =
             fVar319 * fVar176 + fVar195 * fVar305 + fVar175 * fVar156 + fVar219 * fVar245;
        auVar165._16_4_ =
             fVar307 * fVar217 + fVar179 * fVar306 + fVar157 * fVar178 + fVar198 * fVar249;
        auVar165._20_4_ =
             fVar315 * fVar328 + fVar193 * fVar224 + fVar173 * fVar273 + fVar212 * fVar254;
        auVar165._24_4_ =
             fVar317 * fVar303 + fVar194 * fVar330 + fVar174 * fVar228 + fVar215 * fVar258;
        auVar165._28_4_ = fVar320 + fVar177;
        local_3a0._4_4_ =
             fVar369 * fVar229 + fVar350 * fVar260 + fVar361 * fVar221 + fVar244 * fVar327;
        local_3a0._0_4_ =
             fVar364 * fVar218 + fVar345 * fVar259 + fVar357 * fVar304 + fVar232 * fVar321;
        fStack_398 = fVar370 * fVar241 + fVar352 * fVar355 + fVar362 * fVar329 + fVar248 * fVar226;
        fStack_394 = fVar371 * fVar245 + fVar354 * fVar176 + fVar363 * fVar305 + fVar252 * fVar156;
        fStack_390 = fVar364 * fVar249 + fVar345 * fVar217 + fVar357 * fVar306 + fVar232 * fVar178;
        fStack_38c = fVar369 * fVar254 + fVar350 * fVar328 + fVar361 * fVar224 + fVar244 * fVar273;
        fStack_388 = fVar370 * fVar258 + fVar352 * fVar303 + fVar362 * fVar330 + fVar248 * fVar228;
        fStack_384 = *(float *)(bezier_basis0 + lVar21 + 0x122c) + fVar272;
        fVar177 = *(float *)(bezier_basis1 + lVar21 + 0x1b18);
        fVar132 = *(float *)(bezier_basis1 + lVar21 + 0x1b1c);
        fVar151 = *(float *)(bezier_basis1 + lVar21 + 0x1b20);
        fVar253 = *(float *)(bezier_basis1 + lVar21 + 0x1b24);
        fVar152 = *(float *)(bezier_basis1 + lVar21 + 0x1b28);
        fVar153 = *(float *)(bezier_basis1 + lVar21 + 0x1b2c);
        fVar154 = *(float *)(bezier_basis1 + lVar21 + 0x1b30);
        fVar155 = *(float *)(bezier_basis1 + lVar21 + 0x1f9c);
        fVar199 = *(float *)(bezier_basis1 + lVar21 + 0x1fa0);
        fVar213 = *(float *)(bezier_basis1 + lVar21 + 0x1fa4);
        fVar216 = *(float *)(bezier_basis1 + lVar21 + 0x1fa8);
        fVar220 = *(float *)(bezier_basis1 + lVar21 + 0x1fac);
        fVar223 = *(float *)(bezier_basis1 + lVar21 + 0x1fb0);
        fVar225 = *(float *)(bezier_basis1 + lVar21 + 0x1fb4);
        fVar227 = *(float *)(bezier_basis1 + lVar21 + 0x1694);
        fVar262 = *(float *)(bezier_basis1 + lVar21 + 0x1698);
        fVar275 = *(float *)(bezier_basis1 + lVar21 + 0x169c);
        fVar286 = *(float *)(bezier_basis1 + lVar21 + 0x16a0);
        fVar287 = *(float *)(bezier_basis1 + lVar21 + 0x16a4);
        fVar288 = *(float *)(bezier_basis1 + lVar21 + 0x16a8);
        fVar289 = *(float *)(bezier_basis1 + lVar21 + 0x16ac);
        fVar290 = *(float *)(bezier_basis1 + lVar21 + 0x1210);
        fVar231 = *(float *)(bezier_basis1 + lVar21 + 0x1214);
        fVar243 = *(float *)(bezier_basis1 + lVar21 + 0x1218);
        fVar247 = *(float *)(bezier_basis1 + lVar21 + 0x121c);
        fVar251 = *(float *)(bezier_basis1 + lVar21 + 0x1220);
        fVar263 = *(float *)(bezier_basis1 + lVar21 + 0x1224);
        fVar271 = *(float *)(bezier_basis1 + lVar21 + 0x1228);
        auVar266._0_4_ =
             fVar331 * fVar290 + fVar291 * fVar227 + fVar230 * fVar177 + fVar344 * fVar155;
        auVar266._4_4_ =
             fVar335 * fVar231 + fVar308 * fVar262 + fVar242 * fVar132 + fVar349 * fVar199;
        auVar266._8_4_ =
             fVar337 * fVar243 + fVar316 * fVar275 + fVar246 * fVar151 + fVar351 * fVar213;
        auVar266._12_4_ =
             fVar338 * fVar247 + fVar318 * fVar286 + fVar250 * fVar253 + fVar353 * fVar216;
        auVar266._16_4_ =
             fVar331 * fVar251 + fVar291 * fVar287 + fVar230 * fVar152 + fVar344 * fVar220;
        auVar266._20_4_ =
             fVar335 * fVar263 + fVar308 * fVar288 + fVar242 * fVar153 + fVar349 * fVar223;
        auVar266._24_4_ =
             fVar337 * fVar271 + fVar316 * fVar289 + fVar246 * fVar154 + fVar351 * fVar225;
        auVar266._28_4_ = fVar353 + fVar353 + fVar320 + fVar272;
        auVar311._0_4_ =
             fVar198 * fVar290 + fVar307 * fVar227 + fVar179 * fVar177 + fVar157 * fVar155;
        auVar311._4_4_ =
             fVar212 * fVar231 + fVar315 * fVar262 + fVar193 * fVar132 + fVar173 * fVar199;
        auVar311._8_4_ =
             fVar215 * fVar243 + fVar317 * fVar275 + fVar194 * fVar151 + fVar174 * fVar213;
        auVar311._12_4_ =
             fVar219 * fVar247 + fVar319 * fVar286 + fVar195 * fVar253 + fVar175 * fVar216;
        auVar311._16_4_ =
             fVar198 * fVar251 + fVar307 * fVar287 + fVar179 * fVar152 + fVar157 * fVar220;
        auVar311._20_4_ =
             fVar212 * fVar263 + fVar315 * fVar288 + fVar193 * fVar153 + fVar173 * fVar223;
        auVar311._24_4_ =
             fVar215 * fVar271 + fVar317 * fVar289 + fVar194 * fVar154 + fVar174 * fVar225;
        auVar311._28_4_ = fVar353 + fVar353 + fVar353 + fVar320;
        auVar191._0_4_ =
             fVar364 * fVar290 + fVar345 * fVar227 + fVar357 * fVar177 + fVar155 * fVar232;
        auVar191._4_4_ =
             fVar369 * fVar231 + fVar350 * fVar262 + fVar361 * fVar132 + fVar199 * fVar244;
        auVar191._8_4_ =
             fVar370 * fVar243 + fVar352 * fVar275 + fVar362 * fVar151 + fVar213 * fVar248;
        auVar191._12_4_ =
             fVar371 * fVar247 + fVar354 * fVar286 + fVar363 * fVar253 + fVar216 * fVar252;
        auVar191._16_4_ =
             fVar364 * fVar251 + fVar345 * fVar287 + fVar357 * fVar152 + fVar220 * fVar232;
        auVar191._20_4_ =
             fVar369 * fVar263 + fVar350 * fVar288 + fVar361 * fVar153 + fVar223 * fVar244;
        auVar191._24_4_ =
             fVar370 * fVar271 + fVar352 * fVar289 + fVar362 * fVar154 + fVar225 * fVar248;
        auVar191._28_4_ =
             *(float *)(bezier_basis1 + lVar21 + 0x122c) +
             *(float *)(bezier_basis1 + lVar21 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar21 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar21 + 0x1fb8);
        auVar237._8_4_ = 0x7fffffff;
        auVar237._0_8_ = 0x7fffffff7fffffff;
        auVar237._12_4_ = 0x7fffffff;
        auVar237._16_4_ = 0x7fffffff;
        auVar237._20_4_ = 0x7fffffff;
        auVar237._24_4_ = 0x7fffffff;
        auVar237._28_4_ = 0x7fffffff;
        auVar114._4_4_ =
             fVar335 * fVar229 + fVar308 * fVar260 + fVar242 * fVar221 + fVar349 * fVar327;
        auVar114._0_4_ =
             fVar331 * fVar218 + fVar291 * fVar259 + fVar230 * fVar304 + fVar344 * fVar321;
        auVar114._8_4_ =
             fVar337 * fVar241 + fVar316 * fVar355 + fVar246 * fVar329 + fVar351 * fVar226;
        auVar114._12_4_ =
             fVar338 * fVar245 + fVar318 * fVar176 + fVar250 * fVar305 + fVar353 * fVar156;
        auVar114._16_4_ =
             fVar331 * fVar249 + fVar291 * fVar217 + fVar230 * fVar306 + fVar344 * fVar178;
        auVar114._20_4_ =
             fVar335 * fVar254 + fVar308 * fVar328 + fVar242 * fVar224 + fVar349 * fVar273;
        auVar114._24_4_ =
             fVar337 * fVar258 + fVar316 * fVar303 + fVar246 * fVar330 + fVar351 * fVar228;
        auVar114._28_4_ =
             *(float *)(bezier_basis0 + lVar21 + 0x16b0) +
             *(float *)(bezier_basis0 + lVar21 + 0x1fb8) + fVar261;
        auVar209 = vandps_avx(auVar114,auVar237);
        auVar38 = vandps_avx(auVar165,auVar237);
        auVar38 = vmaxps_avx(auVar209,auVar38);
        auVar209 = vandps_avx(auVar237,_local_3a0);
        auVar209 = vmaxps_avx(auVar38,auVar209);
        auVar236 = vpermilps_avx(auVar236,0);
        auVar256._16_16_ = auVar236;
        auVar256._0_16_ = auVar236;
        auVar209 = vcmpps_avx(auVar209,auVar256,1);
        auVar312 = vblendvps_avx(auVar114,auVar30,auVar209);
        auVar204 = vblendvps_avx(auVar165,auVar142,auVar209);
        auVar209 = vandps_avx(auVar266,auVar237);
        auVar38 = vandps_avx(auVar311,auVar237);
        auVar34 = vmaxps_avx(auVar209,auVar38);
        auVar209 = vandps_avx(auVar191,auVar237);
        auVar209 = vmaxps_avx(auVar34,auVar209);
        auVar34 = vcmpps_avx(auVar209,auVar256,1);
        auVar209 = vblendvps_avx(auVar266,auVar30,auVar34);
        auVar30 = vblendvps_avx(auVar311,auVar142,auVar34);
        fVar132 = auVar312._0_4_;
        fVar151 = auVar312._4_4_;
        fVar253 = auVar312._8_4_;
        fVar152 = auVar312._12_4_;
        fVar153 = auVar312._16_4_;
        fVar154 = auVar312._20_4_;
        fVar155 = auVar312._24_4_;
        fVar262 = -auVar312._28_4_;
        fVar199 = auVar209._0_4_;
        fVar213 = auVar209._4_4_;
        fVar216 = auVar209._8_4_;
        fVar220 = auVar209._12_4_;
        fVar223 = auVar209._16_4_;
        fVar225 = auVar209._20_4_;
        fVar227 = auVar209._24_4_;
        fVar218 = auVar204._0_4_;
        fVar249 = auVar204._4_4_;
        fVar260 = auVar204._8_4_;
        fVar328 = auVar204._12_4_;
        fVar329 = auVar204._16_4_;
        fVar330 = auVar204._20_4_;
        fVar156 = auVar204._24_4_;
        auVar138._0_4_ = fVar218 * fVar218 + fVar132 * fVar132;
        auVar138._4_4_ = fVar249 * fVar249 + fVar151 * fVar151;
        auVar138._8_4_ = fVar260 * fVar260 + fVar253 * fVar253;
        auVar138._12_4_ = fVar328 * fVar328 + fVar152 * fVar152;
        auVar138._16_4_ = fVar329 * fVar329 + fVar153 * fVar153;
        auVar138._20_4_ = fVar330 * fVar330 + fVar154 * fVar154;
        auVar138._24_4_ = fVar156 * fVar156 + fVar155 * fVar155;
        auVar138._28_4_ = auVar311._28_4_ + auVar312._28_4_;
        auVar142 = vrsqrtps_avx(auVar138);
        fVar229 = auVar142._0_4_;
        fVar241 = auVar142._4_4_;
        auVar34._4_4_ = fVar241 * 1.5;
        auVar34._0_4_ = fVar229 * 1.5;
        fVar245 = auVar142._8_4_;
        auVar34._8_4_ = fVar245 * 1.5;
        fVar254 = auVar142._12_4_;
        auVar34._12_4_ = fVar254 * 1.5;
        fVar258 = auVar142._16_4_;
        auVar34._16_4_ = fVar258 * 1.5;
        fVar259 = auVar142._20_4_;
        auVar34._20_4_ = fVar259 * 1.5;
        fVar355 = auVar142._24_4_;
        fVar177 = auVar38._28_4_;
        auVar34._24_4_ = fVar355 * 1.5;
        auVar34._28_4_ = fVar177;
        auVar142._4_4_ = fVar241 * fVar241 * fVar241 * auVar138._4_4_ * 0.5;
        auVar142._0_4_ = fVar229 * fVar229 * fVar229 * auVar138._0_4_ * 0.5;
        auVar142._8_4_ = fVar245 * fVar245 * fVar245 * auVar138._8_4_ * 0.5;
        auVar142._12_4_ = fVar254 * fVar254 * fVar254 * auVar138._12_4_ * 0.5;
        auVar142._16_4_ = fVar258 * fVar258 * fVar258 * auVar138._16_4_ * 0.5;
        auVar142._20_4_ = fVar259 * fVar259 * fVar259 * auVar138._20_4_ * 0.5;
        auVar142._24_4_ = fVar355 * fVar355 * fVar355 * auVar138._24_4_ * 0.5;
        auVar142._28_4_ = auVar138._28_4_;
        auVar142 = vsubps_avx(auVar34,auVar142);
        fVar229 = auVar142._0_4_;
        fVar254 = auVar142._4_4_;
        fVar355 = auVar142._8_4_;
        fVar303 = auVar142._12_4_;
        fVar305 = auVar142._16_4_;
        fVar321 = auVar142._20_4_;
        fVar178 = auVar142._24_4_;
        fVar241 = auVar30._0_4_;
        fVar258 = auVar30._4_4_;
        fVar176 = auVar30._8_4_;
        fVar304 = auVar30._12_4_;
        fVar306 = auVar30._16_4_;
        fVar327 = auVar30._20_4_;
        fVar273 = auVar30._24_4_;
        auVar139._0_4_ = fVar241 * fVar241 + fVar199 * fVar199;
        auVar139._4_4_ = fVar258 * fVar258 + fVar213 * fVar213;
        auVar139._8_4_ = fVar176 * fVar176 + fVar216 * fVar216;
        auVar139._12_4_ = fVar304 * fVar304 + fVar220 * fVar220;
        auVar139._16_4_ = fVar306 * fVar306 + fVar223 * fVar223;
        auVar139._20_4_ = fVar327 * fVar327 + fVar225 * fVar225;
        auVar139._24_4_ = fVar273 * fVar273 + fVar227 * fVar227;
        auVar139._28_4_ = auVar209._28_4_ + auVar142._28_4_;
        auVar209 = vrsqrtps_avx(auVar139);
        fVar245 = auVar209._0_4_;
        fVar259 = auVar209._4_4_;
        auVar35._4_4_ = fVar259 * 1.5;
        auVar35._0_4_ = fVar245 * 1.5;
        fVar217 = auVar209._8_4_;
        auVar35._8_4_ = fVar217 * 1.5;
        fVar221 = auVar209._12_4_;
        auVar35._12_4_ = fVar221 * 1.5;
        fVar224 = auVar209._16_4_;
        auVar35._16_4_ = fVar224 * 1.5;
        fVar226 = auVar209._20_4_;
        auVar35._20_4_ = fVar226 * 1.5;
        fVar228 = auVar209._24_4_;
        auVar35._24_4_ = fVar228 * 1.5;
        auVar35._28_4_ = fVar177;
        auVar36._4_4_ = fVar259 * fVar259 * fVar259 * auVar139._4_4_ * 0.5;
        auVar36._0_4_ = fVar245 * fVar245 * fVar245 * auVar139._0_4_ * 0.5;
        auVar36._8_4_ = fVar217 * fVar217 * fVar217 * auVar139._8_4_ * 0.5;
        auVar36._12_4_ = fVar221 * fVar221 * fVar221 * auVar139._12_4_ * 0.5;
        auVar36._16_4_ = fVar224 * fVar224 * fVar224 * auVar139._16_4_ * 0.5;
        auVar36._20_4_ = fVar226 * fVar226 * fVar226 * auVar139._20_4_ * 0.5;
        auVar36._24_4_ = fVar228 * fVar228 * fVar228 * auVar139._24_4_ * 0.5;
        auVar36._28_4_ = auVar139._28_4_;
        auVar209 = vsubps_avx(auVar35,auVar36);
        fVar245 = auVar209._0_4_;
        fVar259 = auVar209._4_4_;
        fVar217 = auVar209._8_4_;
        fVar221 = auVar209._12_4_;
        fVar224 = auVar209._16_4_;
        fVar226 = auVar209._20_4_;
        fVar228 = auVar209._24_4_;
        fVar218 = (float)local_8e0._0_4_ * fVar218 * fVar229;
        fVar249 = (float)local_8e0._4_4_ * fVar249 * fVar254;
        auVar37._4_4_ = fVar249;
        auVar37._0_4_ = fVar218;
        fVar260 = fStack_8d8 * fVar260 * fVar355;
        auVar37._8_4_ = fVar260;
        fVar328 = fStack_8d4 * fVar328 * fVar303;
        auVar37._12_4_ = fVar328;
        fVar329 = (float)auStack_8d0._0_4_ * fVar329 * fVar305;
        auVar37._16_4_ = fVar329;
        fVar330 = (float)auStack_8d0._4_4_ * fVar330 * fVar321;
        auVar37._20_4_ = fVar330;
        fVar156 = fStack_8c8 * fVar156 * fVar178;
        auVar37._24_4_ = fVar156;
        auVar37._28_4_ = fVar177;
        local_780._4_4_ = fVar249 + auVar365._4_4_;
        local_780._0_4_ = fVar218 + auVar365._0_4_;
        fStack_778 = fVar260 + auVar365._8_4_;
        fStack_774 = fVar328 + auVar365._12_4_;
        fStack_770 = fVar329 + auVar365._16_4_;
        fStack_76c = fVar330 + auVar365._20_4_;
        fStack_768 = fVar156 + auVar365._24_4_;
        fStack_764 = fVar177 + auVar365._28_4_;
        local_740 = (float)local_8e0._0_4_ * fVar229 * -fVar132;
        fStack_73c = (float)local_8e0._4_4_ * fVar254 * -fVar151;
        auVar31._4_4_ = fStack_73c;
        auVar31._0_4_ = local_740;
        fStack_738 = fStack_8d8 * fVar355 * -fVar253;
        auVar31._8_4_ = fStack_738;
        fStack_734 = fStack_8d4 * fVar303 * -fVar152;
        auVar31._12_4_ = fStack_734;
        fStack_730 = (float)auStack_8d0._0_4_ * fVar305 * -fVar153;
        auVar31._16_4_ = fStack_730;
        fStack_72c = (float)auStack_8d0._4_4_ * fVar321 * -fVar154;
        auVar31._20_4_ = fStack_72c;
        fStack_728 = fStack_8c8 * fVar178 * -fVar155;
        auVar31._24_4_ = fStack_728;
        auVar31._28_4_ = fVar262;
        local_740 = auVar298._0_4_ + local_740;
        fStack_73c = auVar298._4_4_ + fStack_73c;
        fStack_738 = auVar298._8_4_ + fStack_738;
        fStack_734 = auVar298._12_4_ + fStack_734;
        fStack_730 = auVar298._16_4_ + fStack_730;
        fStack_72c = auVar298._20_4_ + fStack_72c;
        fStack_728 = auVar298._24_4_ + fStack_728;
        fStack_724 = auVar298._28_4_ + fVar262;
        fVar218 = fVar229 * 0.0 * (float)local_8e0._0_4_;
        fVar229 = fVar254 * 0.0 * (float)local_8e0._4_4_;
        auVar32._4_4_ = fVar229;
        auVar32._0_4_ = fVar218;
        fVar249 = fVar355 * 0.0 * fStack_8d8;
        auVar32._8_4_ = fVar249;
        fVar254 = fVar303 * 0.0 * fStack_8d4;
        auVar32._12_4_ = fVar254;
        fVar260 = fVar305 * 0.0 * (float)auStack_8d0._0_4_;
        auVar32._16_4_ = fVar260;
        fVar355 = fVar321 * 0.0 * (float)auStack_8d0._4_4_;
        auVar32._20_4_ = fVar355;
        fVar328 = fVar178 * 0.0 * fStack_8c8;
        auVar32._24_4_ = fVar328;
        auVar32._28_4_ = fVar354;
        auVar118._4_4_ = fStack_55c;
        auVar118._0_4_ = local_560;
        auVar118._8_4_ = fStack_558;
        auVar118._12_4_ = fStack_554;
        auVar118._16_4_ = fStack_550;
        auVar118._20_4_ = fStack_54c;
        auVar118._24_4_ = fStack_548;
        auVar118._28_4_ = fStack_544;
        auVar267._0_4_ = local_560 + fVar218;
        auVar267._4_4_ = fStack_55c + fVar229;
        auVar267._8_4_ = fStack_558 + fVar249;
        auVar267._12_4_ = fStack_554 + fVar254;
        auVar267._16_4_ = fStack_550 + fVar260;
        auVar267._20_4_ = fStack_54c + fVar355;
        auVar267._24_4_ = fStack_548 + fVar328;
        auVar267._28_4_ = fStack_544 + fVar354;
        fVar218 = auVar323._0_4_ * fVar241 * fVar245;
        fVar229 = auVar323._4_4_ * fVar258 * fVar259;
        auVar33._4_4_ = fVar229;
        auVar33._0_4_ = fVar218;
        fVar241 = auVar323._8_4_ * fVar176 * fVar217;
        auVar33._8_4_ = fVar241;
        fVar249 = auVar323._12_4_ * fVar304 * fVar221;
        auVar33._12_4_ = fVar249;
        fVar254 = auVar323._16_4_ * fVar306 * fVar224;
        auVar33._16_4_ = fVar254;
        fVar258 = auVar323._20_4_ * fVar327 * fVar226;
        auVar33._20_4_ = fVar258;
        fVar260 = auVar323._24_4_ * fVar273 * fVar228;
        auVar33._24_4_ = fVar260;
        auVar33._28_4_ = auVar30._28_4_;
        auVar365 = vsubps_avx(auVar365,auVar37);
        auVar324._0_4_ = auVar310._0_4_ + fVar218;
        auVar324._4_4_ = auVar310._4_4_ + fVar229;
        auVar324._8_4_ = auVar310._8_4_ + fVar241;
        auVar324._12_4_ = auVar310._12_4_ + fVar249;
        auVar324._16_4_ = auVar310._16_4_ + fVar254;
        auVar324._20_4_ = auVar310._20_4_ + fVar258;
        auVar324._24_4_ = auVar310._24_4_ + fVar260;
        auVar324._28_4_ = auVar310._28_4_ + auVar30._28_4_;
        fVar218 = auVar323._0_4_ * fVar245 * -fVar199;
        fVar229 = auVar323._4_4_ * fVar259 * -fVar213;
        auVar30._4_4_ = fVar229;
        auVar30._0_4_ = fVar218;
        fVar241 = auVar323._8_4_ * fVar217 * -fVar216;
        auVar30._8_4_ = fVar241;
        fVar249 = auVar323._12_4_ * fVar221 * -fVar220;
        auVar30._12_4_ = fVar249;
        fVar254 = auVar323._16_4_ * fVar224 * -fVar223;
        auVar30._16_4_ = fVar254;
        fVar258 = auVar323._20_4_ * fVar226 * -fVar225;
        auVar30._20_4_ = fVar258;
        fVar260 = auVar323._24_4_ * fVar228 * -fVar227;
        auVar30._24_4_ = fVar260;
        auVar30._28_4_ = fVar363;
        auVar34 = vsubps_avx(auVar298,auVar31);
        auVar334._0_4_ = fVar218 + (float)local_680._0_4_;
        auVar334._4_4_ = fVar229 + (float)local_680._4_4_;
        auVar334._8_4_ = fVar241 + fStack_678;
        auVar334._12_4_ = fVar249 + fStack_674;
        auVar334._16_4_ = fVar254 + fStack_670;
        auVar334._20_4_ = fVar258 + fStack_66c;
        auVar334._24_4_ = fVar260 + fStack_668;
        auVar334._28_4_ = fVar363 + fStack_664;
        fVar218 = fVar245 * 0.0 * auVar323._0_4_;
        fVar229 = fVar259 * 0.0 * auVar323._4_4_;
        auVar39._4_4_ = fVar229;
        auVar39._0_4_ = fVar218;
        fVar241 = fVar217 * 0.0 * auVar323._8_4_;
        auVar39._8_4_ = fVar241;
        fVar245 = fVar221 * 0.0 * auVar323._12_4_;
        auVar39._12_4_ = fVar245;
        fVar249 = fVar224 * 0.0 * auVar323._16_4_;
        auVar39._16_4_ = fVar249;
        fVar254 = fVar226 * 0.0 * auVar323._20_4_;
        auVar39._20_4_ = fVar254;
        fVar258 = fVar228 * 0.0 * auVar323._24_4_;
        auVar39._24_4_ = fVar258;
        auVar39._28_4_ = fVar262;
        auVar36 = vsubps_avx(auVar118,auVar32);
        auVar117._4_4_ = fStack_57c;
        auVar117._0_4_ = local_580;
        auVar117._8_4_ = fStack_578;
        auVar117._12_4_ = fStack_574;
        auVar117._16_4_ = fStack_570;
        auVar117._20_4_ = fStack_56c;
        auVar117._24_4_ = fStack_568;
        auVar117._28_4_ = fStack_564;
        auVar366._0_4_ = local_580 + fVar218;
        auVar366._4_4_ = fStack_57c + fVar229;
        auVar366._8_4_ = fStack_578 + fVar241;
        auVar366._12_4_ = fStack_574 + fVar245;
        auVar366._16_4_ = fStack_570 + fVar249;
        auVar366._20_4_ = fStack_56c + fVar254;
        auVar366._24_4_ = fStack_568 + fVar258;
        auVar366._28_4_ = fStack_564 + fVar262;
        auVar209 = vsubps_avx(auVar310,auVar33);
        auVar30 = vsubps_avx(_local_680,auVar30);
        auVar142 = vsubps_avx(auVar117,auVar39);
        auVar38 = vsubps_avx(auVar334,auVar34);
        auVar312 = vsubps_avx(auVar366,auVar36);
        auVar40._4_4_ = auVar36._4_4_ * auVar38._4_4_;
        auVar40._0_4_ = auVar36._0_4_ * auVar38._0_4_;
        auVar40._8_4_ = auVar36._8_4_ * auVar38._8_4_;
        auVar40._12_4_ = auVar36._12_4_ * auVar38._12_4_;
        auVar40._16_4_ = auVar36._16_4_ * auVar38._16_4_;
        auVar40._20_4_ = auVar36._20_4_ * auVar38._20_4_;
        auVar40._24_4_ = auVar36._24_4_ * auVar38._24_4_;
        auVar40._28_4_ = fVar363;
        auVar41._4_4_ = auVar34._4_4_ * auVar312._4_4_;
        auVar41._0_4_ = auVar34._0_4_ * auVar312._0_4_;
        auVar41._8_4_ = auVar34._8_4_ * auVar312._8_4_;
        auVar41._12_4_ = auVar34._12_4_ * auVar312._12_4_;
        auVar41._16_4_ = auVar34._16_4_ * auVar312._16_4_;
        auVar41._20_4_ = auVar34._20_4_ * auVar312._20_4_;
        auVar41._24_4_ = auVar34._24_4_ * auVar312._24_4_;
        auVar41._28_4_ = fStack_564;
        auVar204 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = auVar365._4_4_ * auVar312._4_4_;
        auVar42._0_4_ = auVar365._0_4_ * auVar312._0_4_;
        auVar42._8_4_ = auVar365._8_4_ * auVar312._8_4_;
        auVar42._12_4_ = auVar365._12_4_ * auVar312._12_4_;
        auVar42._16_4_ = auVar365._16_4_ * auVar312._16_4_;
        auVar42._20_4_ = auVar365._20_4_ * auVar312._20_4_;
        auVar42._24_4_ = auVar365._24_4_ * auVar312._24_4_;
        auVar42._28_4_ = auVar312._28_4_;
        auVar298 = vsubps_avx(auVar324,auVar365);
        auVar43._4_4_ = auVar36._4_4_ * auVar298._4_4_;
        auVar43._0_4_ = auVar36._0_4_ * auVar298._0_4_;
        auVar43._8_4_ = auVar36._8_4_ * auVar298._8_4_;
        auVar43._12_4_ = auVar36._12_4_ * auVar298._12_4_;
        auVar43._16_4_ = auVar36._16_4_ * auVar298._16_4_;
        auVar43._20_4_ = auVar36._20_4_ * auVar298._20_4_;
        auVar43._24_4_ = auVar36._24_4_ * auVar298._24_4_;
        auVar43._28_4_ = fStack_664;
        auVar35 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar298._4_4_ * auVar34._4_4_;
        auVar44._0_4_ = auVar298._0_4_ * auVar34._0_4_;
        auVar44._8_4_ = auVar298._8_4_ * auVar34._8_4_;
        auVar44._12_4_ = auVar298._12_4_ * auVar34._12_4_;
        auVar44._16_4_ = auVar298._16_4_ * auVar34._16_4_;
        auVar44._20_4_ = auVar298._20_4_ * auVar34._20_4_;
        auVar44._24_4_ = auVar298._24_4_ * auVar34._24_4_;
        auVar44._28_4_ = auVar312._28_4_;
        auVar45._4_4_ = auVar365._4_4_ * auVar38._4_4_;
        auVar45._0_4_ = auVar365._0_4_ * auVar38._0_4_;
        auVar45._8_4_ = auVar365._8_4_ * auVar38._8_4_;
        auVar45._12_4_ = auVar365._12_4_ * auVar38._12_4_;
        auVar45._16_4_ = auVar365._16_4_ * auVar38._16_4_;
        auVar45._20_4_ = auVar365._20_4_ * auVar38._20_4_;
        auVar45._24_4_ = auVar365._24_4_ * auVar38._24_4_;
        auVar45._28_4_ = auVar38._28_4_;
        auVar38 = vsubps_avx(auVar45,auVar44);
        auVar140._0_4_ = auVar204._0_4_ * 0.0 + auVar38._0_4_ + auVar35._0_4_ * 0.0;
        auVar140._4_4_ = auVar204._4_4_ * 0.0 + auVar38._4_4_ + auVar35._4_4_ * 0.0;
        auVar140._8_4_ = auVar204._8_4_ * 0.0 + auVar38._8_4_ + auVar35._8_4_ * 0.0;
        auVar140._12_4_ = auVar204._12_4_ * 0.0 + auVar38._12_4_ + auVar35._12_4_ * 0.0;
        auVar140._16_4_ = auVar204._16_4_ * 0.0 + auVar38._16_4_ + auVar35._16_4_ * 0.0;
        auVar140._20_4_ = auVar204._20_4_ * 0.0 + auVar38._20_4_ + auVar35._20_4_ * 0.0;
        auVar140._24_4_ = auVar204._24_4_ * 0.0 + auVar38._24_4_ + auVar35._24_4_ * 0.0;
        auVar140._28_4_ = auVar38._28_4_ + auVar38._28_4_ + auVar35._28_4_;
        auVar35 = vcmpps_avx(auVar140,ZEXT832(0) << 0x20,2);
        auVar209 = vblendvps_avx(auVar209,_local_780,auVar35);
        auVar115._4_4_ = fStack_73c;
        auVar115._0_4_ = local_740;
        auVar115._8_4_ = fStack_738;
        auVar115._12_4_ = fStack_734;
        auVar115._16_4_ = fStack_730;
        auVar115._20_4_ = fStack_72c;
        auVar115._24_4_ = fStack_728;
        auVar115._28_4_ = fStack_724;
        auVar30 = vblendvps_avx(auVar30,auVar115,auVar35);
        auVar142 = vblendvps_avx(auVar142,auVar267,auVar35);
        auVar38 = vblendvps_avx(auVar365,auVar324,auVar35);
        auVar312 = vblendvps_avx(auVar34,auVar334,auVar35);
        auVar204 = vblendvps_avx(auVar36,auVar366,auVar35);
        auVar298 = vblendvps_avx(auVar324,auVar365,auVar35);
        auVar365 = vblendvps_avx(auVar334,auVar34,auVar35);
        auVar236 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
        auVar34 = vblendvps_avx(auVar366,auVar36,auVar35);
        auVar298 = vsubps_avx(auVar298,auVar209);
        auVar36 = vsubps_avx(auVar365,auVar30);
        auVar34 = vsubps_avx(auVar34,auVar142);
        auVar37 = vsubps_avx(auVar30,auVar312);
        fVar218 = auVar36._0_4_;
        fVar155 = auVar142._0_4_;
        fVar254 = auVar36._4_4_;
        fVar199 = auVar142._4_4_;
        auVar46._4_4_ = fVar199 * fVar254;
        auVar46._0_4_ = fVar155 * fVar218;
        fVar176 = auVar36._8_4_;
        fVar213 = auVar142._8_4_;
        auVar46._8_4_ = fVar213 * fVar176;
        fVar221 = auVar36._12_4_;
        fVar216 = auVar142._12_4_;
        auVar46._12_4_ = fVar216 * fVar221;
        fVar330 = auVar36._16_4_;
        fVar220 = auVar142._16_4_;
        auVar46._16_4_ = fVar220 * fVar330;
        fVar178 = auVar36._20_4_;
        fVar223 = auVar142._20_4_;
        auVar46._20_4_ = fVar223 * fVar178;
        fVar151 = auVar36._24_4_;
        fVar225 = auVar142._24_4_;
        auVar46._24_4_ = fVar225 * fVar151;
        auVar46._28_4_ = auVar365._28_4_;
        fVar229 = auVar30._0_4_;
        fVar290 = auVar34._0_4_;
        fVar258 = auVar30._4_4_;
        fVar157 = auVar34._4_4_;
        auVar47._4_4_ = fVar157 * fVar258;
        auVar47._0_4_ = fVar290 * fVar229;
        fVar217 = auVar30._8_4_;
        fVar173 = auVar34._8_4_;
        auVar47._8_4_ = fVar173 * fVar217;
        fVar329 = auVar30._12_4_;
        fVar174 = auVar34._12_4_;
        auVar47._12_4_ = fVar174 * fVar329;
        fVar321 = auVar30._16_4_;
        fVar175 = auVar34._16_4_;
        auVar47._16_4_ = fVar175 * fVar321;
        fVar273 = auVar30._20_4_;
        fVar198 = auVar34._20_4_;
        auVar47._20_4_ = fVar198 * fVar273;
        fVar253 = auVar30._24_4_;
        fVar212 = auVar34._24_4_;
        auVar47._24_4_ = fVar212 * fVar253;
        auVar47._28_4_ = auVar334._28_4_;
        auVar365 = vsubps_avx(auVar47,auVar46);
        fVar241 = auVar209._0_4_;
        fVar259 = auVar209._4_4_;
        auVar48._4_4_ = fVar157 * fVar259;
        auVar48._0_4_ = fVar290 * fVar241;
        fVar328 = auVar209._8_4_;
        auVar48._8_4_ = fVar173 * fVar328;
        fVar305 = auVar209._12_4_;
        auVar48._12_4_ = fVar174 * fVar305;
        fVar327 = auVar209._16_4_;
        auVar48._16_4_ = fVar175 * fVar327;
        fVar228 = auVar209._20_4_;
        auVar48._20_4_ = fVar198 * fVar228;
        fVar152 = auVar209._24_4_;
        auVar48._24_4_ = fVar212 * fVar152;
        auVar48._28_4_ = auVar334._28_4_;
        fVar245 = auVar298._0_4_;
        auVar359._0_4_ = fVar155 * fVar245;
        fVar260 = auVar298._4_4_;
        auVar359._4_4_ = fVar199 * fVar260;
        fVar303 = auVar298._8_4_;
        auVar359._8_4_ = fVar213 * fVar303;
        fVar306 = auVar298._12_4_;
        auVar359._12_4_ = fVar216 * fVar306;
        fVar226 = auVar298._16_4_;
        auVar359._16_4_ = fVar220 * fVar226;
        fVar177 = auVar298._20_4_;
        auVar359._20_4_ = fVar223 * fVar177;
        fVar153 = auVar298._24_4_;
        auVar359._24_4_ = fVar225 * fVar153;
        auVar359._28_4_ = 0;
        auVar31 = vsubps_avx(auVar359,auVar48);
        auVar49._4_4_ = fVar258 * fVar260;
        auVar49._0_4_ = fVar229 * fVar245;
        auVar49._8_4_ = fVar217 * fVar303;
        auVar49._12_4_ = fVar329 * fVar306;
        auVar49._16_4_ = fVar321 * fVar226;
        auVar49._20_4_ = fVar273 * fVar177;
        auVar49._24_4_ = fVar253 * fVar153;
        auVar49._28_4_ = auVar334._28_4_;
        auVar50._4_4_ = fVar259 * fVar254;
        auVar50._0_4_ = fVar241 * fVar218;
        auVar50._8_4_ = fVar328 * fVar176;
        auVar50._12_4_ = fVar305 * fVar221;
        auVar50._16_4_ = fVar327 * fVar330;
        auVar50._20_4_ = fVar228 * fVar178;
        auVar50._24_4_ = fVar152 * fVar151;
        auVar50._28_4_ = auVar366._28_4_;
        auVar32 = vsubps_avx(auVar50,auVar49);
        auVar33 = vsubps_avx(auVar142,auVar204);
        fVar249 = auVar32._28_4_ + auVar31._28_4_;
        auVar166._0_4_ = auVar32._0_4_ + auVar31._0_4_ * 0.0 + auVar365._0_4_ * 0.0;
        auVar166._4_4_ = auVar32._4_4_ + auVar31._4_4_ * 0.0 + auVar365._4_4_ * 0.0;
        auVar166._8_4_ = auVar32._8_4_ + auVar31._8_4_ * 0.0 + auVar365._8_4_ * 0.0;
        auVar166._12_4_ = auVar32._12_4_ + auVar31._12_4_ * 0.0 + auVar365._12_4_ * 0.0;
        auVar166._16_4_ = auVar32._16_4_ + auVar31._16_4_ * 0.0 + auVar365._16_4_ * 0.0;
        auVar166._20_4_ = auVar32._20_4_ + auVar31._20_4_ * 0.0 + auVar365._20_4_ * 0.0;
        auVar166._24_4_ = auVar32._24_4_ + auVar31._24_4_ * 0.0 + auVar365._24_4_ * 0.0;
        auVar166._28_4_ = fVar249 + auVar365._28_4_;
        fVar227 = auVar37._0_4_;
        fVar262 = auVar37._4_4_;
        auVar51._4_4_ = fVar262 * auVar204._4_4_;
        auVar51._0_4_ = fVar227 * auVar204._0_4_;
        fVar275 = auVar37._8_4_;
        auVar51._8_4_ = fVar275 * auVar204._8_4_;
        fVar286 = auVar37._12_4_;
        auVar51._12_4_ = fVar286 * auVar204._12_4_;
        fVar287 = auVar37._16_4_;
        auVar51._16_4_ = fVar287 * auVar204._16_4_;
        fVar288 = auVar37._20_4_;
        auVar51._20_4_ = fVar288 * auVar204._20_4_;
        fVar289 = auVar37._24_4_;
        auVar51._24_4_ = fVar289 * auVar204._24_4_;
        auVar51._28_4_ = fVar249;
        fVar249 = auVar33._0_4_;
        fVar355 = auVar33._4_4_;
        auVar52._4_4_ = auVar312._4_4_ * fVar355;
        auVar52._0_4_ = auVar312._0_4_ * fVar249;
        fVar304 = auVar33._8_4_;
        auVar52._8_4_ = auVar312._8_4_ * fVar304;
        fVar224 = auVar33._12_4_;
        auVar52._12_4_ = auVar312._12_4_ * fVar224;
        fVar156 = auVar33._16_4_;
        auVar52._16_4_ = auVar312._16_4_ * fVar156;
        fVar132 = auVar33._20_4_;
        auVar52._20_4_ = auVar312._20_4_ * fVar132;
        fVar154 = auVar33._24_4_;
        auVar52._24_4_ = auVar312._24_4_ * fVar154;
        auVar52._28_4_ = auVar32._28_4_;
        auVar37 = vsubps_avx(auVar52,auVar51);
        auVar31 = vsubps_avx(auVar209,auVar38);
        fVar215 = auVar31._0_4_;
        fVar219 = auVar31._4_4_;
        auVar53._4_4_ = fVar219 * auVar204._4_4_;
        auVar53._0_4_ = fVar215 * auVar204._0_4_;
        fVar230 = auVar31._8_4_;
        auVar53._8_4_ = fVar230 * auVar204._8_4_;
        fVar231 = auVar31._12_4_;
        auVar53._12_4_ = fVar231 * auVar204._12_4_;
        fVar242 = auVar31._16_4_;
        auVar53._16_4_ = fVar242 * auVar204._16_4_;
        fVar243 = auVar31._20_4_;
        auVar53._20_4_ = fVar243 * auVar204._20_4_;
        fVar246 = auVar31._24_4_;
        auVar53._24_4_ = fVar246 * auVar204._24_4_;
        auVar53._28_4_ = auVar204._28_4_;
        auVar54._4_4_ = auVar38._4_4_ * fVar355;
        auVar54._0_4_ = auVar38._0_4_ * fVar249;
        auVar54._8_4_ = auVar38._8_4_ * fVar304;
        auVar54._12_4_ = auVar38._12_4_ * fVar224;
        auVar54._16_4_ = auVar38._16_4_ * fVar156;
        auVar54._20_4_ = auVar38._20_4_ * fVar132;
        auVar54._24_4_ = auVar38._24_4_ * fVar154;
        auVar54._28_4_ = auVar365._28_4_;
        auVar365 = vsubps_avx(auVar53,auVar54);
        auVar55._4_4_ = auVar312._4_4_ * fVar219;
        auVar55._0_4_ = auVar312._0_4_ * fVar215;
        auVar55._8_4_ = auVar312._8_4_ * fVar230;
        auVar55._12_4_ = auVar312._12_4_ * fVar231;
        auVar55._16_4_ = auVar312._16_4_ * fVar242;
        auVar55._20_4_ = auVar312._20_4_ * fVar243;
        auVar55._24_4_ = auVar312._24_4_ * fVar246;
        auVar55._28_4_ = auVar204._28_4_;
        auVar56._4_4_ = auVar38._4_4_ * fVar262;
        auVar56._0_4_ = auVar38._0_4_ * fVar227;
        auVar56._8_4_ = auVar38._8_4_ * fVar275;
        auVar56._12_4_ = auVar38._12_4_ * fVar286;
        auVar56._16_4_ = auVar38._16_4_ * fVar287;
        auVar56._20_4_ = auVar38._20_4_ * fVar288;
        auVar56._24_4_ = auVar38._24_4_ * fVar289;
        auVar56._28_4_ = auVar38._28_4_;
        auVar38 = vsubps_avx(auVar56,auVar55);
        auVar150 = ZEXT864(0) << 0x20;
        auVar238._0_4_ = auVar37._0_4_ * 0.0 + auVar38._0_4_ + auVar365._0_4_ * 0.0;
        auVar238._4_4_ = auVar37._4_4_ * 0.0 + auVar38._4_4_ + auVar365._4_4_ * 0.0;
        auVar238._8_4_ = auVar37._8_4_ * 0.0 + auVar38._8_4_ + auVar365._8_4_ * 0.0;
        auVar238._12_4_ = auVar37._12_4_ * 0.0 + auVar38._12_4_ + auVar365._12_4_ * 0.0;
        auVar238._16_4_ = auVar37._16_4_ * 0.0 + auVar38._16_4_ + auVar365._16_4_ * 0.0;
        auVar238._20_4_ = auVar37._20_4_ * 0.0 + auVar38._20_4_ + auVar365._20_4_ * 0.0;
        auVar238._24_4_ = auVar37._24_4_ * 0.0 + auVar38._24_4_ + auVar365._24_4_ * 0.0;
        auVar238._28_4_ = auVar38._28_4_ + auVar38._28_4_ + auVar365._28_4_;
        auVar38 = vmaxps_avx(auVar166,auVar238);
        auVar38 = vcmpps_avx(auVar38,ZEXT832(0) << 0x20,2);
        auVar186 = vpackssdw_avx(auVar38._0_16_,auVar38._16_16_);
        auVar236 = vpand_avx(auVar186,auVar236);
        auVar186 = vpmovsxwd_avx(auVar236);
        auVar203 = vpunpckhwd_avx(auVar236,auVar236);
        auVar205._16_16_ = auVar203;
        auVar205._0_16_ = auVar186;
        if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar205 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar205 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar205 >> 0x7f,0) == '\0') &&
              (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar203 >> 0x3f,0) == '\0') &&
            (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar203[0xf]) {
LAB_00f7851f:
          auVar368 = ZEXT3264(local_5c0);
          auVar210 = ZEXT3264(auVar205);
          auVar301 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
        }
        else {
          auVar57._4_4_ = fVar355 * fVar254;
          auVar57._0_4_ = fVar249 * fVar218;
          auVar57._8_4_ = fVar304 * fVar176;
          auVar57._12_4_ = fVar224 * fVar221;
          auVar57._16_4_ = fVar156 * fVar330;
          auVar57._20_4_ = fVar132 * fVar178;
          auVar57._24_4_ = fVar154 * fVar151;
          auVar57._28_4_ = auVar203._12_4_;
          auVar340._0_4_ = fVar227 * fVar290;
          auVar340._4_4_ = fVar262 * fVar157;
          auVar340._8_4_ = fVar275 * fVar173;
          auVar340._12_4_ = fVar286 * fVar174;
          auVar340._16_4_ = fVar287 * fVar175;
          auVar340._20_4_ = fVar288 * fVar198;
          auVar340._24_4_ = fVar289 * fVar212;
          auVar340._28_4_ = 0;
          auVar38 = vsubps_avx(auVar340,auVar57);
          auVar58._4_4_ = fVar219 * fVar157;
          auVar58._0_4_ = fVar215 * fVar290;
          auVar58._8_4_ = fVar230 * fVar173;
          auVar58._12_4_ = fVar231 * fVar174;
          auVar58._16_4_ = fVar242 * fVar175;
          auVar58._20_4_ = fVar243 * fVar198;
          auVar58._24_4_ = fVar246 * fVar212;
          auVar58._28_4_ = auVar34._28_4_;
          auVar59._4_4_ = fVar355 * fVar260;
          auVar59._0_4_ = fVar249 * fVar245;
          auVar59._8_4_ = fVar304 * fVar303;
          auVar59._12_4_ = fVar224 * fVar306;
          auVar59._16_4_ = fVar156 * fVar226;
          auVar59._20_4_ = fVar132 * fVar177;
          auVar59._24_4_ = fVar154 * fVar153;
          auVar59._28_4_ = auVar33._28_4_;
          auVar204 = vsubps_avx(auVar59,auVar58);
          auVar60._4_4_ = fVar262 * fVar260;
          auVar60._0_4_ = fVar227 * fVar245;
          auVar60._8_4_ = fVar275 * fVar303;
          auVar60._12_4_ = fVar286 * fVar306;
          auVar60._16_4_ = fVar287 * fVar226;
          auVar60._20_4_ = fVar288 * fVar177;
          auVar60._24_4_ = fVar289 * fVar153;
          auVar60._28_4_ = auVar166._28_4_;
          auVar61._4_4_ = fVar219 * fVar254;
          auVar61._0_4_ = fVar215 * fVar218;
          auVar61._8_4_ = fVar230 * fVar176;
          auVar61._12_4_ = fVar231 * fVar221;
          auVar61._16_4_ = fVar242 * fVar330;
          auVar61._20_4_ = fVar243 * fVar178;
          auVar61._24_4_ = fVar246 * fVar151;
          auVar61._28_4_ = auVar36._28_4_;
          auVar365 = vsubps_avx(auVar61,auVar60);
          auVar283._0_4_ = auVar38._0_4_ * 0.0 + auVar365._0_4_ + auVar204._0_4_ * 0.0;
          auVar283._4_4_ = auVar38._4_4_ * 0.0 + auVar365._4_4_ + auVar204._4_4_ * 0.0;
          auVar283._8_4_ = auVar38._8_4_ * 0.0 + auVar365._8_4_ + auVar204._8_4_ * 0.0;
          auVar283._12_4_ = auVar38._12_4_ * 0.0 + auVar365._12_4_ + auVar204._12_4_ * 0.0;
          auVar283._16_4_ = auVar38._16_4_ * 0.0 + auVar365._16_4_ + auVar204._16_4_ * 0.0;
          auVar283._20_4_ = auVar38._20_4_ * 0.0 + auVar365._20_4_ + auVar204._20_4_ * 0.0;
          auVar283._24_4_ = auVar38._24_4_ * 0.0 + auVar365._24_4_ + auVar204._24_4_ * 0.0;
          auVar283._28_4_ = auVar36._28_4_ + auVar365._28_4_ + auVar166._28_4_;
          auVar312 = vrcpps_avx(auVar283);
          fVar218 = auVar312._0_4_;
          fVar245 = auVar312._4_4_;
          auVar62._4_4_ = auVar283._4_4_ * fVar245;
          auVar62._0_4_ = auVar283._0_4_ * fVar218;
          fVar249 = auVar312._8_4_;
          auVar62._8_4_ = auVar283._8_4_ * fVar249;
          fVar254 = auVar312._12_4_;
          auVar62._12_4_ = auVar283._12_4_ * fVar254;
          fVar260 = auVar312._16_4_;
          auVar62._16_4_ = auVar283._16_4_ * fVar260;
          fVar355 = auVar312._20_4_;
          auVar62._20_4_ = auVar283._20_4_ * fVar355;
          fVar176 = auVar312._24_4_;
          auVar62._24_4_ = auVar283._24_4_ * fVar176;
          auVar62._28_4_ = auVar33._28_4_;
          auVar341._8_4_ = 0x3f800000;
          auVar341._0_8_ = 0x3f8000003f800000;
          auVar341._12_4_ = 0x3f800000;
          auVar341._16_4_ = 0x3f800000;
          auVar341._20_4_ = 0x3f800000;
          auVar341._24_4_ = 0x3f800000;
          auVar341._28_4_ = 0x3f800000;
          auVar34 = vsubps_avx(auVar341,auVar62);
          fVar218 = auVar34._0_4_ * fVar218 + fVar218;
          fVar245 = auVar34._4_4_ * fVar245 + fVar245;
          fVar249 = auVar34._8_4_ * fVar249 + fVar249;
          fVar254 = auVar34._12_4_ * fVar254 + fVar254;
          fVar260 = auVar34._16_4_ * fVar260 + fVar260;
          fVar355 = auVar34._20_4_ * fVar355 + fVar355;
          fVar176 = auVar34._24_4_ * fVar176 + fVar176;
          auVar63._4_4_ =
               (auVar38._4_4_ * fVar259 + auVar204._4_4_ * fVar258 + auVar365._4_4_ * fVar199) *
               fVar245;
          auVar63._0_4_ =
               (auVar38._0_4_ * fVar241 + auVar204._0_4_ * fVar229 + auVar365._0_4_ * fVar155) *
               fVar218;
          auVar63._8_4_ =
               (auVar38._8_4_ * fVar328 + auVar204._8_4_ * fVar217 + auVar365._8_4_ * fVar213) *
               fVar249;
          auVar63._12_4_ =
               (auVar38._12_4_ * fVar305 + auVar204._12_4_ * fVar329 + auVar365._12_4_ * fVar216) *
               fVar254;
          auVar63._16_4_ =
               (auVar38._16_4_ * fVar327 + auVar204._16_4_ * fVar321 + auVar365._16_4_ * fVar220) *
               fVar260;
          auVar63._20_4_ =
               (auVar38._20_4_ * fVar228 + auVar204._20_4_ * fVar273 + auVar365._20_4_ * fVar223) *
               fVar355;
          auVar63._24_4_ =
               (auVar38._24_4_ * fVar152 + auVar204._24_4_ * fVar253 + auVar365._24_4_ * fVar225) *
               fVar176;
          auVar63._28_4_ = auVar298._28_4_ + auVar142._28_4_;
          auVar186 = vpermilps_avx(ZEXT416(local_880),0);
          auVar141._16_16_ = auVar186;
          auVar141._0_16_ = auVar186;
          auVar142 = vcmpps_avx(auVar141,auVar63,2);
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar206._4_4_ = uVar11;
          auVar206._0_4_ = uVar11;
          auVar206._8_4_ = uVar11;
          auVar206._12_4_ = uVar11;
          auVar206._16_4_ = uVar11;
          auVar206._20_4_ = uVar11;
          auVar206._24_4_ = uVar11;
          auVar206._28_4_ = uVar11;
          auVar38 = vcmpps_avx(auVar63,auVar206,2);
          auVar142 = vandps_avx(auVar38,auVar142);
          auVar186 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
          auVar236 = vpand_avx(auVar236,auVar186);
          auVar186 = vpmovsxwd_avx(auVar236);
          auVar203 = vpshufd_avx(auVar236,0xee);
          auVar203 = vpmovsxwd_avx(auVar203);
          auVar205._16_16_ = auVar203;
          auVar205._0_16_ = auVar186;
          auVar368 = ZEXT3264(local_5c0);
          if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar205 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar205 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar205 >> 0x7f,0) == '\0') &&
                (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar203 >> 0x3f,0) == '\0') &&
              (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar203[0xf]) goto LAB_00f7851f;
          auVar142 = vcmpps_avx(ZEXT832(0) << 0x20,auVar283,4);
          auVar186 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
          auVar236 = vpand_avx(auVar236,auVar186);
          auVar186 = vpmovsxwd_avx(auVar236);
          auVar210 = ZEXT1664(auVar186);
          auVar236 = vpunpckhwd_avx(auVar236,auVar236);
          auVar268._16_16_ = auVar236;
          auVar268._0_16_ = auVar186;
          auVar301 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          if ((((((((auVar268 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar268 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar268 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar268 >> 0x7f,0) != '\0') ||
                (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar236 >> 0x3f,0) != '\0') ||
              (auVar268 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar236[0xf] < '\0') {
            auVar64._4_4_ = auVar166._4_4_ * fVar245;
            auVar64._0_4_ = auVar166._0_4_ * fVar218;
            auVar64._8_4_ = auVar166._8_4_ * fVar249;
            auVar64._12_4_ = auVar166._12_4_ * fVar254;
            auVar64._16_4_ = auVar166._16_4_ * fVar260;
            auVar64._20_4_ = auVar166._20_4_ * fVar355;
            auVar64._24_4_ = auVar166._24_4_ * fVar176;
            auVar64._28_4_ = SUB84(uStack_5e8,4);
            auVar65._4_4_ = auVar238._4_4_ * fVar245;
            auVar65._0_4_ = auVar238._0_4_ * fVar218;
            auVar65._8_4_ = auVar238._8_4_ * fVar249;
            auVar65._12_4_ = auVar238._12_4_ * fVar254;
            auVar65._16_4_ = auVar238._16_4_ * fVar260;
            auVar65._20_4_ = auVar238._20_4_ * fVar355;
            auVar65._24_4_ = auVar238._24_4_ * fVar176;
            auVar65._28_4_ = auVar34._28_4_ + auVar312._28_4_;
            auVar239._8_4_ = 0x3f800000;
            auVar239._0_8_ = 0x3f8000003f800000;
            auVar239._12_4_ = 0x3f800000;
            auVar239._16_4_ = 0x3f800000;
            auVar239._20_4_ = 0x3f800000;
            auVar239._24_4_ = 0x3f800000;
            auVar239._28_4_ = 0x3f800000;
            auVar142 = vsubps_avx(auVar239,auVar64);
            auVar210 = ZEXT3264(auVar142);
            auVar142 = vblendvps_avx(auVar142,auVar64,auVar35);
            auVar368 = ZEXT3264(auVar142);
            auVar142 = vsubps_avx(auVar239,auVar65);
            _local_3c0 = vblendvps_avx(auVar142,auVar65,auVar35);
            auVar301 = ZEXT3264(auVar268);
            local_520 = auVar63;
          }
        }
        auVar326 = ZEXT3264(_local_6c0);
        local_5c0 = auVar368._0_32_;
        auVar142 = auVar301._0_32_;
        auVar312 = local_5c0;
        if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar142 >> 0x7f,0) != '\0') ||
              (auVar301 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar142 >> 0xbf,0) != '\0') ||
            (auVar301 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar301[0x1f] < '\0') {
          auVar38 = vsubps_avx(auVar323,_local_8e0);
          local_8e0._0_4_ = (float)local_8e0._0_4_ + auVar368._0_4_ * auVar38._0_4_;
          local_8e0._4_4_ = (float)local_8e0._4_4_ + auVar368._4_4_ * auVar38._4_4_;
          fStack_8d8 = fStack_8d8 + auVar368._8_4_ * auVar38._8_4_;
          fStack_8d4 = fStack_8d4 + auVar368._12_4_ * auVar38._12_4_;
          auStack_8d0._0_4_ = (float)auStack_8d0._0_4_ + auVar368._16_4_ * auVar38._16_4_;
          auStack_8d0._4_4_ = (float)auStack_8d0._4_4_ + auVar368._20_4_ * auVar38._20_4_;
          fStack_8c8 = fStack_8c8 + auVar368._24_4_ * auVar38._24_4_;
          fStack_8c4 = fStack_8c4 + auVar38._28_4_;
          fVar218 = *(float *)((long)local_888->ray_space + k * 4 + -0x10);
          auVar66._4_4_ = ((float)local_8e0._4_4_ + (float)local_8e0._4_4_) * fVar218;
          auVar66._0_4_ = ((float)local_8e0._0_4_ + (float)local_8e0._0_4_) * fVar218;
          auVar66._8_4_ = (fStack_8d8 + fStack_8d8) * fVar218;
          auVar66._12_4_ = (fStack_8d4 + fStack_8d4) * fVar218;
          auVar66._16_4_ = ((float)auStack_8d0._0_4_ + (float)auStack_8d0._0_4_) * fVar218;
          auVar66._20_4_ = ((float)auStack_8d0._4_4_ + (float)auStack_8d0._4_4_) * fVar218;
          auVar66._24_4_ = (fStack_8c8 + fStack_8c8) * fVar218;
          auVar66._28_4_ = fStack_8c4 + fStack_8c4;
          auVar38 = vcmpps_avx(local_520,auVar66,6);
          auVar204 = auVar142 & auVar38;
          if ((((((((auVar204 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar204 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar204 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar204 >> 0x7f,0) != '\0') ||
                (auVar204 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar204 >> 0xbf,0) != '\0') ||
              (auVar204 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar204[0x1f] < '\0') {
            auVar210 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_3c0._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
            local_3c0._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
            uStack_3b8._0_4_ = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
            uStack_3b8._4_4_ = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
            uStack_3b0._0_4_ = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
            uStack_3b0._4_4_ = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
            uStack_3a8._0_4_ = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
            uStack_3a8._4_4_ = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
            local_2c0 = local_5c0;
            auVar123 = _local_3c0;
            auVar204 = _local_3c0;
            local_2a0 = (float)local_3c0._0_4_;
            fStack_29c = (float)local_3c0._4_4_;
            fStack_298 = (float)uStack_3b8;
            fStack_294 = uStack_3b8._4_4_;
            fStack_290 = (float)uStack_3b0;
            fStack_28c = uStack_3b0._4_4_;
            fStack_288 = (float)uStack_3a8;
            fStack_284 = uStack_3a8._4_4_;
            local_280 = local_520;
            local_260 = 0;
            local_25c = uVar14;
            local_250 = auVar296._0_8_;
            uStack_248 = uStack_8a8;
            local_240 = auVar281._0_8_;
            uStack_238 = uStack_8b8;
            local_230 = local_810;
            uStack_228 = uStack_808;
            uStack_7f8 = auVar358._8_8_;
            local_220 = auVar358._0_8_;
            uStack_218 = uStack_7f8;
            _local_3c0 = auVar204;
            if ((pGVar131->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_640 = vandps_avx(auVar38,auVar142);
              auVar183._0_4_ = 1.0 / (float)(int)uVar14;
              auVar183._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar236 = vshufps_avx(auVar183,auVar183,0);
              local_1e0[0] = auVar236._0_4_ * (auVar368._0_4_ + 0.0);
              local_1e0[1] = auVar236._4_4_ * (auVar368._4_4_ + 1.0);
              local_1e0[2] = auVar236._8_4_ * (auVar368._8_4_ + 2.0);
              local_1e0[3] = auVar236._12_4_ * (auVar368._12_4_ + 3.0);
              fStack_1d0 = auVar236._0_4_ * (auVar368._16_4_ + 4.0);
              fStack_1cc = auVar236._4_4_ * (auVar368._20_4_ + 5.0);
              fStack_1c8 = auVar236._8_4_ * (auVar368._24_4_ + 6.0);
              fStack_1c4 = auVar368._28_4_ + 7.0;
              uStack_3b0 = auVar123._16_8_;
              uStack_3a8 = auVar204._24_8_;
              local_1c0 = local_3c0;
              uStack_1b8 = uStack_3b8;
              uStack_1b0 = uStack_3b0;
              uStack_1a8 = uStack_3a8;
              local_1a0 = local_520;
              auVar167._8_4_ = 0x7f800000;
              auVar167._0_8_ = 0x7f8000007f800000;
              auVar167._12_4_ = 0x7f800000;
              auVar167._16_4_ = 0x7f800000;
              auVar167._20_4_ = 0x7f800000;
              auVar167._24_4_ = 0x7f800000;
              auVar167._28_4_ = 0x7f800000;
              auVar142 = vblendvps_avx(auVar167,local_520,local_640);
              auVar38 = vshufps_avx(auVar142,auVar142,0xb1);
              auVar38 = vminps_avx(auVar142,auVar38);
              auVar204 = vshufpd_avx(auVar38,auVar38,5);
              auVar38 = vminps_avx(auVar38,auVar204);
              auVar204 = vperm2f128_avx(auVar38,auVar38,1);
              auVar38 = vminps_avx(auVar38,auVar204);
              auVar38 = vcmpps_avx(auVar142,auVar38,0);
              auVar204 = local_640 & auVar38;
              auVar142 = local_640;
              if ((((((((auVar204 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar204 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar204 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar204 >> 0x7f,0) != '\0') ||
                    (auVar204 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar204 >> 0xbf,0) != '\0') ||
                  (auVar204 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar204[0x1f] < '\0') {
                auVar142 = vandps_avx(auVar38,local_640);
              }
              uVar125 = vmovmskps_avx(auVar142);
              uVar20 = 0;
              if (uVar125 != 0) {
                for (; (uVar125 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar126 = (ulong)uVar20;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar131->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar218 = local_1e0[uVar126];
                uVar11 = *(undefined4 *)((long)&local_1c0 + uVar126 * 4);
                fVar241 = 1.0 - fVar218;
                fVar229 = fVar218 * fVar241 + fVar218 * fVar241;
                auVar236 = ZEXT416((uint)(fVar218 * fVar218 * 3.0));
                auVar236 = vshufps_avx(auVar236,auVar236,0);
                auVar186 = ZEXT416((uint)((fVar229 - fVar218 * fVar218) * 3.0));
                auVar186 = vshufps_avx(auVar186,auVar186,0);
                auVar203 = ZEXT416((uint)((fVar241 * fVar241 - fVar229) * 3.0));
                auVar203 = vshufps_avx(auVar203,auVar203,0);
                auVar188 = ZEXT416((uint)(fVar241 * fVar241 * -3.0));
                auVar188 = vshufps_avx(auVar188,auVar188,0);
                auVar184._0_4_ =
                     auVar188._0_4_ * fVar292 +
                     auVar203._0_4_ * fVar274 +
                     auVar236._0_4_ * fVar356 + auVar186._0_4_ * (float)local_810._0_4_;
                auVar184._4_4_ =
                     auVar188._4_4_ * fVar302 +
                     auVar203._4_4_ * fVar285 +
                     auVar236._4_4_ * fVar360 + auVar186._4_4_ * (float)local_810._4_4_;
                auVar184._8_4_ =
                     auVar188._8_4_ * auVar296._8_4_ +
                     auVar203._8_4_ * auVar281._8_4_ +
                     auVar236._8_4_ * auVar358._8_4_ + auVar186._8_4_ * (float)uStack_808;
                auVar184._12_4_ =
                     auVar188._12_4_ * auVar296._12_4_ +
                     auVar203._12_4_ * auVar281._12_4_ +
                     auVar236._12_4_ * auVar358._12_4_ + auVar186._12_4_ * uStack_808._4_4_;
                auVar210 = ZEXT464(*(uint *)(local_1a0 + uVar126 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1a0 + uVar126 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar184._0_4_;
                uVar15 = vextractps_avx(auVar184,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar15;
                uVar15 = vextractps_avx(auVar184,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar15;
                *(float *)(ray + k * 4 + 0xf0) = fVar218;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar11;
                *(uint *)(ray + k * 4 + 0x110) = uVar13;
                *(uint *)(ray + k * 4 + 0x120) = uVar127;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_6e0._0_16_ = vshufps_avx(ZEXT416(uVar127),ZEXT416(uVar127),0);
                local_6e0._16_16_ = auVar323._16_16_;
                _local_720 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
                _auStack_710 = auVar209._16_16_;
                local_660._16_16_ = auVar30._16_16_;
                local_660._0_16_ = *local_788;
                auStack_850 = auVar149._16_16_;
                local_860 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                _local_540 = auVar310;
                while( true ) {
                  local_460 = local_1e0[uVar126];
                  local_450 = *(undefined4 *)((long)&local_1c0 + uVar126 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar126 * 4);
                  fVar229 = 1.0 - local_460;
                  fVar218 = local_460 * fVar229 + local_460 * fVar229;
                  auVar236 = ZEXT416((uint)(local_460 * local_460 * 3.0));
                  auVar236 = vshufps_avx(auVar236,auVar236,0);
                  auVar186 = ZEXT416((uint)((fVar218 - local_460 * local_460) * 3.0));
                  auVar186 = vshufps_avx(auVar186,auVar186,0);
                  auVar203 = ZEXT416((uint)((fVar229 * fVar229 - fVar218) * 3.0));
                  auVar203 = vshufps_avx(auVar203,auVar203,0);
                  local_7f0.context = context->user;
                  auVar188 = ZEXT416((uint)(fVar229 * fVar229 * -3.0));
                  auVar188 = vshufps_avx(auVar188,auVar188,0);
                  auVar190._0_4_ =
                       auVar188._0_4_ * fVar292 +
                       auVar203._0_4_ * fVar274 +
                       auVar236._0_4_ * (float)local_800._0_4_ +
                       auVar186._0_4_ * (float)local_810._0_4_;
                  auVar190._4_4_ =
                       auVar188._4_4_ * fVar302 +
                       auVar203._4_4_ * fVar285 +
                       auVar236._4_4_ * (float)local_800._4_4_ +
                       auVar186._4_4_ * (float)local_810._4_4_;
                  auVar190._8_4_ =
                       auVar188._8_4_ * auVar296._8_4_ +
                       auVar203._8_4_ * auVar281._8_4_ +
                       auVar236._8_4_ * (float)uStack_7f8 + auVar186._8_4_ * (float)uStack_808;
                  auVar190._12_4_ =
                       auVar188._12_4_ * auVar296._12_4_ +
                       auVar203._12_4_ * auVar281._12_4_ +
                       auVar236._12_4_ * uStack_7f8._4_4_ + auVar186._12_4_ * uStack_808._4_4_;
                  auVar236 = vshufps_avx(auVar190,auVar190,0);
                  local_490[0] = (RTCHitN)auVar236[0];
                  local_490[1] = (RTCHitN)auVar236[1];
                  local_490[2] = (RTCHitN)auVar236[2];
                  local_490[3] = (RTCHitN)auVar236[3];
                  local_490[4] = (RTCHitN)auVar236[4];
                  local_490[5] = (RTCHitN)auVar236[5];
                  local_490[6] = (RTCHitN)auVar236[6];
                  local_490[7] = (RTCHitN)auVar236[7];
                  local_490[8] = (RTCHitN)auVar236[8];
                  local_490[9] = (RTCHitN)auVar236[9];
                  local_490[10] = (RTCHitN)auVar236[10];
                  local_490[0xb] = (RTCHitN)auVar236[0xb];
                  local_490[0xc] = (RTCHitN)auVar236[0xc];
                  local_490[0xd] = (RTCHitN)auVar236[0xd];
                  local_490[0xe] = (RTCHitN)auVar236[0xe];
                  local_490[0xf] = (RTCHitN)auVar236[0xf];
                  auVar236 = vshufps_avx(auVar190,auVar190,0x55);
                  local_480 = auVar236;
                  local_470 = vshufps_avx(auVar190,auVar190,0xaa);
                  fStack_45c = local_460;
                  fStack_458 = local_460;
                  fStack_454 = local_460;
                  uStack_44c = local_450;
                  uStack_448 = local_450;
                  uStack_444 = local_450;
                  local_440 = local_720;
                  uStack_438 = uStack_718;
                  local_430 = local_6e0._0_8_;
                  uStack_428 = local_6e0._8_8_;
                  vcmpps_avx(auVar150._0_32_,auVar150._0_32_,0xf);
                  uStack_41c = (local_7f0.context)->instID[0];
                  local_420 = uStack_41c;
                  uStack_418 = uStack_41c;
                  uStack_414 = uStack_41c;
                  uStack_410 = (local_7f0.context)->instPrimID[0];
                  uStack_40c = uStack_410;
                  uStack_408 = uStack_410;
                  uStack_404 = uStack_410;
                  local_8a0 = local_660._0_16_;
                  local_7f0.valid = (int *)local_8a0;
                  local_7f0.geometryUserPtr = pGVar131->userPtr;
                  local_7f0.hit = local_490;
                  local_7f0.N = 4;
                  local_7f0.ray = (RTCRayN *)ray;
                  if (pGVar131->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar131->intersectionFilterN)(&local_7f0);
                    auVar326 = ZEXT3264(_local_6c0);
                    auVar368 = ZEXT3264(local_5c0);
                    auVar150 = ZEXT1664(ZEXT816(0) << 0x40);
                    prim = local_890;
                    fVar291 = (float)local_700._0_4_;
                    fVar308 = (float)local_700._4_4_;
                    fVar316 = fStack_6f8;
                    fVar318 = fStack_6f4;
                    fVar332 = fStack_6f0;
                    fVar196 = fStack_6ec;
                    fVar336 = fStack_6e8;
                    fVar179 = (float)local_7c0._0_4_;
                    fVar193 = (float)local_7c0._4_4_;
                    fVar194 = fStack_7b8;
                    fVar195 = fStack_7b4;
                    fVar222 = fStack_7b0;
                    fVar197 = fStack_7ac;
                    fVar211 = fStack_7a8;
                    fVar214 = fStack_7a4;
                  }
                  if (local_8a0 == (undefined1  [16])0x0) {
                    auVar236 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar236 = auVar236 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var19 = context->args->filter;
                    if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar131->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var19)(&local_7f0);
                      auVar326 = ZEXT3264(_local_6c0);
                      auVar368 = ZEXT3264(local_5c0);
                      auVar150 = ZEXT1664(ZEXT816(0) << 0x40);
                      prim = local_890;
                      fVar291 = (float)local_700._0_4_;
                      fVar308 = (float)local_700._4_4_;
                      fVar316 = fStack_6f8;
                      fVar318 = fStack_6f4;
                      fVar332 = fStack_6f0;
                      fVar196 = fStack_6ec;
                      fVar336 = fStack_6e8;
                      fVar179 = (float)local_7c0._0_4_;
                      fVar193 = (float)local_7c0._4_4_;
                      fVar194 = fStack_7b8;
                      fVar195 = fStack_7b4;
                      fVar222 = fStack_7b0;
                      fVar197 = fStack_7ac;
                      fVar211 = fStack_7a8;
                      fVar214 = fStack_7a4;
                    }
                    auVar186 = vpcmpeqd_avx(local_8a0,_DAT_01f7aa10);
                    auVar203 = vpcmpeqd_avx(auVar236,auVar236);
                    auVar236 = auVar186 ^ auVar203;
                    if (local_8a0 != (undefined1  [16])0x0) {
                      auVar186 = auVar186 ^ auVar203;
                      auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])local_7f0.hit);
                      *(undefined1 (*) [16])(local_7f0.ray + 0xc0) = auVar203;
                      auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x10));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xd0) = auVar203;
                      auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x20));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xe0) = auVar203;
                      auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x30));
                      *(undefined1 (*) [16])(local_7f0.ray + 0xf0) = auVar203;
                      auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x40));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x100) = auVar203;
                      auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x50));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x110) = auVar203;
                      auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x60));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x120) = auVar203;
                      auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x70));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x130) = auVar203;
                      auVar186 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                          (local_7f0.hit + 0x80));
                      *(undefined1 (*) [16])(local_7f0.ray + 0x140) = auVar186;
                    }
                  }
                  auVar149 = local_520;
                  auVar164._8_8_ = 0x100000001;
                  auVar164._0_8_ = 0x100000001;
                  if ((auVar164 & auVar236) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = local_860._0_4_;
                    auVar236 = local_860;
                  }
                  else {
                    auVar236 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  }
                  auVar210 = ZEXT3264(local_520);
                  *(undefined4 *)(local_640 + uVar126 * 4) = 0;
                  local_860 = auVar236;
                  auVar236 = vshufps_avx(auVar236,auVar236,0);
                  auVar148._16_16_ = auVar236;
                  auVar148._0_16_ = auVar236;
                  auVar30 = vcmpps_avx(auVar149,auVar148,2);
                  auVar209 = vandps_avx(auVar30,local_640);
                  local_640 = local_640 & auVar30;
                  auVar312 = auVar368._0_32_;
                  if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_640 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_640 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_640 >> 0x7f,0) == '\0') &&
                        (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_640 >> 0xbf,0) == '\0') &&
                      (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_640[0x1f]) break;
                  auVar172._8_4_ = 0x7f800000;
                  auVar172._0_8_ = 0x7f8000007f800000;
                  auVar172._12_4_ = 0x7f800000;
                  auVar172._16_4_ = 0x7f800000;
                  auVar172._20_4_ = 0x7f800000;
                  auVar172._24_4_ = 0x7f800000;
                  auVar172._28_4_ = 0x7f800000;
                  auVar149 = vblendvps_avx(auVar172,auVar149,auVar209);
                  auVar30 = vshufps_avx(auVar149,auVar149,0xb1);
                  auVar30 = vminps_avx(auVar149,auVar30);
                  auVar142 = vshufpd_avx(auVar30,auVar30,5);
                  auVar30 = vminps_avx(auVar30,auVar142);
                  auVar142 = vperm2f128_avx(auVar30,auVar30,1);
                  auVar30 = vminps_avx(auVar30,auVar142);
                  auVar30 = vcmpps_avx(auVar149,auVar30,0);
                  auVar142 = auVar209 & auVar30;
                  auVar149 = auVar209;
                  if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar142 >> 0x7f,0) != '\0') ||
                        (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar142 >> 0xbf,0) != '\0') ||
                      (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar142[0x1f] < '\0') {
                    auVar149 = vandps_avx(auVar30,auVar209);
                  }
                  uVar125 = vmovmskps_avx(auVar149);
                  uVar20 = 0;
                  if (uVar125 != 0) {
                    for (; (uVar125 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar126 = (ulong)uVar20;
                  local_640 = auVar209;
                }
              }
            }
          }
        }
      }
      local_5c0 = auVar312;
      if (8 < (int)uVar14) {
        auVar236 = vpshufd_avx(ZEXT416(uVar14),0);
        local_380._0_16_ = auVar236;
        auVar236 = vshufps_avx(local_760._0_16_,local_760._0_16_,0);
        local_e0._16_16_ = auVar236;
        local_e0._0_16_ = auVar236;
        auVar112._4_4_ = uStack_87c;
        auVar112._0_4_ = local_880;
        auVar112._8_4_ = fStack_878;
        auVar112._12_4_ = fStack_874;
        auVar236 = vpermilps_avx(auVar112,0);
        local_100._16_16_ = auVar236;
        local_100._0_16_ = auVar236;
        auVar137._0_4_ = 1.0 / (float)local_500._0_4_;
        auVar137._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar236 = vshufps_avx(auVar137,auVar137,0);
        register0x00001210 = auVar236;
        _local_120 = auVar236;
        local_2e0 = vshufps_avx(ZEXT416(uVar127),ZEXT416(uVar127),0);
        local_2f0 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
        auVar150 = ZEXT1664(local_2f0);
        lVar130 = 8;
        auVar368 = ZEXT3264(local_5e0);
        fVar218 = (float)local_6a0._0_4_;
        fVar229 = (float)local_6a0._4_4_;
        fVar241 = fStack_698;
        fVar245 = fStack_694;
        fVar249 = fStack_690;
        fVar254 = fStack_68c;
        fVar258 = fStack_688;
        fVar259 = fStack_684;
        do {
          pauVar9 = (undefined1 (*) [28])(bezier_basis0 + lVar130 * 4 + lVar21);
          fVar260 = *(float *)*pauVar9;
          fVar355 = *(float *)(*pauVar9 + 4);
          fVar176 = *(float *)(*pauVar9 + 8);
          fVar217 = *(float *)(*pauVar9 + 0xc);
          fVar328 = *(float *)(*pauVar9 + 0x10);
          fVar303 = *(float *)(*pauVar9 + 0x14);
          fVar304 = *(float *)(*pauVar9 + 0x18);
          auVar121 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar21 + 0x21aa768 + lVar130 * 4);
          fVar221 = *(float *)*pauVar9;
          fVar329 = *(float *)(*pauVar9 + 4);
          fVar305 = *(float *)(*pauVar9 + 8);
          fVar306 = *(float *)(*pauVar9 + 0xc);
          fVar224 = *(float *)(*pauVar9 + 0x10);
          fVar330 = *(float *)(*pauVar9 + 0x14);
          fVar321 = *(float *)(*pauVar9 + 0x18);
          auVar120 = *pauVar9;
          pauVar10 = (undefined1 (*) [32])(lVar21 + 0x21aabec + lVar130 * 4);
          fVar327 = *(float *)*pauVar10;
          fVar226 = *(float *)(*pauVar10 + 4);
          fVar156 = *(float *)(*pauVar10 + 8);
          fVar178 = *(float *)(*pauVar10 + 0xc);
          fVar273 = *(float *)(*pauVar10 + 0x10);
          fVar228 = *(float *)(*pauVar10 + 0x14);
          fVar177 = *(float *)(*pauVar10 + 0x18);
          auVar119 = *(undefined1 (*) [28])*pauVar10;
          pfVar1 = (float *)(lVar21 + 0x21ab070 + lVar130 * 4);
          local_560 = *pfVar1;
          fStack_55c = pfVar1[1];
          fStack_558 = pfVar1[2];
          fStack_554 = pfVar1[3];
          fStack_550 = pfVar1[4];
          fStack_54c = pfVar1[5];
          fStack_548 = pfVar1[6];
          fStack_544 = pfVar1[7];
          fVar253 = auVar210._28_4_;
          fVar132 = auVar326._28_4_;
          fStack_864 = fVar253 + fVar253 + auVar150._28_4_;
          fVar152 = auVar368._0_4_;
          fVar153 = auVar368._4_4_;
          fVar154 = auVar368._8_4_;
          fVar155 = auVar368._12_4_;
          fVar199 = auVar368._16_4_;
          fVar213 = auVar368._20_4_;
          fVar216 = auVar368._24_4_;
          local_760._0_4_ =
               (float)local_360._0_4_ * fVar260 +
               fVar291 * fVar221 +
               fVar327 * (float)local_6c0._0_4_ + (float)local_4e0._0_4_ * local_560;
          local_760._4_4_ =
               (float)local_360._4_4_ * fVar355 +
               fVar308 * fVar329 +
               fVar226 * (float)local_6c0._4_4_ + (float)local_4e0._4_4_ * fStack_55c;
          local_760._8_4_ =
               fStack_358 * fVar176 +
               fVar316 * fVar305 + fVar156 * fStack_6b8 + fStack_4d8 * fStack_558;
          local_760._12_4_ =
               fStack_354 * fVar217 +
               fVar318 * fVar306 + fVar178 * fStack_6b4 + fStack_4d4 * fStack_554;
          local_760._16_4_ =
               fStack_350 * fVar328 +
               fVar332 * fVar224 + fVar273 * fStack_6b0 + fStack_4d0 * fStack_550;
          local_760._20_4_ =
               fStack_34c * fVar303 +
               fVar196 * fVar330 + fVar228 * fStack_6ac + fStack_4cc * fStack_54c;
          local_760._24_4_ =
               fStack_348 * fVar304 +
               fVar336 * fVar321 + fVar177 * fStack_6a8 + fStack_4c8 * fStack_548;
          local_760._28_4_ = fVar253 + fStack_544 + fStack_864;
          auVar326 = ZEXT3264(local_760);
          auVar192._0_4_ =
               fVar218 * local_560 + fVar179 * fVar327 + fVar152 * fVar221 +
               (float)local_4c0._0_4_ * fVar260;
          auVar192._4_4_ =
               fVar229 * fStack_55c + fVar193 * fVar226 + fVar153 * fVar329 +
               (float)local_4c0._4_4_ * fVar355;
          auVar192._8_4_ =
               fVar241 * fStack_558 + fVar194 * fVar156 + fVar154 * fVar305 + fStack_4b8 * fVar176;
          auVar192._12_4_ =
               fVar245 * fStack_554 + fVar195 * fVar178 + fVar155 * fVar306 + fStack_4b4 * fVar217;
          auVar192._16_4_ =
               fVar249 * fStack_550 + fVar222 * fVar273 + fVar199 * fVar224 + fStack_4b0 * fVar328;
          auVar192._20_4_ =
               fVar254 * fStack_54c + fVar197 * fVar228 + fVar213 * fVar330 + fStack_4ac * fVar303;
          auVar192._24_4_ =
               fVar258 * fStack_548 + fVar211 * fVar177 + fVar216 * fVar321 + fStack_4a8 * fVar304;
          auVar192._28_4_ = fVar132 + fVar253 + fVar253 + fStack_864;
          fVar132 = fVar260 * (float)local_160._0_4_ +
                    (float)local_80._0_4_ * fVar221 +
                    fVar327 * (float)local_320._0_4_ + local_560 * (float)local_140._0_4_;
          fVar151 = fVar355 * (float)local_160._4_4_ +
                    (float)local_80._4_4_ * fVar329 +
                    fVar226 * (float)local_320._4_4_ + fStack_55c * (float)local_140._4_4_;
          fStack_878 = fVar176 * fStack_158 +
                       fStack_78 * fVar305 + fVar156 * fStack_318 + fStack_558 * fStack_138;
          fStack_874 = fVar217 * fStack_154 +
                       fStack_74 * fVar306 + fVar178 * fStack_314 + fStack_554 * fStack_134;
          fStack_870 = fVar328 * fStack_150 +
                       fStack_70 * fVar224 + fVar273 * fStack_310 + fStack_550 * fStack_130;
          fStack_86c = fVar303 * fStack_14c +
                       fStack_6c * fVar330 + fVar228 * fStack_30c + fStack_54c * fStack_12c;
          fStack_868 = fVar304 * fStack_148 +
                       fStack_68 * fVar321 + fVar177 * fStack_308 + fStack_548 * fStack_128;
          fStack_864 = fStack_864 + fVar253 + fVar253 + fStack_544;
          pfVar1 = (float *)(bezier_basis1 + lVar130 * 4 + lVar21);
          fVar260 = *pfVar1;
          fVar355 = pfVar1[1];
          fVar176 = pfVar1[2];
          fVar217 = pfVar1[3];
          fVar328 = pfVar1[4];
          fVar303 = pfVar1[5];
          fVar304 = pfVar1[6];
          pauVar9 = (undefined1 (*) [28])(lVar21 + 0x21acb88 + lVar130 * 4);
          fVar221 = *(float *)*pauVar9;
          fVar329 = *(float *)(*pauVar9 + 4);
          fVar305 = *(float *)(*pauVar9 + 8);
          fVar306 = *(float *)(*pauVar9 + 0xc);
          fVar224 = *(float *)(*pauVar9 + 0x10);
          fVar330 = *(float *)(*pauVar9 + 0x14);
          fVar321 = *(float *)(*pauVar9 + 0x18);
          auVar122 = *pauVar9;
          pfVar1 = (float *)(lVar21 + 0x21ad00c + lVar130 * 4);
          fVar327 = *pfVar1;
          fVar226 = pfVar1[1];
          fVar156 = pfVar1[2];
          fVar178 = pfVar1[3];
          fVar273 = pfVar1[4];
          fVar228 = pfVar1[5];
          fVar177 = pfVar1[6];
          pfVar1 = (float *)(lVar21 + 0x21ad490 + lVar130 * 4);
          local_580 = *pfVar1;
          fStack_57c = pfVar1[1];
          fStack_578 = pfVar1[2];
          fStack_574 = pfVar1[3];
          fStack_570 = pfVar1[4];
          fStack_56c = pfVar1[5];
          fStack_568 = pfVar1[6];
          fStack_564 = pfVar1[7];
          fVar253 = fStack_564 + fStack_564 + fVar253;
          auVar269._0_4_ =
               (float)local_360._0_4_ * fVar260 +
               fVar291 * fVar221 +
               (float)local_6c0._0_4_ * fVar327 + (float)local_4e0._0_4_ * local_580;
          auVar269._4_4_ =
               (float)local_360._4_4_ * fVar355 +
               fVar308 * fVar329 +
               (float)local_6c0._4_4_ * fVar226 + (float)local_4e0._4_4_ * fStack_57c;
          auVar269._8_4_ =
               fStack_358 * fVar176 +
               fVar316 * fVar305 + fStack_6b8 * fVar156 + fStack_4d8 * fStack_578;
          auVar269._12_4_ =
               fStack_354 * fVar217 +
               fVar318 * fVar306 + fStack_6b4 * fVar178 + fStack_4d4 * fStack_574;
          auVar269._16_4_ =
               fStack_350 * fVar328 +
               fVar332 * fVar224 + fStack_6b0 * fVar273 + fStack_4d0 * fStack_570;
          auVar269._20_4_ =
               fStack_34c * fVar303 +
               fVar196 * fVar330 + fStack_6ac * fVar228 + fStack_4cc * fStack_56c;
          auVar269._24_4_ =
               fStack_348 * fVar304 +
               fVar336 * fVar321 + fStack_6a8 * fVar177 + fStack_4c8 * fStack_568;
          auVar269._28_4_ = *(float *)pauVar9[1] + fVar253;
          local_6e0._0_4_ =
               (float)local_4c0._0_4_ * fVar260 +
               fVar152 * fVar221 + fVar179 * fVar327 + fVar218 * local_580;
          local_6e0._4_4_ =
               (float)local_4c0._4_4_ * fVar355 +
               fVar153 * fVar329 + fVar193 * fVar226 + fVar229 * fStack_57c;
          local_6e0._8_4_ =
               fStack_4b8 * fVar176 + fVar154 * fVar305 + fVar194 * fVar156 + fVar241 * fStack_578;
          local_6e0._12_4_ =
               fStack_4b4 * fVar217 + fVar155 * fVar306 + fVar195 * fVar178 + fVar245 * fStack_574;
          local_6e0._16_4_ =
               fStack_4b0 * fVar328 + fVar199 * fVar224 + fVar222 * fVar273 + fVar249 * fStack_570;
          local_6e0._20_4_ =
               fStack_4ac * fVar303 + fVar213 * fVar330 + fVar197 * fVar228 + fVar254 * fStack_56c;
          local_6e0._24_4_ =
               fStack_4a8 * fVar304 + fVar216 * fVar321 + fVar211 * fVar177 + fVar258 * fStack_568;
          local_6e0._28_4_ = fVar253 + fStack_564 + fStack_564 + auVar368._28_4_;
          auVar284._0_4_ =
               fVar260 * (float)local_160._0_4_ +
               (float)local_80._0_4_ * fVar221 +
               local_580 * (float)local_140._0_4_ + fVar327 * (float)local_320._0_4_;
          auVar284._4_4_ =
               fVar355 * (float)local_160._4_4_ +
               (float)local_80._4_4_ * fVar329 +
               fStack_57c * (float)local_140._4_4_ + fVar226 * (float)local_320._4_4_;
          auVar284._8_4_ =
               fVar176 * fStack_158 +
               fStack_78 * fVar305 + fStack_578 * fStack_138 + fVar156 * fStack_318;
          auVar284._12_4_ =
               fVar217 * fStack_154 +
               fStack_74 * fVar306 + fStack_574 * fStack_134 + fVar178 * fStack_314;
          auVar284._16_4_ =
               fVar328 * fStack_150 +
               fStack_70 * fVar224 + fStack_570 * fStack_130 + fVar273 * fStack_310;
          auVar284._20_4_ =
               fVar303 * fStack_14c +
               fStack_6c * fVar330 + fStack_56c * fStack_12c + fVar228 * fStack_30c;
          auVar284._24_4_ =
               fVar304 * fStack_148 +
               fStack_68 * fVar321 + fStack_568 * fStack_128 + fVar177 * fStack_308;
          auVar284._28_4_ = fVar253 + fStack_564 + fVar259 + fStack_564;
          auVar209 = vsubps_avx(auVar269,local_760);
          _local_3a0 = vsubps_avx(local_6e0,auVar192);
          auVar150 = ZEXT3264(_local_3a0);
          fVar249 = auVar209._0_4_;
          fVar254 = auVar209._4_4_;
          auVar67._4_4_ = fVar254 * auVar192._4_4_;
          auVar67._0_4_ = fVar249 * auVar192._0_4_;
          fVar258 = auVar209._8_4_;
          auVar67._8_4_ = fVar258 * auVar192._8_4_;
          fVar259 = auVar209._12_4_;
          auVar67._12_4_ = fVar259 * auVar192._12_4_;
          fVar221 = auVar209._16_4_;
          auVar67._16_4_ = fVar221 * auVar192._16_4_;
          fVar329 = auVar209._20_4_;
          auVar67._20_4_ = fVar329 * auVar192._20_4_;
          fVar305 = auVar209._24_4_;
          auVar67._24_4_ = fVar305 * auVar192._24_4_;
          auVar67._28_4_ = fVar253;
          fVar332 = local_3a0._0_4_;
          fVar196 = local_3a0._4_4_;
          auVar68._4_4_ = local_760._4_4_ * fVar196;
          auVar68._0_4_ = local_760._0_4_ * fVar332;
          fVar336 = local_3a0._8_4_;
          auVar68._8_4_ = local_760._8_4_ * fVar336;
          fVar218 = local_3a0._12_4_;
          auVar68._12_4_ = local_760._12_4_ * fVar218;
          fVar229 = local_3a0._16_4_;
          auVar68._16_4_ = local_760._16_4_ * fVar229;
          fVar241 = local_3a0._20_4_;
          auVar68._20_4_ = local_760._20_4_ * fVar241;
          fVar245 = local_3a0._24_4_;
          auVar68._24_4_ = local_760._24_4_ * fVar245;
          auVar68._28_4_ = local_6e0._28_4_;
          auVar30 = vsubps_avx(auVar67,auVar68);
          auVar113._4_4_ = fVar151;
          auVar113._0_4_ = fVar132;
          auVar113._8_4_ = fStack_878;
          auVar113._12_4_ = fStack_874;
          auVar113._16_4_ = fStack_870;
          auVar113._20_4_ = fStack_86c;
          auVar113._24_4_ = fStack_868;
          auVar113._28_4_ = fStack_864;
          auVar149 = vmaxps_avx(auVar113,auVar284);
          auVar69._4_4_ = auVar149._4_4_ * auVar149._4_4_ * (fVar254 * fVar254 + fVar196 * fVar196);
          auVar69._0_4_ = auVar149._0_4_ * auVar149._0_4_ * (fVar249 * fVar249 + fVar332 * fVar332);
          auVar69._8_4_ = auVar149._8_4_ * auVar149._8_4_ * (fVar258 * fVar258 + fVar336 * fVar336);
          auVar69._12_4_ =
               auVar149._12_4_ * auVar149._12_4_ * (fVar259 * fVar259 + fVar218 * fVar218);
          auVar69._16_4_ =
               auVar149._16_4_ * auVar149._16_4_ * (fVar221 * fVar221 + fVar229 * fVar229);
          auVar69._20_4_ =
               auVar149._20_4_ * auVar149._20_4_ * (fVar329 * fVar329 + fVar241 * fVar241);
          auVar69._24_4_ =
               auVar149._24_4_ * auVar149._24_4_ * (fVar305 * fVar305 + fVar245 * fVar245);
          auVar69._28_4_ = auVar269._28_4_ + local_6e0._28_4_;
          auVar70._4_4_ = auVar30._4_4_ * auVar30._4_4_;
          auVar70._0_4_ = auVar30._0_4_ * auVar30._0_4_;
          auVar70._8_4_ = auVar30._8_4_ * auVar30._8_4_;
          auVar70._12_4_ = auVar30._12_4_ * auVar30._12_4_;
          auVar70._16_4_ = auVar30._16_4_ * auVar30._16_4_;
          auVar70._20_4_ = auVar30._20_4_ * auVar30._20_4_;
          auVar70._24_4_ = auVar30._24_4_ * auVar30._24_4_;
          auVar70._28_4_ = auVar30._28_4_;
          local_660 = vcmpps_avx(auVar70,auVar69,2);
          local_260 = (uint)lVar130;
          auVar186 = vpshufd_avx(ZEXT416(local_260),0);
          auVar236 = vpor_avx(auVar186,_DAT_01f7fcf0);
          auVar186 = vpor_avx(auVar186,_DAT_01fafea0);
          auVar236 = vpcmpgtd_avx(local_380._0_16_,auVar236);
          auVar186 = vpcmpgtd_avx(local_380._0_16_,auVar186);
          auVar207._16_16_ = auVar186;
          auVar207._0_16_ = auVar236;
          auVar210 = ZEXT3264(auVar207);
          auVar149 = auVar207 & local_660;
          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar149 >> 0x7f,0) == '\0') &&
                (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar149 >> 0xbf,0) == '\0') &&
              (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar149[0x1f]) {
            auVar368 = ZEXT3264(auVar368._0_32_);
            fVar218 = (float)local_6a0._0_4_;
            fVar229 = (float)local_6a0._4_4_;
            fVar241 = fStack_698;
            fVar245 = fStack_694;
            fVar249 = fStack_690;
            fVar254 = fStack_68c;
            fVar258 = fStack_688;
            fVar259 = fStack_684;
          }
          else {
            local_c0 = auVar209;
            local_780._0_4_ = auVar122._0_4_;
            local_780._4_4_ = auVar122._4_4_;
            fStack_778 = auVar122._8_4_;
            fStack_774 = auVar122._12_4_;
            fStack_770 = auVar122._16_4_;
            fStack_76c = auVar122._20_4_;
            fStack_768 = auVar122._24_4_;
            local_740 = fVar260 * (float)local_180._0_4_ +
                        (float)local_340._0_4_ * (float)local_780._0_4_ +
                        (float)local_a0._0_4_ * fVar327 + (float)local_840._0_4_ * local_580;
            fStack_73c = fVar355 * (float)local_180._4_4_ +
                         (float)local_340._4_4_ * (float)local_780._4_4_ +
                         (float)local_a0._4_4_ * fVar226 + (float)local_840._4_4_ * fStack_57c;
            fStack_738 = fVar176 * fStack_178 +
                         fStack_338 * fStack_778 + fStack_98 * fVar156 + fStack_838 * fStack_578;
            fStack_734 = fVar217 * fStack_174 +
                         fStack_334 * fStack_774 + fStack_94 * fVar178 + fStack_834 * fStack_574;
            fStack_730 = fVar328 * fStack_170 +
                         fStack_330 * fStack_770 + fStack_90 * fVar273 + fStack_830 * fStack_570;
            fStack_72c = fVar303 * fStack_16c +
                         fStack_32c * fStack_76c + fStack_8c * fVar228 + fStack_82c * fStack_56c;
            fStack_728 = fVar304 * fStack_168 +
                         fStack_328 * fStack_768 + fStack_88 * fVar177 + fStack_828 * fStack_568;
            fStack_724 = auVar209._28_4_ + fStack_164 + local_660._28_4_ + 0.0;
            local_680._0_4_ = auVar120._0_4_;
            local_680._4_4_ = auVar120._4_4_;
            fStack_678 = auVar120._8_4_;
            fStack_674 = auVar120._12_4_;
            fStack_670 = auVar120._16_4_;
            fStack_66c = auVar120._20_4_;
            fStack_668 = auVar120._24_4_;
            local_540._0_4_ = auVar119._0_4_;
            local_540._4_4_ = auVar119._4_4_;
            fStack_538 = auVar119._8_4_;
            fStack_534 = auVar119._12_4_;
            fStack_530 = auVar119._16_4_;
            fStack_52c = auVar119._20_4_;
            fStack_528 = auVar119._24_4_;
            pfVar1 = (float *)(lVar21 + 0x21abdfc + lVar130 * 4);
            fVar332 = *pfVar1;
            fVar196 = pfVar1[1];
            fVar336 = pfVar1[2];
            fVar218 = pfVar1[3];
            fVar229 = pfVar1[4];
            fVar241 = pfVar1[5];
            fVar245 = pfVar1[6];
            pfVar2 = (float *)(lVar21 + 0x21ac280 + lVar130 * 4);
            fVar249 = *pfVar2;
            fVar254 = pfVar2[1];
            fVar258 = pfVar2[2];
            fVar259 = pfVar2[3];
            fVar260 = pfVar2[4];
            fVar355 = pfVar2[5];
            fVar176 = pfVar2[6];
            pfVar3 = (float *)(lVar21 + 0x21ab978 + lVar130 * 4);
            fVar217 = *pfVar3;
            fVar328 = pfVar3[1];
            fVar303 = pfVar3[2];
            fVar304 = pfVar3[3];
            fVar221 = pfVar3[4];
            fVar329 = pfVar3[5];
            fVar305 = pfVar3[6];
            fVar156 = pfVar1[7] + pfVar2[7];
            fVar178 = pfVar2[7] + fVar214 + 0.0;
            fVar273 = fVar214 + fStack_4a4 + fVar214 + 0.0;
            pfVar1 = (float *)(lVar21 + 0x21ab4f4 + lVar130 * 4);
            fVar214 = *pfVar1;
            fVar306 = pfVar1[1];
            fVar224 = pfVar1[2];
            fVar330 = pfVar1[3];
            fVar321 = pfVar1[4];
            fVar327 = pfVar1[5];
            fVar226 = pfVar1[6];
            auVar143._0_4_ =
                 fVar214 * (float)local_360._0_4_ +
                 fVar217 * (float)local_700._0_4_ +
                 (float)local_6c0._0_4_ * fVar332 + (float)local_4e0._0_4_ * fVar249;
            auVar143._4_4_ =
                 fVar306 * (float)local_360._4_4_ +
                 fVar328 * (float)local_700._4_4_ +
                 (float)local_6c0._4_4_ * fVar196 + (float)local_4e0._4_4_ * fVar254;
            auVar143._8_4_ =
                 fVar224 * fStack_358 +
                 fVar303 * fStack_6f8 + fStack_6b8 * fVar336 + fStack_4d8 * fVar258;
            auVar143._12_4_ =
                 fVar330 * fStack_354 +
                 fVar304 * fStack_6f4 + fStack_6b4 * fVar218 + fStack_4d4 * fVar259;
            auVar143._16_4_ =
                 fVar321 * fStack_350 +
                 fVar221 * fStack_6f0 + fStack_6b0 * fVar229 + fStack_4d0 * fVar260;
            auVar143._20_4_ =
                 fVar327 * fStack_34c +
                 fVar329 * fStack_6ec + fStack_6ac * fVar241 + fStack_4cc * fVar355;
            auVar143._24_4_ =
                 fVar226 * fStack_348 +
                 fVar305 * fStack_6e8 + fStack_6a8 * fVar245 + fStack_4c8 * fVar176;
            auVar143._28_4_ = fVar156 + fVar178;
            auVar168._0_4_ =
                 (float)local_4c0._0_4_ * fVar214 +
                 fVar179 * fVar332 + (float)local_6a0._0_4_ * fVar249 + fVar152 * fVar217;
            auVar168._4_4_ =
                 (float)local_4c0._4_4_ * fVar306 +
                 fVar193 * fVar196 + (float)local_6a0._4_4_ * fVar254 + fVar153 * fVar328;
            auVar168._8_4_ =
                 fStack_4b8 * fVar224 + fVar194 * fVar336 + fStack_698 * fVar258 + fVar154 * fVar303
            ;
            auVar168._12_4_ =
                 fStack_4b4 * fVar330 + fVar195 * fVar218 + fStack_694 * fVar259 + fVar155 * fVar304
            ;
            auVar168._16_4_ =
                 fStack_4b0 * fVar321 + fVar222 * fVar229 + fStack_690 * fVar260 + fVar199 * fVar221
            ;
            auVar168._20_4_ =
                 fStack_4ac * fVar327 + fVar197 * fVar241 + fStack_68c * fVar355 + fVar213 * fVar329
            ;
            auVar168._24_4_ =
                 fStack_4a8 * fVar226 + fVar211 * fVar245 + fStack_688 * fVar176 + fVar216 * fVar305
            ;
            auVar168._28_4_ = fVar178 + fVar273;
            auVar347._0_4_ =
                 fVar217 * (float)local_340._0_4_ +
                 (float)local_a0._0_4_ * fVar332 + (float)local_840._0_4_ * fVar249 +
                 (float)local_180._0_4_ * fVar214;
            auVar347._4_4_ =
                 fVar328 * (float)local_340._4_4_ +
                 (float)local_a0._4_4_ * fVar196 + (float)local_840._4_4_ * fVar254 +
                 (float)local_180._4_4_ * fVar306;
            auVar347._8_4_ =
                 fVar303 * fStack_338 + fStack_98 * fVar336 + fStack_838 * fVar258 +
                 fStack_178 * fVar224;
            auVar347._12_4_ =
                 fVar304 * fStack_334 + fStack_94 * fVar218 + fStack_834 * fVar259 +
                 fStack_174 * fVar330;
            auVar347._16_4_ =
                 fVar221 * fStack_330 + fStack_90 * fVar229 + fStack_830 * fVar260 +
                 fStack_170 * fVar321;
            auVar347._20_4_ =
                 fVar329 * fStack_32c + fStack_8c * fVar241 + fStack_82c * fVar355 +
                 fStack_16c * fVar327;
            auVar347._24_4_ =
                 fVar305 * fStack_328 + fStack_88 * fVar245 + fStack_828 * fVar176 +
                 fStack_168 * fVar226;
            auVar347._28_4_ = pfVar3[7] + fVar156 + fVar273;
            pfVar1 = (float *)(lVar21 + 0x21ae21c + lVar130 * 4);
            fVar332 = *pfVar1;
            fVar196 = pfVar1[1];
            fVar336 = pfVar1[2];
            fVar214 = pfVar1[3];
            fVar218 = pfVar1[4];
            fVar229 = pfVar1[5];
            fVar241 = pfVar1[6];
            pfVar2 = (float *)(lVar21 + 0x21ae6a0 + lVar130 * 4);
            fVar245 = *pfVar2;
            fVar249 = pfVar2[1];
            fVar254 = pfVar2[2];
            fVar258 = pfVar2[3];
            fVar259 = pfVar2[4];
            fVar260 = pfVar2[5];
            fVar355 = pfVar2[6];
            pfVar3 = (float *)(lVar21 + 0x21add98 + lVar130 * 4);
            fVar176 = *pfVar3;
            fVar217 = pfVar3[1];
            fVar328 = pfVar3[2];
            fVar303 = pfVar3[3];
            fVar304 = pfVar3[4];
            fVar221 = pfVar3[5];
            fVar329 = pfVar3[6];
            pfVar4 = (float *)(lVar21 + 0x21ad914 + lVar130 * 4);
            fVar305 = *pfVar4;
            fVar306 = pfVar4[1];
            fVar224 = pfVar4[2];
            fVar330 = pfVar4[3];
            fVar321 = pfVar4[4];
            fVar327 = pfVar4[5];
            fVar226 = pfVar4[6];
            auVar313._0_4_ =
                 fVar305 * (float)local_360._0_4_ +
                 fVar176 * (float)local_700._0_4_ +
                 (float)local_6c0._0_4_ * fVar332 + (float)local_4e0._0_4_ * fVar245;
            auVar313._4_4_ =
                 fVar306 * (float)local_360._4_4_ +
                 fVar217 * (float)local_700._4_4_ +
                 (float)local_6c0._4_4_ * fVar196 + (float)local_4e0._4_4_ * fVar249;
            auVar313._8_4_ =
                 fVar224 * fStack_358 +
                 fVar328 * fStack_6f8 + fStack_6b8 * fVar336 + fStack_4d8 * fVar254;
            auVar313._12_4_ =
                 fVar330 * fStack_354 +
                 fVar303 * fStack_6f4 + fStack_6b4 * fVar214 + fStack_4d4 * fVar258;
            auVar313._16_4_ =
                 fVar321 * fStack_350 +
                 fVar304 * fStack_6f0 + fStack_6b0 * fVar218 + fStack_4d0 * fVar259;
            auVar313._20_4_ =
                 fVar327 * fStack_34c +
                 fVar221 * fStack_6ec + fStack_6ac * fVar229 + fStack_4cc * fVar260;
            auVar313._24_4_ =
                 fVar226 * fStack_348 +
                 fVar329 * fStack_6e8 + fStack_6a8 * fVar241 + fStack_4c8 * fVar355;
            auVar313._28_4_ = fStack_164 + fStack_164 + fStack_4c4 + fStack_164;
            auVar342._0_4_ =
                 fVar305 * (float)local_4c0._0_4_ +
                 fVar152 * fVar176 + fVar179 * fVar332 + (float)local_6a0._0_4_ * fVar245;
            auVar342._4_4_ =
                 fVar306 * (float)local_4c0._4_4_ +
                 fVar153 * fVar217 + fVar193 * fVar196 + (float)local_6a0._4_4_ * fVar249;
            auVar342._8_4_ =
                 fVar224 * fStack_4b8 + fVar154 * fVar328 + fVar194 * fVar336 + fStack_698 * fVar254
            ;
            auVar342._12_4_ =
                 fVar330 * fStack_4b4 + fVar155 * fVar303 + fVar195 * fVar214 + fStack_694 * fVar258
            ;
            auVar342._16_4_ =
                 fVar321 * fStack_4b0 + fVar199 * fVar304 + fVar222 * fVar218 + fStack_690 * fVar259
            ;
            auVar342._20_4_ =
                 fVar327 * fStack_4ac + fVar213 * fVar221 + fVar197 * fVar229 + fStack_68c * fVar260
            ;
            auVar342._24_4_ =
                 fVar226 * fStack_4a8 + fVar216 * fVar329 + fVar211 * fVar241 + fStack_688 * fVar355
            ;
            auVar342._28_4_ = fStack_164 + fStack_164 + fStack_684 + fStack_164;
            auVar257._8_4_ = 0x7fffffff;
            auVar257._0_8_ = 0x7fffffff7fffffff;
            auVar257._12_4_ = 0x7fffffff;
            auVar257._16_4_ = 0x7fffffff;
            auVar257._20_4_ = 0x7fffffff;
            auVar257._24_4_ = 0x7fffffff;
            auVar257._28_4_ = 0x7fffffff;
            auVar149 = vandps_avx(auVar143,auVar257);
            auVar30 = vandps_avx(auVar168,auVar257);
            auVar30 = vmaxps_avx(auVar149,auVar30);
            auVar149 = vandps_avx(auVar347,auVar257);
            auVar30 = vmaxps_avx(auVar30,auVar149);
            auVar30 = vcmpps_avx(auVar30,local_e0,1);
            auVar142 = vblendvps_avx(auVar143,auVar209,auVar30);
            auVar144._0_4_ =
                 fVar305 * (float)local_180._0_4_ +
                 fVar176 * (float)local_340._0_4_ +
                 fVar245 * (float)local_840._0_4_ + (float)local_a0._0_4_ * fVar332;
            auVar144._4_4_ =
                 fVar306 * (float)local_180._4_4_ +
                 fVar217 * (float)local_340._4_4_ +
                 fVar249 * (float)local_840._4_4_ + (float)local_a0._4_4_ * fVar196;
            auVar144._8_4_ =
                 fVar224 * fStack_178 +
                 fVar328 * fStack_338 + fVar254 * fStack_838 + fStack_98 * fVar336;
            auVar144._12_4_ =
                 fVar330 * fStack_174 +
                 fVar303 * fStack_334 + fVar258 * fStack_834 + fStack_94 * fVar214;
            auVar144._16_4_ =
                 fVar321 * fStack_170 +
                 fVar304 * fStack_330 + fVar259 * fStack_830 + fStack_90 * fVar218;
            auVar144._20_4_ =
                 fVar327 * fStack_16c +
                 fVar221 * fStack_32c + fVar260 * fStack_82c + fStack_8c * fVar229;
            auVar144._24_4_ =
                 fVar226 * fStack_168 +
                 fVar329 * fStack_328 + fVar355 * fStack_828 + fStack_88 * fVar241;
            auVar144._28_4_ = auVar149._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar38 = vblendvps_avx(auVar168,_local_3a0,auVar30);
            auVar149 = vandps_avx(auVar313,auVar257);
            auVar30 = vandps_avx(auVar342,auVar257);
            auVar312 = vmaxps_avx(auVar149,auVar30);
            auVar149 = vandps_avx(auVar144,auVar257);
            auVar149 = vmaxps_avx(auVar312,auVar149);
            local_720._0_4_ = auVar121._0_4_;
            local_720._4_4_ = auVar121._4_4_;
            uStack_718._0_4_ = auVar121._8_4_;
            uStack_718._4_4_ = auVar121._12_4_;
            auStack_710._0_4_ = auVar121._16_4_;
            auStack_710._4_4_ = auVar121._20_4_;
            fStack_708 = auVar121._24_4_;
            auVar30 = vcmpps_avx(auVar149,local_e0,1);
            auVar149 = vblendvps_avx(auVar313,auVar209,auVar30);
            auVar145._0_4_ =
                 (float)local_180._0_4_ * (float)local_720._0_4_ +
                 (float)local_340._0_4_ * (float)local_680._0_4_ +
                 (float)local_a0._0_4_ * (float)local_540._0_4_ + (float)local_840._0_4_ * local_560
            ;
            auVar145._4_4_ =
                 (float)local_180._4_4_ * (float)local_720._4_4_ +
                 (float)local_340._4_4_ * (float)local_680._4_4_ +
                 (float)local_a0._4_4_ * (float)local_540._4_4_ +
                 (float)local_840._4_4_ * fStack_55c;
            auVar145._8_4_ =
                 fStack_178 * (float)uStack_718 +
                 fStack_338 * fStack_678 + fStack_98 * fStack_538 + fStack_838 * fStack_558;
            auVar145._12_4_ =
                 fStack_174 * uStack_718._4_4_ +
                 fStack_334 * fStack_674 + fStack_94 * fStack_534 + fStack_834 * fStack_554;
            auVar145._16_4_ =
                 fStack_170 * (float)auStack_710._0_4_ +
                 fStack_330 * fStack_670 + fStack_90 * fStack_530 + fStack_830 * fStack_550;
            auVar145._20_4_ =
                 fStack_16c * (float)auStack_710._4_4_ +
                 fStack_32c * fStack_66c + fStack_8c * fStack_52c + fStack_82c * fStack_54c;
            auVar145._24_4_ =
                 fStack_168 * fStack_708 +
                 fStack_328 * fStack_668 + fStack_88 * fStack_528 + fStack_828 * fStack_548;
            auVar145._28_4_ = auVar312._28_4_ + fStack_724 + local_660._28_4_ + 0.0;
            auVar209 = vblendvps_avx(auVar342,_local_3a0,auVar30);
            fVar177 = auVar142._0_4_;
            fVar253 = auVar142._4_4_;
            fVar152 = auVar142._8_4_;
            fVar153 = auVar142._12_4_;
            fVar154 = auVar142._16_4_;
            fVar155 = auVar142._20_4_;
            fVar199 = auVar142._24_4_;
            fVar213 = auVar142._28_4_;
            fVar259 = auVar149._0_4_;
            fVar355 = auVar149._4_4_;
            fVar217 = auVar149._8_4_;
            fVar303 = auVar149._12_4_;
            fVar221 = auVar149._16_4_;
            fVar305 = auVar149._20_4_;
            fVar224 = auVar149._24_4_;
            fVar332 = auVar38._0_4_;
            fVar336 = auVar38._4_4_;
            fVar197 = auVar38._8_4_;
            fVar214 = auVar38._12_4_;
            fVar229 = auVar38._16_4_;
            fVar245 = auVar38._20_4_;
            fVar254 = auVar38._24_4_;
            auVar325._0_4_ = fVar332 * fVar332 + fVar177 * fVar177;
            auVar325._4_4_ = fVar336 * fVar336 + fVar253 * fVar253;
            auVar325._8_4_ = fVar197 * fVar197 + fVar152 * fVar152;
            auVar325._12_4_ = fVar214 * fVar214 + fVar153 * fVar153;
            auVar325._16_4_ = fVar229 * fVar229 + fVar154 * fVar154;
            auVar325._20_4_ = fVar245 * fVar245 + fVar155 * fVar155;
            auVar325._24_4_ = fVar254 * fVar254 + fVar199 * fVar199;
            auVar325._28_4_ = fStack_6a4 + fStack_4a4;
            auVar30 = vrsqrtps_avx(auVar325);
            fVar196 = auVar30._0_4_;
            fVar222 = auVar30._4_4_;
            auVar71._4_4_ = fVar222 * 1.5;
            auVar71._0_4_ = fVar196 * 1.5;
            fVar211 = auVar30._8_4_;
            auVar71._8_4_ = fVar211 * 1.5;
            fVar218 = auVar30._12_4_;
            auVar71._12_4_ = fVar218 * 1.5;
            fVar241 = auVar30._16_4_;
            auVar71._16_4_ = fVar241 * 1.5;
            fVar249 = auVar30._20_4_;
            auVar71._20_4_ = fVar249 * 1.5;
            fVar258 = auVar30._24_4_;
            auVar71._24_4_ = fVar258 * 1.5;
            auVar71._28_4_ = auVar342._28_4_;
            auVar72._4_4_ = fVar222 * fVar222 * fVar222 * auVar325._4_4_ * 0.5;
            auVar72._0_4_ = fVar196 * fVar196 * fVar196 * auVar325._0_4_ * 0.5;
            auVar72._8_4_ = fVar211 * fVar211 * fVar211 * auVar325._8_4_ * 0.5;
            auVar72._12_4_ = fVar218 * fVar218 * fVar218 * auVar325._12_4_ * 0.5;
            auVar72._16_4_ = fVar241 * fVar241 * fVar241 * auVar325._16_4_ * 0.5;
            auVar72._20_4_ = fVar249 * fVar249 * fVar249 * auVar325._20_4_ * 0.5;
            auVar72._24_4_ = fVar258 * fVar258 * fVar258 * auVar325._24_4_ * 0.5;
            auVar72._28_4_ = auVar325._28_4_;
            auVar142 = vsubps_avx(auVar71,auVar72);
            fVar321 = auVar142._0_4_;
            fVar327 = auVar142._4_4_;
            fVar226 = auVar142._8_4_;
            fVar156 = auVar142._12_4_;
            fVar178 = auVar142._16_4_;
            fVar273 = auVar142._20_4_;
            fVar228 = auVar142._24_4_;
            fVar196 = auVar209._0_4_;
            fVar222 = auVar209._4_4_;
            fVar211 = auVar209._8_4_;
            fVar218 = auVar209._12_4_;
            fVar241 = auVar209._16_4_;
            fVar249 = auVar209._20_4_;
            fVar258 = auVar209._24_4_;
            auVar299._0_4_ = fVar196 * fVar196 + fVar259 * fVar259;
            auVar299._4_4_ = fVar222 * fVar222 + fVar355 * fVar355;
            auVar299._8_4_ = fVar211 * fVar211 + fVar217 * fVar217;
            auVar299._12_4_ = fVar218 * fVar218 + fVar303 * fVar303;
            auVar299._16_4_ = fVar241 * fVar241 + fVar221 * fVar221;
            auVar299._20_4_ = fVar249 * fVar249 + fVar305 * fVar305;
            auVar299._24_4_ = fVar258 * fVar258 + fVar224 * fVar224;
            auVar299._28_4_ = auVar30._28_4_ + auVar149._28_4_;
            auVar149 = vrsqrtps_avx(auVar299);
            fVar260 = auVar149._0_4_;
            fVar176 = auVar149._4_4_;
            auVar73._4_4_ = fVar176 * 1.5;
            auVar73._0_4_ = fVar260 * 1.5;
            fVar328 = auVar149._8_4_;
            auVar73._8_4_ = fVar328 * 1.5;
            fVar304 = auVar149._12_4_;
            auVar73._12_4_ = fVar304 * 1.5;
            fVar329 = auVar149._16_4_;
            auVar73._16_4_ = fVar329 * 1.5;
            fVar306 = auVar149._20_4_;
            auVar73._20_4_ = fVar306 * 1.5;
            fVar330 = auVar149._24_4_;
            auVar73._24_4_ = fVar330 * 1.5;
            auVar73._28_4_ = auVar342._28_4_;
            auVar74._4_4_ = fVar176 * fVar176 * fVar176 * auVar299._4_4_ * 0.5;
            auVar74._0_4_ = fVar260 * fVar260 * fVar260 * auVar299._0_4_ * 0.5;
            auVar74._8_4_ = fVar328 * fVar328 * fVar328 * auVar299._8_4_ * 0.5;
            auVar74._12_4_ = fVar304 * fVar304 * fVar304 * auVar299._12_4_ * 0.5;
            auVar74._16_4_ = fVar329 * fVar329 * fVar329 * auVar299._16_4_ * 0.5;
            auVar74._20_4_ = fVar306 * fVar306 * fVar306 * auVar299._20_4_ * 0.5;
            auVar74._24_4_ = fVar330 * fVar330 * fVar330 * auVar299._24_4_ * 0.5;
            auVar74._28_4_ = auVar299._28_4_;
            auVar209 = vsubps_avx(auVar73,auVar74);
            fVar260 = auVar209._0_4_;
            fVar176 = auVar209._4_4_;
            fVar328 = auVar209._8_4_;
            fVar304 = auVar209._12_4_;
            fVar329 = auVar209._16_4_;
            fVar306 = auVar209._20_4_;
            fVar330 = auVar209._24_4_;
            fVar332 = fVar132 * fVar321 * fVar332;
            fVar336 = fVar151 * fVar327 * fVar336;
            auVar75._4_4_ = fVar336;
            auVar75._0_4_ = fVar332;
            fVar197 = fStack_878 * fVar226 * fVar197;
            auVar75._8_4_ = fVar197;
            fVar214 = fStack_874 * fVar156 * fVar214;
            auVar75._12_4_ = fVar214;
            fVar229 = fStack_870 * fVar178 * fVar229;
            auVar75._16_4_ = fVar229;
            fVar245 = fStack_86c * fVar273 * fVar245;
            auVar75._20_4_ = fVar245;
            fVar254 = fStack_868 * fVar228 * fVar254;
            auVar75._24_4_ = fVar254;
            auVar75._28_4_ = auVar149._28_4_;
            local_720._4_4_ = fVar336 + local_760._4_4_;
            local_720._0_4_ = fVar332 + local_760._0_4_;
            uStack_718._0_4_ = fVar197 + local_760._8_4_;
            uStack_718._4_4_ = fVar214 + local_760._12_4_;
            auStack_710._0_4_ = fVar229 + local_760._16_4_;
            auStack_710._4_4_ = fVar245 + local_760._20_4_;
            fStack_708 = fVar254 + local_760._24_4_;
            fStack_704 = auVar149._28_4_ + local_760._28_4_;
            fVar332 = fVar132 * fVar321 * -fVar177;
            fVar336 = fVar151 * fVar327 * -fVar253;
            auVar76._4_4_ = fVar336;
            auVar76._0_4_ = fVar332;
            fVar197 = fStack_878 * fVar226 * -fVar152;
            auVar76._8_4_ = fVar197;
            fVar214 = fStack_874 * fVar156 * -fVar153;
            auVar76._12_4_ = fVar214;
            fVar229 = fStack_870 * fVar178 * -fVar154;
            auVar76._16_4_ = fVar229;
            fVar245 = fStack_86c * fVar273 * -fVar155;
            auVar76._20_4_ = fVar245;
            fVar254 = fStack_868 * fVar228 * -fVar199;
            auVar76._24_4_ = fVar254;
            auVar76._28_4_ = -fVar213;
            local_680._4_4_ = auVar192._4_4_ + fVar336;
            local_680._0_4_ = auVar192._0_4_ + fVar332;
            fStack_678 = auVar192._8_4_ + fVar197;
            fStack_674 = auVar192._12_4_ + fVar214;
            fStack_670 = auVar192._16_4_ + fVar229;
            fStack_66c = auVar192._20_4_ + fVar245;
            fStack_668 = auVar192._24_4_ + fVar254;
            fStack_664 = auVar192._28_4_ + -fVar213;
            fVar332 = fVar321 * 0.0 * fVar132;
            fVar336 = fVar327 * 0.0 * fVar151;
            auVar77._4_4_ = fVar336;
            auVar77._0_4_ = fVar332;
            fVar197 = fVar226 * 0.0 * fStack_878;
            auVar77._8_4_ = fVar197;
            fVar214 = fVar156 * 0.0 * fStack_874;
            auVar77._12_4_ = fVar214;
            fVar229 = fVar178 * 0.0 * fStack_870;
            auVar77._16_4_ = fVar229;
            fVar245 = fVar273 * 0.0 * fStack_86c;
            auVar77._20_4_ = fVar245;
            fVar254 = fVar228 * 0.0 * fStack_868;
            auVar77._24_4_ = fVar254;
            auVar77._28_4_ = fVar213;
            auVar149 = vsubps_avx(local_760,auVar75);
            auVar367._0_4_ = fVar332 + auVar145._0_4_;
            auVar367._4_4_ = fVar336 + auVar145._4_4_;
            auVar367._8_4_ = fVar197 + auVar145._8_4_;
            auVar367._12_4_ = fVar214 + auVar145._12_4_;
            auVar367._16_4_ = fVar229 + auVar145._16_4_;
            auVar367._20_4_ = fVar245 + auVar145._20_4_;
            auVar367._24_4_ = fVar254 + auVar145._24_4_;
            auVar367._28_4_ = fVar213 + auVar145._28_4_;
            fVar332 = auVar284._0_4_ * fVar260 * fVar196;
            fVar196 = auVar284._4_4_ * fVar176 * fVar222;
            auVar78._4_4_ = fVar196;
            auVar78._0_4_ = fVar332;
            fVar336 = auVar284._8_4_ * fVar328 * fVar211;
            auVar78._8_4_ = fVar336;
            fVar222 = auVar284._12_4_ * fVar304 * fVar218;
            auVar78._12_4_ = fVar222;
            fVar197 = auVar284._16_4_ * fVar329 * fVar241;
            auVar78._16_4_ = fVar197;
            fVar211 = auVar284._20_4_ * fVar306 * fVar249;
            auVar78._20_4_ = fVar211;
            fVar214 = auVar284._24_4_ * fVar330 * fVar258;
            auVar78._24_4_ = fVar214;
            auVar78._28_4_ = fStack_864;
            auVar34 = vsubps_avx(auVar192,auVar76);
            auVar348._0_4_ = auVar269._0_4_ + fVar332;
            auVar348._4_4_ = auVar269._4_4_ + fVar196;
            auVar348._8_4_ = auVar269._8_4_ + fVar336;
            auVar348._12_4_ = auVar269._12_4_ + fVar222;
            auVar348._16_4_ = auVar269._16_4_ + fVar197;
            auVar348._20_4_ = auVar269._20_4_ + fVar211;
            auVar348._24_4_ = auVar269._24_4_ + fVar214;
            auVar348._28_4_ = auVar269._28_4_ + fStack_864;
            fVar332 = fVar260 * -fVar259 * auVar284._0_4_;
            fVar196 = fVar176 * -fVar355 * auVar284._4_4_;
            auVar79._4_4_ = fVar196;
            auVar79._0_4_ = fVar332;
            fVar336 = fVar328 * -fVar217 * auVar284._8_4_;
            auVar79._8_4_ = fVar336;
            fVar222 = fVar304 * -fVar303 * auVar284._12_4_;
            auVar79._12_4_ = fVar222;
            fVar197 = fVar329 * -fVar221 * auVar284._16_4_;
            auVar79._16_4_ = fVar197;
            fVar211 = fVar306 * -fVar305 * auVar284._20_4_;
            auVar79._20_4_ = fVar211;
            fVar214 = fVar330 * -fVar224 * auVar284._24_4_;
            auVar79._24_4_ = fVar214;
            auVar79._28_4_ = local_760._28_4_;
            auVar35 = vsubps_avx(auVar145,auVar77);
            auVar240._0_4_ = local_6e0._0_4_ + fVar332;
            auVar240._4_4_ = local_6e0._4_4_ + fVar196;
            auVar240._8_4_ = local_6e0._8_4_ + fVar336;
            auVar240._12_4_ = local_6e0._12_4_ + fVar222;
            auVar240._16_4_ = local_6e0._16_4_ + fVar197;
            auVar240._20_4_ = local_6e0._20_4_ + fVar211;
            auVar240._24_4_ = local_6e0._24_4_ + fVar214;
            auVar240._28_4_ = local_6e0._28_4_ + local_760._28_4_;
            fVar332 = fVar260 * 0.0 * auVar284._0_4_;
            fVar196 = fVar176 * 0.0 * auVar284._4_4_;
            auVar80._4_4_ = fVar196;
            auVar80._0_4_ = fVar332;
            fVar336 = fVar328 * 0.0 * auVar284._8_4_;
            auVar80._8_4_ = fVar336;
            fVar222 = fVar304 * 0.0 * auVar284._12_4_;
            auVar80._12_4_ = fVar222;
            fVar197 = fVar329 * 0.0 * auVar284._16_4_;
            auVar80._16_4_ = fVar197;
            fVar211 = fVar306 * 0.0 * auVar284._20_4_;
            auVar80._20_4_ = fVar211;
            fVar214 = fVar330 * 0.0 * auVar284._24_4_;
            auVar80._24_4_ = fVar214;
            auVar80._28_4_ = auVar145._28_4_;
            auVar30 = vsubps_avx(auVar269,auVar78);
            auVar116._4_4_ = fStack_73c;
            auVar116._0_4_ = local_740;
            auVar116._8_4_ = fStack_738;
            auVar116._12_4_ = fStack_734;
            auVar116._16_4_ = fStack_730;
            auVar116._20_4_ = fStack_72c;
            auVar116._24_4_ = fStack_728;
            auVar116._28_4_ = fStack_724;
            auVar314._0_4_ = local_740 + fVar332;
            auVar314._4_4_ = fStack_73c + fVar196;
            auVar314._8_4_ = fStack_738 + fVar336;
            auVar314._12_4_ = fStack_734 + fVar222;
            auVar314._16_4_ = fStack_730 + fVar197;
            auVar314._20_4_ = fStack_72c + fVar211;
            auVar314._24_4_ = fStack_728 + fVar214;
            auVar314._28_4_ = fStack_724 + auVar145._28_4_;
            auVar142 = vsubps_avx(local_6e0,auVar79);
            auVar38 = vsubps_avx(auVar116,auVar80);
            auVar312 = vsubps_avx(auVar240,auVar34);
            auVar204 = vsubps_avx(auVar314,auVar35);
            auVar81._4_4_ = auVar35._4_4_ * auVar312._4_4_;
            auVar81._0_4_ = auVar35._0_4_ * auVar312._0_4_;
            auVar81._8_4_ = auVar35._8_4_ * auVar312._8_4_;
            auVar81._12_4_ = auVar35._12_4_ * auVar312._12_4_;
            auVar81._16_4_ = auVar35._16_4_ * auVar312._16_4_;
            auVar81._20_4_ = auVar35._20_4_ * auVar312._20_4_;
            auVar81._24_4_ = auVar35._24_4_ * auVar312._24_4_;
            auVar81._28_4_ = auVar342._28_4_;
            auVar82._4_4_ = auVar34._4_4_ * auVar204._4_4_;
            auVar82._0_4_ = auVar34._0_4_ * auVar204._0_4_;
            auVar82._8_4_ = auVar34._8_4_ * auVar204._8_4_;
            auVar82._12_4_ = auVar34._12_4_ * auVar204._12_4_;
            auVar82._16_4_ = auVar34._16_4_ * auVar204._16_4_;
            auVar82._20_4_ = auVar34._20_4_ * auVar204._20_4_;
            auVar82._24_4_ = auVar34._24_4_ * auVar204._24_4_;
            auVar82._28_4_ = fStack_724;
            auVar298 = vsubps_avx(auVar82,auVar81);
            auVar83._4_4_ = auVar149._4_4_ * auVar204._4_4_;
            auVar83._0_4_ = auVar149._0_4_ * auVar204._0_4_;
            auVar83._8_4_ = auVar149._8_4_ * auVar204._8_4_;
            auVar83._12_4_ = auVar149._12_4_ * auVar204._12_4_;
            auVar83._16_4_ = auVar149._16_4_ * auVar204._16_4_;
            auVar83._20_4_ = auVar149._20_4_ * auVar204._20_4_;
            auVar83._24_4_ = auVar149._24_4_ * auVar204._24_4_;
            auVar83._28_4_ = auVar204._28_4_;
            auVar204 = vsubps_avx(auVar348,auVar149);
            auVar84._4_4_ = auVar35._4_4_ * auVar204._4_4_;
            auVar84._0_4_ = auVar35._0_4_ * auVar204._0_4_;
            auVar84._8_4_ = auVar35._8_4_ * auVar204._8_4_;
            auVar84._12_4_ = auVar35._12_4_ * auVar204._12_4_;
            auVar84._16_4_ = auVar35._16_4_ * auVar204._16_4_;
            auVar84._20_4_ = auVar35._20_4_ * auVar204._20_4_;
            auVar84._24_4_ = auVar35._24_4_ * auVar204._24_4_;
            auVar84._28_4_ = auVar209._28_4_;
            auVar310 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = auVar34._4_4_ * auVar204._4_4_;
            auVar85._0_4_ = auVar34._0_4_ * auVar204._0_4_;
            auVar85._8_4_ = auVar34._8_4_ * auVar204._8_4_;
            auVar85._12_4_ = auVar34._12_4_ * auVar204._12_4_;
            auVar85._16_4_ = auVar34._16_4_ * auVar204._16_4_;
            auVar85._20_4_ = auVar34._20_4_ * auVar204._20_4_;
            auVar85._24_4_ = auVar34._24_4_ * auVar204._24_4_;
            auVar85._28_4_ = auVar209._28_4_;
            auVar86._4_4_ = auVar149._4_4_ * auVar312._4_4_;
            auVar86._0_4_ = auVar149._0_4_ * auVar312._0_4_;
            auVar86._8_4_ = auVar149._8_4_ * auVar312._8_4_;
            auVar86._12_4_ = auVar149._12_4_ * auVar312._12_4_;
            auVar86._16_4_ = auVar149._16_4_ * auVar312._16_4_;
            auVar86._20_4_ = auVar149._20_4_ * auVar312._20_4_;
            auVar86._24_4_ = auVar149._24_4_ * auVar312._24_4_;
            auVar86._28_4_ = auVar312._28_4_;
            auVar209 = vsubps_avx(auVar86,auVar85);
            auVar169._0_4_ = auVar298._0_4_ * 0.0 + auVar209._0_4_ + auVar310._0_4_ * 0.0;
            auVar169._4_4_ = auVar298._4_4_ * 0.0 + auVar209._4_4_ + auVar310._4_4_ * 0.0;
            auVar169._8_4_ = auVar298._8_4_ * 0.0 + auVar209._8_4_ + auVar310._8_4_ * 0.0;
            auVar169._12_4_ = auVar298._12_4_ * 0.0 + auVar209._12_4_ + auVar310._12_4_ * 0.0;
            auVar169._16_4_ = auVar298._16_4_ * 0.0 + auVar209._16_4_ + auVar310._16_4_ * 0.0;
            auVar169._20_4_ = auVar298._20_4_ * 0.0 + auVar209._20_4_ + auVar310._20_4_ * 0.0;
            auVar169._24_4_ = auVar298._24_4_ * 0.0 + auVar209._24_4_ + auVar310._24_4_ * 0.0;
            auVar169._28_4_ = auVar298._28_4_ + auVar209._28_4_ + auVar310._28_4_;
            auVar365 = vcmpps_avx(auVar169,ZEXT832(0) << 0x20,2);
            auVar209 = vblendvps_avx(auVar30,_local_720,auVar365);
            auVar30 = vblendvps_avx(auVar142,_local_680,auVar365);
            auVar142 = vblendvps_avx(auVar38,auVar367,auVar365);
            auVar38 = vblendvps_avx(auVar149,auVar348,auVar365);
            auVar312 = vblendvps_avx(auVar34,auVar240,auVar365);
            auVar204 = vblendvps_avx(auVar35,auVar314,auVar365);
            auVar298 = vblendvps_avx(auVar348,auVar149,auVar365);
            auVar310 = vblendvps_avx(auVar240,auVar34,auVar365);
            auVar323 = vblendvps_avx(auVar314,auVar35,auVar365);
            auVar149 = vandps_avx(local_660,auVar207);
            auVar298 = vsubps_avx(auVar298,auVar209);
            auVar36 = vsubps_avx(auVar310,auVar30);
            auVar323 = vsubps_avx(auVar323,auVar142);
            auVar37 = vsubps_avx(auVar30,auVar312);
            fVar332 = auVar36._0_4_;
            fVar275 = auVar142._0_4_;
            fVar218 = auVar36._4_4_;
            fVar286 = auVar142._4_4_;
            auVar87._4_4_ = fVar286 * fVar218;
            auVar87._0_4_ = fVar275 * fVar332;
            fVar259 = auVar36._8_4_;
            fVar287 = auVar142._8_4_;
            auVar87._8_4_ = fVar287 * fVar259;
            fVar304 = auVar36._12_4_;
            fVar288 = auVar142._12_4_;
            auVar87._12_4_ = fVar288 * fVar304;
            fVar321 = auVar36._16_4_;
            fVar289 = auVar142._16_4_;
            auVar87._16_4_ = fVar289 * fVar321;
            fVar177 = auVar36._20_4_;
            fVar290 = auVar142._20_4_;
            auVar87._20_4_ = fVar290 * fVar177;
            fVar213 = auVar36._24_4_;
            fVar291 = auVar142._24_4_;
            auVar87._24_4_ = fVar291 * fVar213;
            auVar87._28_4_ = auVar310._28_4_;
            fVar196 = auVar30._0_4_;
            fVar308 = auVar323._0_4_;
            fVar229 = auVar30._4_4_;
            fVar316 = auVar323._4_4_;
            auVar88._4_4_ = fVar316 * fVar229;
            auVar88._0_4_ = fVar308 * fVar196;
            fVar260 = auVar30._8_4_;
            fVar318 = auVar323._8_4_;
            auVar88._8_4_ = fVar318 * fVar260;
            fVar221 = auVar30._12_4_;
            fVar179 = auVar323._12_4_;
            auVar88._12_4_ = fVar179 * fVar221;
            fVar327 = auVar30._16_4_;
            fVar193 = auVar323._16_4_;
            auVar88._16_4_ = fVar193 * fVar327;
            fVar253 = auVar30._20_4_;
            fVar194 = auVar323._20_4_;
            auVar88._20_4_ = fVar194 * fVar253;
            fVar216 = auVar30._24_4_;
            fVar195 = auVar323._24_4_;
            uVar11 = auVar34._28_4_;
            auVar88._24_4_ = fVar195 * fVar216;
            auVar88._28_4_ = uVar11;
            auVar310 = vsubps_avx(auVar88,auVar87);
            fVar336 = auVar209._0_4_;
            fVar241 = auVar209._4_4_;
            auVar89._4_4_ = fVar316 * fVar241;
            auVar89._0_4_ = fVar308 * fVar336;
            fVar355 = auVar209._8_4_;
            auVar89._8_4_ = fVar318 * fVar355;
            fVar329 = auVar209._12_4_;
            auVar89._12_4_ = fVar179 * fVar329;
            fVar226 = auVar209._16_4_;
            auVar89._16_4_ = fVar193 * fVar226;
            fVar152 = auVar209._20_4_;
            auVar89._20_4_ = fVar194 * fVar152;
            fVar220 = auVar209._24_4_;
            auVar89._24_4_ = fVar195 * fVar220;
            auVar89._28_4_ = uVar11;
            fVar222 = auVar298._0_4_;
            fVar245 = auVar298._4_4_;
            auVar90._4_4_ = fVar286 * fVar245;
            auVar90._0_4_ = fVar275 * fVar222;
            fVar176 = auVar298._8_4_;
            auVar90._8_4_ = fVar287 * fVar176;
            fVar305 = auVar298._12_4_;
            auVar90._12_4_ = fVar288 * fVar305;
            fVar156 = auVar298._16_4_;
            auVar90._16_4_ = fVar289 * fVar156;
            fVar153 = auVar298._20_4_;
            auVar90._20_4_ = fVar290 * fVar153;
            fVar223 = auVar298._24_4_;
            auVar90._24_4_ = fVar291 * fVar223;
            auVar90._28_4_ = auVar348._28_4_;
            auVar34 = vsubps_avx(auVar90,auVar89);
            auVar91._4_4_ = fVar229 * fVar245;
            auVar91._0_4_ = fVar196 * fVar222;
            auVar91._8_4_ = fVar260 * fVar176;
            auVar91._12_4_ = fVar221 * fVar305;
            auVar91._16_4_ = fVar327 * fVar156;
            auVar91._20_4_ = fVar253 * fVar153;
            auVar91._24_4_ = fVar216 * fVar223;
            auVar91._28_4_ = uVar11;
            auVar92._4_4_ = fVar241 * fVar218;
            auVar92._0_4_ = fVar336 * fVar332;
            auVar92._8_4_ = fVar355 * fVar259;
            auVar92._12_4_ = fVar329 * fVar304;
            auVar92._16_4_ = fVar226 * fVar321;
            auVar92._20_4_ = fVar152 * fVar177;
            auVar92._24_4_ = fVar220 * fVar213;
            auVar92._28_4_ = auVar35._28_4_;
            auVar35 = vsubps_avx(auVar92,auVar91);
            auVar142 = vsubps_avx(auVar142,auVar204);
            fVar211 = auVar35._28_4_ + auVar34._28_4_;
            local_760._0_4_ = auVar35._0_4_ + auVar34._0_4_ * 0.0 + auVar310._0_4_ * 0.0;
            local_760._4_4_ = auVar35._4_4_ + auVar34._4_4_ * 0.0 + auVar310._4_4_ * 0.0;
            local_760._8_4_ = auVar35._8_4_ + auVar34._8_4_ * 0.0 + auVar310._8_4_ * 0.0;
            local_760._12_4_ = auVar35._12_4_ + auVar34._12_4_ * 0.0 + auVar310._12_4_ * 0.0;
            local_760._16_4_ = auVar35._16_4_ + auVar34._16_4_ * 0.0 + auVar310._16_4_ * 0.0;
            local_760._20_4_ = auVar35._20_4_ + auVar34._20_4_ * 0.0 + auVar310._20_4_ * 0.0;
            local_760._24_4_ = auVar35._24_4_ + auVar34._24_4_ * 0.0 + auVar310._24_4_ * 0.0;
            local_760._28_4_ = fVar211 + auVar310._28_4_;
            fVar197 = auVar37._0_4_;
            fVar249 = auVar37._4_4_;
            auVar93._4_4_ = auVar204._4_4_ * fVar249;
            auVar93._0_4_ = auVar204._0_4_ * fVar197;
            fVar217 = auVar37._8_4_;
            auVar93._8_4_ = auVar204._8_4_ * fVar217;
            fVar306 = auVar37._12_4_;
            auVar93._12_4_ = auVar204._12_4_ * fVar306;
            fVar178 = auVar37._16_4_;
            auVar93._16_4_ = auVar204._16_4_ * fVar178;
            fVar154 = auVar37._20_4_;
            auVar93._20_4_ = auVar204._20_4_ * fVar154;
            fVar225 = auVar37._24_4_;
            auVar93._24_4_ = auVar204._24_4_ * fVar225;
            auVar93._28_4_ = fVar211;
            fVar211 = auVar142._0_4_;
            fVar254 = auVar142._4_4_;
            auVar94._4_4_ = auVar312._4_4_ * fVar254;
            auVar94._0_4_ = auVar312._0_4_ * fVar211;
            fVar328 = auVar142._8_4_;
            auVar94._8_4_ = auVar312._8_4_ * fVar328;
            fVar224 = auVar142._12_4_;
            auVar94._12_4_ = auVar312._12_4_ * fVar224;
            fVar273 = auVar142._16_4_;
            auVar94._16_4_ = auVar312._16_4_ * fVar273;
            fVar155 = auVar142._20_4_;
            auVar94._20_4_ = auVar312._20_4_ * fVar155;
            fVar227 = auVar142._24_4_;
            auVar94._24_4_ = auVar312._24_4_ * fVar227;
            auVar94._28_4_ = auVar35._28_4_;
            auVar34 = vsubps_avx(auVar94,auVar93);
            auVar209 = vsubps_avx(auVar209,auVar38);
            fVar214 = auVar209._0_4_;
            fVar258 = auVar209._4_4_;
            auVar95._4_4_ = auVar204._4_4_ * fVar258;
            auVar95._0_4_ = auVar204._0_4_ * fVar214;
            fVar303 = auVar209._8_4_;
            auVar95._8_4_ = auVar204._8_4_ * fVar303;
            fVar330 = auVar209._12_4_;
            auVar95._12_4_ = auVar204._12_4_ * fVar330;
            fVar228 = auVar209._16_4_;
            auVar95._16_4_ = auVar204._16_4_ * fVar228;
            fVar199 = auVar209._20_4_;
            auVar95._20_4_ = auVar204._20_4_ * fVar199;
            fVar262 = auVar209._24_4_;
            auVar95._24_4_ = auVar204._24_4_ * fVar262;
            auVar95._28_4_ = auVar204._28_4_;
            auVar96._4_4_ = fVar254 * auVar38._4_4_;
            auVar96._0_4_ = fVar211 * auVar38._0_4_;
            auVar96._8_4_ = fVar328 * auVar38._8_4_;
            auVar96._12_4_ = fVar224 * auVar38._12_4_;
            auVar96._16_4_ = fVar273 * auVar38._16_4_;
            auVar96._20_4_ = fVar155 * auVar38._20_4_;
            auVar96._24_4_ = fVar227 * auVar38._24_4_;
            auVar96._28_4_ = auVar310._28_4_;
            auVar209 = vsubps_avx(auVar95,auVar96);
            auVar97._4_4_ = auVar312._4_4_ * fVar258;
            auVar97._0_4_ = auVar312._0_4_ * fVar214;
            auVar97._8_4_ = auVar312._8_4_ * fVar303;
            auVar97._12_4_ = auVar312._12_4_ * fVar330;
            auVar97._16_4_ = auVar312._16_4_ * fVar228;
            auVar97._20_4_ = auVar312._20_4_ * fVar199;
            auVar97._24_4_ = auVar312._24_4_ * fVar262;
            auVar97._28_4_ = auVar312._28_4_;
            auVar98._4_4_ = fVar249 * auVar38._4_4_;
            auVar98._0_4_ = fVar197 * auVar38._0_4_;
            auVar98._8_4_ = fVar217 * auVar38._8_4_;
            auVar98._12_4_ = fVar306 * auVar38._12_4_;
            auVar98._16_4_ = fVar178 * auVar38._16_4_;
            auVar98._20_4_ = fVar154 * auVar38._20_4_;
            auVar98._24_4_ = fVar225 * auVar38._24_4_;
            auVar98._28_4_ = auVar38._28_4_;
            auVar38 = vsubps_avx(auVar98,auVar97);
            auVar146._0_4_ = auVar34._0_4_ * 0.0 + auVar38._0_4_ + auVar209._0_4_ * 0.0;
            auVar146._4_4_ = auVar34._4_4_ * 0.0 + auVar38._4_4_ + auVar209._4_4_ * 0.0;
            auVar146._8_4_ = auVar34._8_4_ * 0.0 + auVar38._8_4_ + auVar209._8_4_ * 0.0;
            auVar146._12_4_ = auVar34._12_4_ * 0.0 + auVar38._12_4_ + auVar209._12_4_ * 0.0;
            auVar146._16_4_ = auVar34._16_4_ * 0.0 + auVar38._16_4_ + auVar209._16_4_ * 0.0;
            auVar146._20_4_ = auVar34._20_4_ * 0.0 + auVar38._20_4_ + auVar209._20_4_ * 0.0;
            auVar146._24_4_ = auVar34._24_4_ * 0.0 + auVar38._24_4_ + auVar209._24_4_ * 0.0;
            auVar146._28_4_ = auVar209._28_4_ + auVar38._28_4_ + auVar209._28_4_;
            auVar150 = ZEXT3264(auVar146);
            auVar209 = vmaxps_avx(local_760,auVar146);
            auVar209 = vcmpps_avx(auVar209,ZEXT432(0) << 0x20,2);
            auVar38 = auVar149 & auVar209;
            if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar38 >> 0x7f,0) == '\0') &&
                  (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar38 >> 0xbf,0) == '\0') &&
                (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar38[0x1f]) {
LAB_00f780c3:
              auVar210 = ZEXT3264(CONCAT824(uStack_5e8,
                                            CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
              auVar326 = ZEXT3264(CONCAT428(fStack_864,
                                            CONCAT424(fStack_868,
                                                      CONCAT420(fStack_86c,
                                                                CONCAT416(fStack_870,
                                                                          CONCAT412(fStack_874,
                                                                                    CONCAT48(
                                                  fStack_878,CONCAT44(fVar151,fVar132))))))));
            }
            else {
              auVar38 = vandps_avx(auVar209,auVar149);
              auVar99._4_4_ = fVar254 * fVar218;
              auVar99._0_4_ = fVar211 * fVar332;
              auVar99._8_4_ = fVar328 * fVar259;
              auVar99._12_4_ = fVar224 * fVar304;
              auVar99._16_4_ = fVar273 * fVar321;
              auVar99._20_4_ = fVar155 * fVar177;
              auVar99._24_4_ = fVar227 * fVar213;
              auVar99._28_4_ = auVar149._28_4_;
              auVar100._4_4_ = fVar249 * fVar316;
              auVar100._0_4_ = fVar197 * fVar308;
              auVar100._8_4_ = fVar217 * fVar318;
              auVar100._12_4_ = fVar306 * fVar179;
              auVar100._16_4_ = fVar178 * fVar193;
              auVar100._20_4_ = fVar154 * fVar194;
              auVar100._24_4_ = fVar225 * fVar195;
              auVar100._28_4_ = auVar209._28_4_;
              auVar312 = vsubps_avx(auVar100,auVar99);
              auVar101._4_4_ = fVar258 * fVar316;
              auVar101._0_4_ = fVar214 * fVar308;
              auVar101._8_4_ = fVar303 * fVar318;
              auVar101._12_4_ = fVar330 * fVar179;
              auVar101._16_4_ = fVar228 * fVar193;
              auVar101._20_4_ = fVar199 * fVar194;
              auVar101._24_4_ = fVar262 * fVar195;
              auVar101._28_4_ = auVar323._28_4_;
              auVar102._4_4_ = fVar254 * fVar245;
              auVar102._0_4_ = fVar211 * fVar222;
              auVar102._8_4_ = fVar328 * fVar176;
              auVar102._12_4_ = fVar224 * fVar305;
              auVar102._16_4_ = fVar273 * fVar156;
              auVar102._20_4_ = fVar155 * fVar153;
              auVar102._24_4_ = fVar227 * fVar223;
              auVar102._28_4_ = auVar142._28_4_;
              auVar204 = vsubps_avx(auVar102,auVar101);
              auVar103._4_4_ = fVar249 * fVar245;
              auVar103._0_4_ = fVar197 * fVar222;
              auVar103._8_4_ = fVar217 * fVar176;
              auVar103._12_4_ = fVar306 * fVar305;
              auVar103._16_4_ = fVar178 * fVar156;
              auVar103._20_4_ = fVar154 * fVar153;
              auVar103._24_4_ = fVar225 * fVar223;
              auVar103._28_4_ = auVar298._28_4_;
              auVar104._4_4_ = fVar258 * fVar218;
              auVar104._0_4_ = fVar214 * fVar332;
              auVar104._8_4_ = fVar303 * fVar259;
              auVar104._12_4_ = fVar330 * fVar304;
              auVar104._16_4_ = fVar228 * fVar321;
              auVar104._20_4_ = fVar199 * fVar177;
              auVar104._24_4_ = fVar262 * fVar213;
              auVar104._28_4_ = auVar36._28_4_;
              auVar310 = vsubps_avx(auVar104,auVar103);
              auVar300._0_4_ = auVar312._0_4_ * 0.0 + auVar310._0_4_ + auVar204._0_4_ * 0.0;
              auVar300._4_4_ = auVar312._4_4_ * 0.0 + auVar310._4_4_ + auVar204._4_4_ * 0.0;
              auVar300._8_4_ = auVar312._8_4_ * 0.0 + auVar310._8_4_ + auVar204._8_4_ * 0.0;
              auVar300._12_4_ = auVar312._12_4_ * 0.0 + auVar310._12_4_ + auVar204._12_4_ * 0.0;
              auVar300._16_4_ = auVar312._16_4_ * 0.0 + auVar310._16_4_ + auVar204._16_4_ * 0.0;
              auVar300._20_4_ = auVar312._20_4_ * 0.0 + auVar310._20_4_ + auVar204._20_4_ * 0.0;
              auVar300._24_4_ = auVar312._24_4_ * 0.0 + auVar310._24_4_ + auVar204._24_4_ * 0.0;
              auVar300._28_4_ = auVar37._28_4_ + auVar310._28_4_ + auVar298._28_4_;
              auVar209 = vrcpps_avx(auVar300);
              fVar332 = auVar209._0_4_;
              fVar222 = auVar209._4_4_;
              auVar105._4_4_ = auVar300._4_4_ * fVar222;
              auVar105._0_4_ = auVar300._0_4_ * fVar332;
              fVar197 = auVar209._8_4_;
              auVar105._8_4_ = auVar300._8_4_ * fVar197;
              fVar211 = auVar209._12_4_;
              auVar105._12_4_ = auVar300._12_4_ * fVar211;
              fVar214 = auVar209._16_4_;
              auVar105._16_4_ = auVar300._16_4_ * fVar214;
              fVar218 = auVar209._20_4_;
              auVar105._20_4_ = auVar300._20_4_ * fVar218;
              fVar245 = auVar209._24_4_;
              auVar105._24_4_ = auVar300._24_4_ * fVar245;
              auVar105._28_4_ = auVar142._28_4_;
              auVar343._8_4_ = 0x3f800000;
              auVar343._0_8_ = 0x3f8000003f800000;
              auVar343._12_4_ = 0x3f800000;
              auVar343._16_4_ = 0x3f800000;
              auVar343._20_4_ = 0x3f800000;
              auVar343._24_4_ = 0x3f800000;
              auVar343._28_4_ = 0x3f800000;
              auVar209 = vsubps_avx(auVar343,auVar105);
              fVar332 = auVar209._0_4_ * fVar332 + fVar332;
              fVar222 = auVar209._4_4_ * fVar222 + fVar222;
              fVar197 = auVar209._8_4_ * fVar197 + fVar197;
              fVar211 = auVar209._12_4_ * fVar211 + fVar211;
              fVar214 = auVar209._16_4_ * fVar214 + fVar214;
              fVar218 = auVar209._20_4_ * fVar218 + fVar218;
              fVar245 = auVar209._24_4_ * fVar245 + fVar245;
              auVar106._4_4_ =
                   (fVar241 * auVar312._4_4_ + auVar204._4_4_ * fVar229 + fVar286 * auVar310._4_4_)
                   * fVar222;
              auVar106._0_4_ =
                   (fVar336 * auVar312._0_4_ + auVar204._0_4_ * fVar196 + fVar275 * auVar310._0_4_)
                   * fVar332;
              auVar106._8_4_ =
                   (fVar355 * auVar312._8_4_ + auVar204._8_4_ * fVar260 + fVar287 * auVar310._8_4_)
                   * fVar197;
              auVar106._12_4_ =
                   (fVar329 * auVar312._12_4_ +
                   auVar204._12_4_ * fVar221 + fVar288 * auVar310._12_4_) * fVar211;
              auVar106._16_4_ =
                   (fVar226 * auVar312._16_4_ +
                   auVar204._16_4_ * fVar327 + fVar289 * auVar310._16_4_) * fVar214;
              auVar106._20_4_ =
                   (fVar152 * auVar312._20_4_ +
                   auVar204._20_4_ * fVar253 + fVar290 * auVar310._20_4_) * fVar218;
              auVar106._24_4_ =
                   (fVar220 * auVar312._24_4_ +
                   auVar204._24_4_ * fVar216 + fVar291 * auVar310._24_4_) * fVar245;
              auVar106._28_4_ = auVar30._28_4_ + auVar310._28_4_;
              uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar208._4_4_ = uVar11;
              auVar208._0_4_ = uVar11;
              auVar208._8_4_ = uVar11;
              auVar208._12_4_ = uVar11;
              auVar208._16_4_ = uVar11;
              auVar208._20_4_ = uVar11;
              auVar208._24_4_ = uVar11;
              auVar208._28_4_ = uVar11;
              auVar30 = vcmpps_avx(local_100,auVar106,2);
              auVar209 = vcmpps_avx(auVar106,auVar208,2);
              auVar209 = vandps_avx(auVar30,auVar209);
              auVar142 = auVar38 & auVar209;
              if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar142 >> 0x7f,0) == '\0') &&
                    (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar142 >> 0xbf,0) == '\0') &&
                  (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar142[0x1f]) goto LAB_00f780c3;
              auVar209 = vandps_avx(auVar38,auVar209);
              auVar142 = vcmpps_avx(auVar300,ZEXT432(0) << 0x20,4);
              auVar38 = auVar209 & auVar142;
              auVar210 = ZEXT3264(CONCAT824(uStack_5e8,
                                            CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
              auVar326 = ZEXT3264(CONCAT428(fStack_864,
                                            CONCAT424(fStack_868,
                                                      CONCAT420(fStack_86c,
                                                                CONCAT416(fStack_870,
                                                                          CONCAT412(fStack_874,
                                                                                    CONCAT48(
                                                  fStack_878,CONCAT44(fVar151,fVar132))))))));
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar38 >> 0x7f,0) != '\0') ||
                    (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar38 >> 0xbf,0) != '\0') ||
                  (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar38[0x1f] < '\0') {
                auVar209 = vandps_avx(auVar142,auVar209);
                auVar210 = ZEXT3264(auVar209);
                auVar107._4_4_ = fVar222 * local_760._4_4_;
                auVar107._0_4_ = fVar332 * local_760._0_4_;
                auVar107._8_4_ = fVar197 * local_760._8_4_;
                auVar107._12_4_ = fVar211 * local_760._12_4_;
                auVar107._16_4_ = fVar214 * local_760._16_4_;
                auVar107._20_4_ = fVar218 * local_760._20_4_;
                auVar107._24_4_ = fVar245 * local_760._24_4_;
                auVar107._28_4_ = auVar30._28_4_;
                auVar108._4_4_ = auVar146._4_4_ * fVar222;
                auVar108._0_4_ = auVar146._0_4_ * fVar332;
                auVar108._8_4_ = auVar146._8_4_ * fVar197;
                auVar108._12_4_ = auVar146._12_4_ * fVar211;
                auVar108._16_4_ = auVar146._16_4_ * fVar214;
                auVar108._20_4_ = auVar146._20_4_ * fVar218;
                auVar108._24_4_ = auVar146._24_4_ * fVar245;
                auVar108._28_4_ = auVar146._28_4_;
                auVar270._8_4_ = 0x3f800000;
                auVar270._0_8_ = 0x3f8000003f800000;
                auVar270._12_4_ = 0x3f800000;
                auVar270._16_4_ = 0x3f800000;
                auVar270._20_4_ = 0x3f800000;
                auVar270._24_4_ = 0x3f800000;
                auVar270._28_4_ = 0x3f800000;
                auVar209 = vsubps_avx(auVar270,auVar107);
                local_3e0 = vblendvps_avx(auVar209,auVar107,auVar365);
                auVar209 = vsubps_avx(auVar270,auVar108);
                _local_400 = vblendvps_avx(auVar209,auVar108,auVar365);
                auVar150 = ZEXT3264(_local_400);
                local_5a0 = auVar106;
              }
            }
            auVar368 = ZEXT3264(local_5e0);
            auVar209 = auVar210._0_32_;
            fVar179 = (float)local_7c0._0_4_;
            fVar193 = (float)local_7c0._4_4_;
            fVar194 = fStack_7b8;
            fVar195 = fStack_7b4;
            fVar222 = fStack_7b0;
            fVar197 = fStack_7ac;
            fVar211 = fStack_7a8;
            fVar214 = fStack_7a4;
            local_500 = auVar207;
            if ((((((((auVar209 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar209 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar209 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar209 >> 0x7f,0) != '\0') ||
                  (auVar210 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar209 >> 0xbf,0) != '\0') ||
                (auVar210 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar210[0x1f] < '\0') {
              auVar30 = vsubps_avx(auVar284,auVar326._0_32_);
              fVar196 = auVar326._0_4_ + local_3e0._0_4_ * auVar30._0_4_;
              fVar336 = auVar326._4_4_ + local_3e0._4_4_ * auVar30._4_4_;
              fVar218 = auVar326._8_4_ + local_3e0._8_4_ * auVar30._8_4_;
              fVar229 = auVar326._12_4_ + local_3e0._12_4_ * auVar30._12_4_;
              fVar241 = auVar326._16_4_ + local_3e0._16_4_ * auVar30._16_4_;
              fVar245 = auVar326._20_4_ + local_3e0._20_4_ * auVar30._20_4_;
              fVar249 = auVar326._24_4_ + local_3e0._24_4_ * auVar30._24_4_;
              fVar254 = auVar326._28_4_ + auVar30._28_4_;
              fVar332 = *(float *)((long)local_888->ray_space + k * 4 + -0x10);
              auVar109._4_4_ = (fVar336 + fVar336) * fVar332;
              auVar109._0_4_ = (fVar196 + fVar196) * fVar332;
              auVar109._8_4_ = (fVar218 + fVar218) * fVar332;
              auVar109._12_4_ = (fVar229 + fVar229) * fVar332;
              auVar109._16_4_ = (fVar241 + fVar241) * fVar332;
              auVar109._20_4_ = (fVar245 + fVar245) * fVar332;
              auVar109._24_4_ = (fVar249 + fVar249) * fVar332;
              auVar109._28_4_ = fVar254 + fVar254;
              auVar30 = vcmpps_avx(local_5a0,auVar109,6);
              auVar150 = ZEXT3264(auVar30);
              auVar142 = auVar209 & auVar30;
              if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar142 >> 0x7f,0) != '\0') ||
                    (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar142 >> 0xbf,0) != '\0') ||
                  (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar142[0x1f] < '\0') {
                local_400._0_4_ = (float)local_400._0_4_ + (float)local_400._0_4_ + -1.0;
                local_400._4_4_ = (float)local_400._4_4_ + (float)local_400._4_4_ + -1.0;
                uStack_3f8._0_4_ = (float)uStack_3f8 + (float)uStack_3f8 + -1.0;
                uStack_3f8._4_4_ = uStack_3f8._4_4_ + uStack_3f8._4_4_ + -1.0;
                uStack_3f0._0_4_ = (float)uStack_3f0 + (float)uStack_3f0 + -1.0;
                uStack_3f0._4_4_ = uStack_3f0._4_4_ + uStack_3f0._4_4_ + -1.0;
                uStack_3e8._0_4_ = (float)uStack_3e8 + (float)uStack_3e8 + -1.0;
                uStack_3e8._4_4_ = uStack_3e8._4_4_ + uStack_3e8._4_4_ + -1.0;
                local_2c0 = local_3e0;
                auVar123 = _local_400;
                auVar142 = _local_400;
                local_2a0 = (float)local_400._0_4_;
                fStack_29c = (float)local_400._4_4_;
                fStack_298 = (float)uStack_3f8;
                fStack_294 = uStack_3f8._4_4_;
                fStack_290 = (float)uStack_3f0;
                fStack_28c = uStack_3f0._4_4_;
                fStack_288 = (float)uStack_3e8;
                fStack_284 = uStack_3e8._4_4_;
                local_280 = local_5a0;
                local_25c = uVar14;
                local_250 = auVar296._0_8_;
                uStack_248 = uStack_8a8;
                local_240 = auVar281._0_8_;
                uStack_238 = uStack_8b8;
                local_230 = local_810;
                uStack_228 = uStack_808;
                local_220 = local_800;
                uStack_218 = uStack_7f8;
                pGVar131 = (context->scene->geometries).items[uVar127].ptr;
                _local_400 = auVar142;
                if ((pGVar131->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_640 = vandps_avx(auVar30,auVar209);
                  auVar185._0_4_ = (float)(int)local_260;
                  auVar185._4_8_ = SUB128(ZEXT812(0),4);
                  auVar185._12_4_ = 0;
                  auVar236 = vshufps_avx(auVar185,auVar185,0);
                  local_1e0[0] = (auVar236._0_4_ + local_3e0._0_4_ + 0.0) * (float)local_120._0_4_;
                  local_1e0[1] = (auVar236._4_4_ + local_3e0._4_4_ + 1.0) * (float)local_120._4_4_;
                  local_1e0[2] = (auVar236._8_4_ + local_3e0._8_4_ + 2.0) * fStack_118;
                  local_1e0[3] = (auVar236._12_4_ + local_3e0._12_4_ + 3.0) * fStack_114;
                  fStack_1d0 = (auVar236._0_4_ + local_3e0._16_4_ + 4.0) * fStack_110;
                  fStack_1cc = (auVar236._4_4_ + local_3e0._20_4_ + 5.0) * fStack_10c;
                  fStack_1c8 = (auVar236._8_4_ + local_3e0._24_4_ + 6.0) * fStack_108;
                  fStack_1c4 = auVar236._12_4_ + local_3e0._28_4_ + 7.0;
                  uStack_3f0 = auVar123._16_8_;
                  uStack_3e8 = auVar142._24_8_;
                  local_1c0 = local_400;
                  uStack_1b8 = uStack_3f8;
                  uStack_1b0 = uStack_3f0;
                  uStack_1a8 = uStack_3e8;
                  local_1a0 = local_5a0;
                  auVar170._8_4_ = 0x7f800000;
                  auVar170._0_8_ = 0x7f8000007f800000;
                  auVar170._12_4_ = 0x7f800000;
                  auVar170._16_4_ = 0x7f800000;
                  auVar170._20_4_ = 0x7f800000;
                  auVar170._24_4_ = 0x7f800000;
                  auVar170._28_4_ = 0x7f800000;
                  auVar209 = vblendvps_avx(auVar170,local_5a0,local_640);
                  auVar30 = vshufps_avx(auVar209,auVar209,0xb1);
                  auVar30 = vminps_avx(auVar209,auVar30);
                  auVar142 = vshufpd_avx(auVar30,auVar30,5);
                  auVar30 = vminps_avx(auVar30,auVar142);
                  auVar142 = vperm2f128_avx(auVar30,auVar30,1);
                  auVar30 = vminps_avx(auVar30,auVar142);
                  auVar30 = vcmpps_avx(auVar209,auVar30,0);
                  auVar142 = local_640 & auVar30;
                  auVar209 = local_640;
                  if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar142 >> 0x7f,0) != '\0') ||
                        (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar142 >> 0xbf,0) != '\0') ||
                      (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar142[0x1f] < '\0') {
                    auVar209 = vandps_avx(auVar30,local_640);
                  }
                  uVar125 = vmovmskps_avx(auVar209);
                  uVar20 = 0;
                  if (uVar125 != 0) {
                    for (; (uVar125 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar126 = (ulong)uVar20;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar131->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar332 = local_1e0[uVar126];
                    auVar150 = ZEXT464((uint)fVar332);
                    uVar11 = *(undefined4 *)((long)&local_1c0 + uVar126 * 4);
                    fVar336 = 1.0 - fVar332;
                    fVar196 = fVar332 * fVar336 + fVar332 * fVar336;
                    auVar236 = ZEXT416((uint)(fVar332 * fVar332 * 3.0));
                    auVar236 = vshufps_avx(auVar236,auVar236,0);
                    auVar186 = ZEXT416((uint)((fVar196 - fVar332 * fVar332) * 3.0));
                    auVar186 = vshufps_avx(auVar186,auVar186,0);
                    auVar203 = ZEXT416((uint)((fVar336 * fVar336 - fVar196) * 3.0));
                    auVar203 = vshufps_avx(auVar203,auVar203,0);
                    auVar188 = ZEXT416((uint)(fVar336 * fVar336 * -3.0));
                    auVar188 = vshufps_avx(auVar188,auVar188,0);
                    auVar187._0_4_ =
                         auVar188._0_4_ * fVar292 +
                         auVar203._0_4_ * fVar274 +
                         auVar236._0_4_ * (float)local_800._0_4_ +
                         auVar186._0_4_ * (float)local_810._0_4_;
                    auVar187._4_4_ =
                         auVar188._4_4_ * fVar302 +
                         auVar203._4_4_ * fVar285 +
                         auVar236._4_4_ * (float)local_800._4_4_ +
                         auVar186._4_4_ * (float)local_810._4_4_;
                    auVar187._8_4_ =
                         auVar188._8_4_ * auVar296._8_4_ +
                         auVar203._8_4_ * auVar281._8_4_ +
                         auVar236._8_4_ * (float)uStack_7f8 + auVar186._8_4_ * (float)uStack_808;
                    auVar187._12_4_ =
                         auVar188._12_4_ * auVar296._12_4_ +
                         auVar203._12_4_ * auVar281._12_4_ +
                         auVar236._12_4_ * uStack_7f8._4_4_ + auVar186._12_4_ * uStack_808._4_4_;
                    auVar210 = ZEXT464(*(uint *)(local_1a0 + uVar126 * 4));
                    *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1a0 + uVar126 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = auVar187._0_4_;
                    uVar15 = vextractps_avx(auVar187,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar15;
                    uVar15 = vextractps_avx(auVar187,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar15;
                    *(float *)(ray + k * 4 + 0xf0) = fVar332;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar11;
                    *(uint *)(ray + k * 4 + 0x110) = uVar13;
                    *(uint *)(ray + k * 4 + 0x120) = uVar127;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_760._0_16_ = *local_788;
                    _auStack_8d0 = auVar149._16_16_;
                    _local_8e0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    auVar368 = ZEXT3264(local_5a0);
                    stack0xfffffffffffff7a8 = auVar269._8_24_;
                    local_860._0_8_ = pGVar131;
                    auVar301 = ZEXT1664(ZEXT816(0) << 0x40);
                    _local_780 = auVar284;
                    _local_540 = *pauVar10;
                    while( true ) {
                      local_460 = local_1e0[uVar126];
                      local_450 = *(undefined4 *)((long)&local_1c0 + uVar126 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar126 * 4)
                      ;
                      fVar196 = 1.0 - local_460;
                      fVar332 = local_460 * fVar196 + local_460 * fVar196;
                      auVar236 = ZEXT416((uint)(local_460 * local_460 * 3.0));
                      auVar236 = vshufps_avx(auVar236,auVar236,0);
                      auVar186 = ZEXT416((uint)((fVar332 - local_460 * local_460) * 3.0));
                      auVar186 = vshufps_avx(auVar186,auVar186,0);
                      auVar203 = ZEXT416((uint)((fVar196 * fVar196 - fVar332) * 3.0));
                      auVar203 = vshufps_avx(auVar203,auVar203,0);
                      local_7f0.context = context->user;
                      auVar188 = ZEXT416((uint)(fVar196 * fVar196 * -3.0));
                      auVar188 = vshufps_avx(auVar188,auVar188,0);
                      auVar189._0_4_ =
                           auVar188._0_4_ * fVar292 +
                           auVar203._0_4_ * fVar274 +
                           auVar236._0_4_ * (float)local_800._0_4_ +
                           auVar186._0_4_ * (float)local_810._0_4_;
                      auVar189._4_4_ =
                           auVar188._4_4_ * fVar302 +
                           auVar203._4_4_ * fVar285 +
                           auVar236._4_4_ * (float)local_800._4_4_ +
                           auVar186._4_4_ * (float)local_810._4_4_;
                      auVar189._8_4_ =
                           auVar188._8_4_ * auVar296._8_4_ +
                           auVar203._8_4_ * auVar281._8_4_ +
                           auVar236._8_4_ * (float)uStack_7f8 + auVar186._8_4_ * (float)uStack_808;
                      auVar189._12_4_ =
                           auVar188._12_4_ * auVar296._12_4_ +
                           auVar203._12_4_ * auVar281._12_4_ +
                           auVar236._12_4_ * uStack_7f8._4_4_ + auVar186._12_4_ * uStack_808._4_4_;
                      auVar236 = vshufps_avx(auVar189,auVar189,0);
                      local_490[0] = (RTCHitN)auVar236[0];
                      local_490[1] = (RTCHitN)auVar236[1];
                      local_490[2] = (RTCHitN)auVar236[2];
                      local_490[3] = (RTCHitN)auVar236[3];
                      local_490[4] = (RTCHitN)auVar236[4];
                      local_490[5] = (RTCHitN)auVar236[5];
                      local_490[6] = (RTCHitN)auVar236[6];
                      local_490[7] = (RTCHitN)auVar236[7];
                      local_490[8] = (RTCHitN)auVar236[8];
                      local_490[9] = (RTCHitN)auVar236[9];
                      local_490[10] = (RTCHitN)auVar236[10];
                      local_490[0xb] = (RTCHitN)auVar236[0xb];
                      local_490[0xc] = (RTCHitN)auVar236[0xc];
                      local_490[0xd] = (RTCHitN)auVar236[0xd];
                      local_490[0xe] = (RTCHitN)auVar236[0xe];
                      local_490[0xf] = (RTCHitN)auVar236[0xf];
                      local_480 = vshufps_avx(auVar189,auVar189,0x55);
                      auVar210 = ZEXT1664(local_480);
                      local_470 = vshufps_avx(auVar189,auVar189,0xaa);
                      fStack_45c = local_460;
                      fStack_458 = local_460;
                      fStack_454 = local_460;
                      uStack_44c = local_450;
                      uStack_448 = local_450;
                      uStack_444 = local_450;
                      local_440 = local_2f0._0_8_;
                      uStack_438 = local_2f0._8_8_;
                      local_430 = local_2e0._0_8_;
                      uStack_428 = local_2e0._8_8_;
                      vcmpps_avx(auVar301._0_32_,auVar301._0_32_,0xf);
                      uStack_41c = (local_7f0.context)->instID[0];
                      local_420 = uStack_41c;
                      uStack_418 = uStack_41c;
                      uStack_414 = uStack_41c;
                      uStack_410 = (local_7f0.context)->instPrimID[0];
                      uStack_40c = uStack_410;
                      uStack_408 = uStack_410;
                      uStack_404 = uStack_410;
                      local_8a0 = local_760._0_16_;
                      local_7f0.valid = (int *)local_8a0;
                      local_7f0.geometryUserPtr = pGVar131->userPtr;
                      local_7f0.hit = local_490;
                      local_7f0.N = 4;
                      local_880 = (uint)uVar126;
                      uStack_87c = 0;
                      local_7f0.ray = (RTCRayN *)ray;
                      if (pGVar131->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar210 = ZEXT1664(local_480);
                        auVar326 = ZEXT1664(auVar326._0_16_);
                        (*pGVar131->intersectionFilterN)(&local_7f0);
                        uVar126 = CONCAT44(uStack_87c,local_880);
                        auVar368 = ZEXT3264(local_5a0);
                        auVar301 = ZEXT1664(ZEXT816(0) << 0x40);
                        pGVar131 = (Geometry *)local_860._0_8_;
                      }
                      auVar236 = auVar210._0_16_;
                      if (local_8a0 == (undefined1  [16])0x0) {
                        auVar236 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar236 = auVar236 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var19 = context->args->filter;
                        if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar131->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar326 = ZEXT1664(auVar326._0_16_);
                          (*p_Var19)(&local_7f0);
                          uVar126 = CONCAT44(uStack_87c,local_880);
                          auVar368 = ZEXT3264(local_5a0);
                          auVar301 = ZEXT1664(ZEXT816(0) << 0x40);
                          pGVar131 = (Geometry *)local_860._0_8_;
                        }
                        auVar186 = vpcmpeqd_avx(local_8a0,_DAT_01f7aa10);
                        auVar203 = vpcmpeqd_avx(auVar236,auVar236);
                        auVar210 = ZEXT1664(auVar203);
                        auVar236 = auVar186 ^ auVar203;
                        if (local_8a0 != (undefined1  [16])0x0) {
                          auVar186 = auVar186 ^ auVar203;
                          auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])local_7f0.hit);
                          *(undefined1 (*) [16])(local_7f0.ray + 0xc0) = auVar203;
                          auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x10));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xd0) = auVar203;
                          auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x20));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xe0) = auVar203;
                          auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x30));
                          *(undefined1 (*) [16])(local_7f0.ray + 0xf0) = auVar203;
                          auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x40));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x100) = auVar203;
                          auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x50));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x110) = auVar203;
                          auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x60));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x120) = auVar203;
                          auVar203 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x70));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x130) = auVar203;
                          auVar186 = vmaskmovps_avx(auVar186,*(undefined1 (*) [16])
                                                              (local_7f0.hit + 0x80));
                          *(undefined1 (*) [16])(local_7f0.ray + 0x140) = auVar186;
                        }
                      }
                      auVar163._8_8_ = 0x100000001;
                      auVar163._0_8_ = 0x100000001;
                      if ((auVar163 & auVar236) == (undefined1  [16])0x0) {
                        *(int *)(ray + k * 4 + 0x80) = local_8e0._0_4_;
                        auVar236 = _local_8e0;
                      }
                      else {
                        auVar236 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      }
                      *(undefined4 *)(local_640 + uVar126 * 4) = 0;
                      _local_8e0 = auVar236;
                      auVar236 = vshufps_avx(auVar236,auVar236,0);
                      auVar147._16_16_ = auVar236;
                      auVar147._0_16_ = auVar236;
                      auVar209 = vcmpps_avx(auVar368._0_32_,auVar147,2);
                      auVar149 = vandps_avx(auVar209,local_640);
                      auVar150 = ZEXT3264(auVar149);
                      local_640 = local_640 & auVar209;
                      if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_640 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_640 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_640 >> 0x7f,0) == '\0') &&
                            (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_640 >> 0xbf,0) == '\0') &&
                          (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_640[0x1f]) break;
                      auVar171._8_4_ = 0x7f800000;
                      auVar171._0_8_ = 0x7f8000007f800000;
                      auVar171._12_4_ = 0x7f800000;
                      auVar171._16_4_ = 0x7f800000;
                      auVar171._20_4_ = 0x7f800000;
                      auVar171._24_4_ = 0x7f800000;
                      auVar171._28_4_ = 0x7f800000;
                      auVar209 = vblendvps_avx(auVar171,auVar368._0_32_,auVar149);
                      auVar30 = vshufps_avx(auVar209,auVar209,0xb1);
                      auVar30 = vminps_avx(auVar209,auVar30);
                      auVar142 = vshufpd_avx(auVar30,auVar30,5);
                      auVar30 = vminps_avx(auVar30,auVar142);
                      auVar142 = vperm2f128_avx(auVar30,auVar30,1);
                      auVar30 = vminps_avx(auVar30,auVar142);
                      auVar30 = vcmpps_avx(auVar209,auVar30,0);
                      auVar142 = auVar149 & auVar30;
                      auVar209 = auVar149;
                      if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar142 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar142 >> 0x7f,0) != '\0') ||
                            (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar142 >> 0xbf,0) != '\0') ||
                          (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar142[0x1f] < '\0') {
                        auVar209 = vandps_avx(auVar30,auVar149);
                      }
                      uVar125 = vmovmskps_avx(auVar209);
                      uVar20 = 0;
                      if (uVar125 != 0) {
                        for (; (uVar125 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                        }
                      }
                      uVar126 = (ulong)uVar20;
                      local_640 = auVar149;
                    }
                    auVar368 = ZEXT3264(local_5e0);
                    prim = local_890;
                    fVar179 = (float)local_7c0._0_4_;
                    fVar193 = (float)local_7c0._4_4_;
                    fVar194 = fStack_7b8;
                    fVar195 = fStack_7b4;
                    fVar222 = fStack_7b0;
                    fVar197 = fStack_7ac;
                    fVar211 = fStack_7a8;
                    fVar214 = fStack_7a4;
                  }
                }
              }
            }
            fVar218 = (float)local_6a0._0_4_;
            fVar229 = (float)local_6a0._4_4_;
            fVar241 = fStack_698;
            fVar245 = fStack_694;
            fVar249 = fStack_690;
            fVar254 = fStack_68c;
            fVar258 = fStack_688;
            fVar259 = fStack_684;
          }
          lVar130 = lVar130 + 8;
          fVar291 = (float)local_700._0_4_;
          fVar308 = (float)local_700._4_4_;
          fVar316 = fStack_6f8;
          fVar318 = fStack_6f4;
          fVar332 = fStack_6f0;
          fVar196 = fStack_6ec;
          fVar336 = fStack_6e8;
        } while ((int)lVar130 < (int)uVar14);
      }
      uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar136._4_4_ = uVar11;
      auVar136._0_4_ = uVar11;
      auVar136._8_4_ = uVar11;
      auVar136._12_4_ = uVar11;
      auVar236 = vcmpps_avx(local_2d0,auVar136,2);
      uVar127 = vmovmskps_avx(auVar236);
      uVar124 = uVar124 & uVar124 + 0xf & uVar127;
    } while (uVar124 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }